

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

vbool<16> __thiscall
embree::avx512::InstanceArrayIntersectorKMB<16>::occluded
          (InstanceArrayIntersectorKMB<16> *this,vbool<16> *valid_i,Precalculations *pre,
          RayK<16> *ray,RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCRayQueryContext *pRVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar28;
  undefined8 uVar29;
  ulong uVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  ulong uVar60;
  ulong uVar61;
  ushort uVar62;
  uint uVar63;
  ulong uVar64;
  uint uVar65;
  long lVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar79 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar195 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar196 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar197 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar204 [16];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar205 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar206 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar220 [16];
  undefined1 in_ZMM31 [64];
  vint<16> itime_k;
  RayQueryContext newcontext;
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  _func_int *local_80;
  RTCRayQueryContext *local_78;
  RTCIntersectArguments *local_70;
  undefined1 auVar80 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  
  uVar65 = prim->primID_;
  uVar8 = prim->instID_;
  pGVar10 = (context->scene->geometries).items[uVar8].ptr;
  local_80 = *(_func_int **)&pGVar10->field_0x58;
  if ((local_80 != (_func_int *)0x0) ||
     ((uVar60 = (ulong)*(uint *)(*(long *)&pGVar10[1].time_range.upper +
                                (long)pGVar10[1].intersectionFilterN * (ulong)uVar65),
      uVar60 != 0xffffffff &&
      (local_80 = pGVar10[1].super_RefCount._vptr_RefCount[uVar60], local_80 != (_func_int *)0x0))))
  {
    auVar74 = vpbroadcastd_avx512f(ZEXT416(pGVar10->mask));
    uVar29 = vptestmd_avx512f(auVar74,*(undefined1 (*) [64])(ray + 0x240));
    uVar62 = valid_i->v & (ushort)uVar29;
    uVar60 = (ulong)uVar62;
    if (uVar62 != 0) {
      pRVar11 = context->user;
      *(undefined2 *)this = 0;
      if (pRVar11->instID[0] == 0xffffffff) {
        pRVar11->instID[0] = uVar8;
        pRVar11->instPrimID[0] = uVar65;
        uVar61 = (ulong)prim->primID_;
        uVar65 = (uint)uVar62;
        if ((pGVar10->field_8).field_0x1 == '\x01') {
          auVar73._8_8_ = 0;
          auVar73._0_4_ = (pGVar10->time_range).lower;
          auVar73._4_4_ = (pGVar10->time_range).upper;
          auVar74 = vbroadcastss_avx512f(auVar73);
          auVar177 = vbroadcastss_avx512f(ZEXT416((uint)pGVar10->fnumTimeSegments));
          auVar74 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar74);
          auVar68 = vmovshdup_avx(auVar73);
          auVar68 = vsubps_avx(auVar68,auVar73);
          auVar75 = vbroadcastss_avx512f(auVar68);
          auVar74 = vdivps_avx512f(auVar74,auVar75);
          auVar74 = vmulps_avx512f(auVar177,auVar74);
          auVar75 = vrndscaleps_avx512f(auVar74,1);
          auVar177 = vbroadcastss_avx512f(ZEXT416((uint)(auVar177._0_4_ + -1.0)));
          auVar177 = vminps_avx512f(auVar75,auVar177);
          auVar177 = vmaxps_avx512f(auVar177,ZEXT1664(ZEXT816(0) << 0x40));
          auVar75 = vcvtps2dq_avx512f(auVar177);
          local_200 = vmovdqa64_avx512f(auVar75);
          auVar74 = vsubps_avx512f(auVar74,auVar177);
          uVar8 = 0;
          for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          auVar177 = vpbroadcastd_avx512f();
          uVar29 = vpcmpd_avx512f(auVar75,auVar177,4);
          if (((ushort)uVar29 & uVar62) == 0) {
            plVar1 = (long *)(*(long *)&pGVar10[1].fnumTimeSegments +
                             (long)*(int *)(local_200 + (ulong)uVar8 * 4) * 0x38);
            iVar9 = *(int *)(*(long *)&pGVar10[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_200 + (ulong)uVar8 * 4) * 0x38);
            if (iVar9 == 0x9134) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28);
              auVar177 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28);
              auVar75 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28);
              in_ZMM6 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28);
              in_ZMM10 = ZEXT1664(auVar68);
            }
            else if (iVar9 == 0x9234) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar173._8_8_ = 0;
              auVar173._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
              auVar189._8_8_ = 0;
              auVar189._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                           auVar173);
              auVar177 = ZEXT1664(auVar68);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),_DAT_01fefe80,
                                           auVar189);
              auVar75 = ZEXT1664(auVar68);
              auVar174._8_8_ = 0;
              auVar174._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),_DAT_01fefe80,
                                           auVar174);
              in_ZMM6 = ZEXT1664(auVar68);
              auVar175._8_8_ = 0;
              auVar175._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),_DAT_01fefe80,
                                           auVar175);
              in_ZMM10 = ZEXT1664(auVar68);
            }
            else if (iVar9 == 0xb001) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar168._8_8_ = 0;
              auVar168._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
              auVar68 = vinsertps_avx(auVar168,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20);
              auVar169._8_8_ = 0;
              auVar169._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
              auVar69 = vpermt2ps_avx512vl(auVar169,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar12 + lVar66)));
              auVar193._8_8_ = 0;
              auVar193._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
              fVar2 = *(float *)(lVar12 + 0x24 + lVar66);
              fVar3 = *(float *)(lVar12 + 0x28 + lVar66);
              fVar4 = *(float *)(lVar12 + 0x2c + lVar66);
              auVar70 = vpermt2ps_avx512vl(auVar193,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
              fVar5 = *(float *)(lVar12 + 0x30 + lVar66);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar2));
              auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
              auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar73._0_4_));
              fVar165 = auVar71._0_4_;
              fVar165 = fVar165 * 1.5 + fVar165 * fVar165 * fVar165 * auVar73._0_4_ * -0.5;
              auVar73 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar2 * fVar165)),0x30);
              in_ZMM10 = ZEXT1664(auVar73);
              auVar73 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar3 * fVar165)),0x30);
              auVar177 = ZEXT1664(auVar73);
              auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar5 * fVar165)),0x30);
              in_ZMM6 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),0x20);
              auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar4 * fVar165)),0x30);
              auVar75 = ZEXT1664(auVar68);
            }
            else if (iVar9 == 0x9244) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar177 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
              auVar75 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
            }
            auVar76 = vbroadcastss_avx512f(auVar177._0_16_);
            auVar77 = vbroadcastss_avx512f(ZEXT416(1));
            auVar78 = vpermps_avx512f(auVar77,auVar177);
            auVar106 = vbroadcastss_avx512f(ZEXT416(2));
            auVar108 = vpermps_avx512f(auVar106,auVar177);
            auVar105 = vbroadcastss_avx512f(ZEXT416(3));
            auVar177 = vpermps_avx512f(auVar105,auVar177);
            auVar107 = vbroadcastss_avx512f(auVar75._0_16_);
            auVar109 = vpermps_avx512f(auVar77,auVar75);
            auVar110 = vpermps_avx512f(auVar106,auVar75);
            auVar75 = vpermps_avx512f(auVar105,auVar75);
            auVar111 = vbroadcastss_avx512f(in_ZMM6._0_16_);
            auVar112 = vpermps_avx512f(auVar77,in_ZMM6);
            auVar113 = vpermps_avx512f(auVar106,in_ZMM6);
            auVar114 = vpermps_avx512f(auVar105,in_ZMM6);
            auVar115 = vbroadcastss_avx512f(in_ZMM10._0_16_);
            auVar116 = vpermps_avx512f(auVar77,in_ZMM10);
            auVar121 = vpermps_avx512f(auVar106,in_ZMM10);
            auVar122 = vpermps_avx512f(auVar105,in_ZMM10);
            iVar9 = (int)plVar1[0xb];
            if (iVar9 == 0x9134) {
              lVar12 = plVar1[7];
              lVar66 = uVar61 * plVar1[9];
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28);
              in_ZMM20 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28);
              in_ZMM23 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28);
              in_ZMM21 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28);
              in_ZMM22 = ZEXT1664(auVar68);
            }
            else {
              auVar172._16_48_ = auVar113._16_48_;
              if (iVar9 == 0x9234) {
                lVar12 = plVar1[7];
                lVar66 = uVar61 * plVar1[9];
                auVar198._8_8_ = 0;
                auVar198._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
                auVar204._8_8_ = 0;
                auVar204._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                             auVar198);
                in_ZMM20 = ZEXT1664(auVar68);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),_DAT_01fefe80
                                             ,auVar204);
                in_ZMM23 = ZEXT1664(auVar68);
                auVar199._8_8_ = 0;
                auVar199._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),
                                             _DAT_01fefe80,auVar199);
                in_ZMM21 = ZEXT1664(auVar68);
                auVar200._8_8_ = 0;
                auVar200._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),
                                             _DAT_01fefe80,auVar200);
                in_ZMM22 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0xb001) {
                lVar12 = plVar1[7];
                lVar66 = uVar61 * plVar1[9];
                auVar201._8_8_ = 0;
                auVar201._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vinsertps_avx(auVar201,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20);
                auVar202._8_8_ = 0;
                auVar202._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
                auVar69 = vpermt2ps_avx512vl(auVar202,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + lVar66)));
                uVar65 = *(uint *)(lVar12 + 0x24 + lVar66);
                uVar8 = *(uint *)(lVar12 + 0x28 + lVar66);
                uVar63 = *(uint *)(lVar12 + 0x2c + lVar66);
                auVar206._8_8_ = 0;
                auVar206._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar70 = vpermt2ps_avx512vl(auVar206,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
                fVar2 = *(float *)(lVar12 + 0x30 + lVar66);
                auVar73 = vmulss_avx512f(ZEXT416(uVar8),ZEXT416(uVar8));
                auVar73 = vfmadd231ss_avx512f(auVar73,ZEXT416(uVar65),ZEXT416(uVar65));
                auVar73 = vfmadd231ss_avx512f(auVar73,ZEXT416(uVar63),ZEXT416(uVar63));
                auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
                auVar172._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                auVar123._4_60_ = auVar172._4_60_;
                auVar123._0_4_ = auVar73._0_4_;
                auVar71 = vrsqrt14ss_avx512f(auVar172._0_16_,auVar123._0_16_);
                auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
                auVar73 = vmulss_avx512f(auVar71,ZEXT416((uint)(auVar73._0_4_ * -0.5)));
                auVar71 = vmulss_avx512f(auVar71,auVar71);
                auVar73 = vmulss_avx512f(auVar71,auVar73);
                auVar71 = vaddss_avx512f(auVar72,auVar73);
                auVar73 = vmulss_avx512f(ZEXT416(uVar65),auVar71);
                auVar73 = vinsertps_avx512f(auVar70,auVar73,0x30);
                in_ZMM22 = ZEXT1664(auVar73);
                auVar73 = vmulss_avx512f(ZEXT416(uVar8),auVar71);
                auVar73 = vinsertps_avx512f(auVar69,auVar73,0x30);
                in_ZMM20 = ZEXT1664(auVar73);
                auVar73 = vmulss_avx512f(ZEXT416(uVar63),auVar71);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416((uint)(fVar2 * auVar71._0_4_)),0x30);
                in_ZMM21 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),0x20);
                auVar68 = vinsertps_avx512f(auVar68,auVar73,0x30);
                in_ZMM23 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0x9244) {
                lVar12 = plVar1[7];
                lVar66 = uVar61 * plVar1[9];
                in_ZMM20 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
                in_ZMM23 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
                in_ZMM21 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
                in_ZMM22 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
              }
            }
            auVar124 = vpermps_avx512f(auVar105,in_ZMM20);
            auVar125 = vpermps_avx512f(auVar105,in_ZMM23);
            auVar126 = vpermps_avx512f(auVar105,in_ZMM21);
            auVar127 = vpermps_avx512f(auVar105,in_ZMM22);
            auVar128 = vmulps_avx512f(auVar122,auVar127);
            auVar129 = vmulps_avx512f(auVar177,auVar124);
            auVar128 = vaddps_avx512f(auVar129,auVar128);
            auVar129 = vmulps_avx512f(auVar75,auVar125);
            auVar128 = vaddps_avx512f(auVar129,auVar128);
            auVar129 = vmulps_avx512f(auVar114,auVar126);
            auVar128 = vaddps_avx512f(auVar129,auVar128);
            auVar129 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar130 = vxorps_avx512dq(auVar128,auVar129);
            auVar131 = vmaxps_avx512f(auVar130,auVar128);
            auVar31._8_4_ = 0x7fffffff;
            auVar31._0_8_ = 0x7fffffff7fffffff;
            auVar31._12_4_ = 0x7fffffff;
            auVar31._16_4_ = 0x7fffffff;
            auVar31._20_4_ = 0x7fffffff;
            auVar31._24_4_ = 0x7fffffff;
            auVar31._28_4_ = 0x7fffffff;
            auVar31._32_4_ = 0x7fffffff;
            auVar31._36_4_ = 0x7fffffff;
            auVar31._40_4_ = 0x7fffffff;
            auVar31._44_4_ = 0x7fffffff;
            auVar31._48_4_ = 0x7fffffff;
            auVar31._52_4_ = 0x7fffffff;
            auVar31._56_4_ = 0x7fffffff;
            auVar31._60_4_ = 0x7fffffff;
            auVar132 = vandpd_avx512dq(auVar131,auVar31);
            auVar32._8_4_ = 0xbb8d3753;
            auVar32._0_8_ = 0xbb8d3753bb8d3753;
            auVar32._12_4_ = 0xbb8d3753;
            auVar32._16_4_ = 0xbb8d3753;
            auVar32._20_4_ = 0xbb8d3753;
            auVar32._24_4_ = 0xbb8d3753;
            auVar32._28_4_ = 0xbb8d3753;
            auVar32._32_4_ = 0xbb8d3753;
            auVar32._36_4_ = 0xbb8d3753;
            auVar32._40_4_ = 0xbb8d3753;
            auVar32._44_4_ = 0xbb8d3753;
            auVar32._48_4_ = 0xbb8d3753;
            auVar32._52_4_ = 0xbb8d3753;
            auVar32._56_4_ = 0xbb8d3753;
            auVar32._60_4_ = 0xbb8d3753;
            auVar133 = vmulps_avx512f(auVar132,auVar32);
            auVar33._8_4_ = 0x3c9df1b8;
            auVar33._0_8_ = 0x3c9df1b83c9df1b8;
            auVar33._12_4_ = 0x3c9df1b8;
            auVar33._16_4_ = 0x3c9df1b8;
            auVar33._20_4_ = 0x3c9df1b8;
            auVar33._24_4_ = 0x3c9df1b8;
            auVar33._28_4_ = 0x3c9df1b8;
            auVar33._32_4_ = 0x3c9df1b8;
            auVar33._36_4_ = 0x3c9df1b8;
            auVar33._40_4_ = 0x3c9df1b8;
            auVar33._44_4_ = 0x3c9df1b8;
            auVar33._48_4_ = 0x3c9df1b8;
            auVar33._52_4_ = 0x3c9df1b8;
            auVar33._56_4_ = 0x3c9df1b8;
            auVar33._60_4_ = 0x3c9df1b8;
            auVar133 = vaddps_avx512f(auVar133,auVar33);
            auVar133 = vmulps_avx512f(auVar133,auVar132);
            auVar34._8_4_ = 0xbd37e81c;
            auVar34._0_8_ = 0xbd37e81cbd37e81c;
            auVar34._12_4_ = 0xbd37e81c;
            auVar34._16_4_ = 0xbd37e81c;
            auVar34._20_4_ = 0xbd37e81c;
            auVar34._24_4_ = 0xbd37e81c;
            auVar34._28_4_ = 0xbd37e81c;
            auVar34._32_4_ = 0xbd37e81c;
            auVar34._36_4_ = 0xbd37e81c;
            auVar34._40_4_ = 0xbd37e81c;
            auVar34._44_4_ = 0xbd37e81c;
            auVar34._48_4_ = 0xbd37e81c;
            auVar34._52_4_ = 0xbd37e81c;
            auVar34._56_4_ = 0xbd37e81c;
            auVar34._60_4_ = 0xbd37e81c;
            auVar133 = vaddps_avx512f(auVar133,auVar34);
            auVar133 = vmulps_avx512f(auVar133,auVar132);
            auVar35._8_4_ = 0x3db3edac;
            auVar35._0_8_ = 0x3db3edac3db3edac;
            auVar35._12_4_ = 0x3db3edac;
            auVar35._16_4_ = 0x3db3edac;
            auVar35._20_4_ = 0x3db3edac;
            auVar35._24_4_ = 0x3db3edac;
            auVar35._28_4_ = 0x3db3edac;
            auVar35._32_4_ = 0x3db3edac;
            auVar35._36_4_ = 0x3db3edac;
            auVar35._40_4_ = 0x3db3edac;
            auVar35._44_4_ = 0x3db3edac;
            auVar35._48_4_ = 0x3db3edac;
            auVar35._52_4_ = 0x3db3edac;
            auVar35._56_4_ = 0x3db3edac;
            auVar35._60_4_ = 0x3db3edac;
            auVar133 = vaddps_avx512f(auVar133,auVar35);
            auVar133 = vmulps_avx512f(auVar133,auVar132);
            auVar36._8_4_ = 0xbe5ba881;
            auVar36._0_8_ = 0xbe5ba881be5ba881;
            auVar36._12_4_ = 0xbe5ba881;
            auVar36._16_4_ = 0xbe5ba881;
            auVar36._20_4_ = 0xbe5ba881;
            auVar36._24_4_ = 0xbe5ba881;
            auVar36._28_4_ = 0xbe5ba881;
            auVar36._32_4_ = 0xbe5ba881;
            auVar36._36_4_ = 0xbe5ba881;
            auVar36._40_4_ = 0xbe5ba881;
            auVar36._44_4_ = 0xbe5ba881;
            auVar36._48_4_ = 0xbe5ba881;
            auVar36._52_4_ = 0xbe5ba881;
            auVar36._56_4_ = 0xbe5ba881;
            auVar36._60_4_ = 0xbe5ba881;
            auVar133 = vaddps_avx512f(auVar133,auVar36);
            auVar133 = vmulps_avx512f(auVar133,auVar132);
            auVar37._8_4_ = 0x3fc90fd1;
            auVar37._0_8_ = 0x3fc90fd13fc90fd1;
            auVar37._12_4_ = 0x3fc90fd1;
            auVar37._16_4_ = 0x3fc90fd1;
            auVar37._20_4_ = 0x3fc90fd1;
            auVar37._24_4_ = 0x3fc90fd1;
            auVar37._28_4_ = 0x3fc90fd1;
            auVar37._32_4_ = 0x3fc90fd1;
            auVar37._36_4_ = 0x3fc90fd1;
            auVar37._40_4_ = 0x3fc90fd1;
            auVar37._44_4_ = 0x3fc90fd1;
            auVar37._48_4_ = 0x3fc90fd1;
            auVar37._52_4_ = 0x3fc90fd1;
            auVar37._56_4_ = 0x3fc90fd1;
            auVar37._60_4_ = 0x3fc90fd1;
            auVar133 = vaddps_avx512f(auVar133,auVar37);
            auVar134 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar135 = vsubps_avx512f(auVar134,auVar132);
            auVar135 = vsqrtps_avx512f(auVar135);
            uVar61 = vcmpps_avx512f(auVar132,auVar134,6);
            auVar132 = vmulps_avx512f(auVar135,auVar133);
            auVar205 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar64 = vcmpps_avx512f(auVar131,auVar205,1);
            auVar133 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar132 = vsubps_avx512f(auVar133,auVar132);
            auVar132 = vmaxps_avx512f(auVar205,auVar132);
            auVar135 = vxorps_avx512dq(auVar132,auVar129);
            bVar14 = (bool)((byte)uVar64 & 1);
            auVar136._0_4_ = (uint)bVar14 * auVar135._0_4_ | (uint)!bVar14 * auVar132._0_4_;
            bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar14 * auVar135._4_4_ | (uint)!bVar14 * auVar132._4_4_;
            bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar14 * auVar135._8_4_ | (uint)!bVar14 * auVar132._8_4_;
            bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar14 * auVar135._12_4_ | (uint)!bVar14 * auVar132._12_4_;
            bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar136._16_4_ = (uint)bVar14 * auVar135._16_4_ | (uint)!bVar14 * auVar132._16_4_;
            bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar136._20_4_ = (uint)bVar14 * auVar135._20_4_ | (uint)!bVar14 * auVar132._20_4_;
            bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar136._24_4_ = (uint)bVar14 * auVar135._24_4_ | (uint)!bVar14 * auVar132._24_4_;
            bVar14 = (bool)((byte)(uVar64 >> 7) & 1);
            auVar136._28_4_ = (uint)bVar14 * auVar135._28_4_ | (uint)!bVar14 * auVar132._28_4_;
            bVar14 = (bool)((byte)(uVar64 >> 8) & 1);
            auVar136._32_4_ = (uint)bVar14 * auVar135._32_4_ | (uint)!bVar14 * auVar132._32_4_;
            bVar14 = (bool)((byte)(uVar64 >> 9) & 1);
            auVar136._36_4_ = (uint)bVar14 * auVar135._36_4_ | (uint)!bVar14 * auVar132._36_4_;
            bVar14 = (bool)((byte)(uVar64 >> 10) & 1);
            auVar136._40_4_ = (uint)bVar14 * auVar135._40_4_ | (uint)!bVar14 * auVar132._40_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xb) & 1);
            auVar136._44_4_ = (uint)bVar14 * auVar135._44_4_ | (uint)!bVar14 * auVar132._44_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xc) & 1);
            auVar136._48_4_ = (uint)bVar14 * auVar135._48_4_ | (uint)!bVar14 * auVar132._48_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xd) & 1);
            auVar136._52_4_ = (uint)bVar14 * auVar135._52_4_ | (uint)!bVar14 * auVar132._52_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xe) & 1);
            auVar136._56_4_ = (uint)bVar14 * auVar135._56_4_ | (uint)!bVar14 * auVar132._56_4_;
            bVar14 = SUB81(uVar64 >> 0xf,0);
            auVar136._60_4_ = (uint)bVar14 * auVar135._60_4_ | (uint)!bVar14 * auVar132._60_4_;
            auVar132 = vsubps_avx512f(auVar133,auVar136);
            auVar135 = vbroadcastss_avx512f(ZEXT416(0x7fc00000));
            bVar14 = (bool)((byte)uVar61 & 1);
            auVar137._0_4_ = (uint)bVar14 * auVar135._0_4_ | (uint)!bVar14 * auVar132._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar14 * auVar135._4_4_ | (uint)!bVar14 * auVar132._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar14 * auVar135._8_4_ | (uint)!bVar14 * auVar132._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar14 * auVar135._12_4_ | (uint)!bVar14 * auVar132._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar137._16_4_ = (uint)bVar14 * auVar135._16_4_ | (uint)!bVar14 * auVar132._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar137._20_4_ = (uint)bVar14 * auVar135._20_4_ | (uint)!bVar14 * auVar132._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar137._24_4_ = (uint)bVar14 * auVar135._24_4_ | (uint)!bVar14 * auVar132._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar137._28_4_ = (uint)bVar14 * auVar135._28_4_ | (uint)!bVar14 * auVar132._28_4_;
            bVar14 = (bool)((byte)(uVar61 >> 8) & 1);
            auVar137._32_4_ = (uint)bVar14 * auVar135._32_4_ | (uint)!bVar14 * auVar132._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar137._36_4_ = (uint)bVar14 * auVar135._36_4_ | (uint)!bVar14 * auVar132._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar137._40_4_ = (uint)bVar14 * auVar135._40_4_ | (uint)!bVar14 * auVar132._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar137._44_4_ = (uint)bVar14 * auVar135._44_4_ | (uint)!bVar14 * auVar132._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar137._48_4_ = (uint)bVar14 * auVar135._48_4_ | (uint)!bVar14 * auVar132._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar137._52_4_ = (uint)bVar14 * auVar135._52_4_ | (uint)!bVar14 * auVar132._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar137._56_4_ = (uint)bVar14 * auVar135._56_4_ | (uint)!bVar14 * auVar132._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar137._60_4_ = (uint)bVar14 * auVar135._60_4_ | (uint)!bVar14 * auVar132._60_4_;
            auVar132 = vmulps_avx512f(auVar74,auVar137);
            auVar38._8_4_ = 0x3f22f983;
            auVar38._0_8_ = 0x3f22f9833f22f983;
            auVar38._12_4_ = 0x3f22f983;
            auVar38._16_4_ = 0x3f22f983;
            auVar38._20_4_ = 0x3f22f983;
            auVar38._24_4_ = 0x3f22f983;
            auVar38._28_4_ = 0x3f22f983;
            auVar38._32_4_ = 0x3f22f983;
            auVar38._36_4_ = 0x3f22f983;
            auVar38._40_4_ = 0x3f22f983;
            auVar38._44_4_ = 0x3f22f983;
            auVar38._48_4_ = 0x3f22f983;
            auVar38._52_4_ = 0x3f22f983;
            auVar38._56_4_ = 0x3f22f983;
            auVar38._60_4_ = 0x3f22f983;
            auVar135 = vmulps_avx512f(auVar132,auVar38);
            auVar135 = vrndscaleps_avx512f(auVar135,1);
            uVar61 = vcmpps_avx512f(auVar128,auVar130,1);
            auVar128 = vmulps_avx512f(auVar135,auVar133);
            auVar128 = vsubps_avx512f(auVar132,auVar128);
            auVar130 = vcvtps2dq_avx512f(auVar135);
            auVar105 = vandps_avx512dq(auVar130,auVar105);
            uVar30 = vptestnmd_avx512f(auVar130,auVar77);
            auVar130 = vpslld_avx512f(auVar130,0x1f);
            uVar67 = vpmovd2m_avx512dq(auVar130);
            uVar64 = vpcmpgtd_avx512f(auVar105,auVar77);
            auVar130 = vpternlogd_avx512f(auVar130,auVar130,auVar130,0xff);
            auVar105 = vpaddd_avx512f(auVar105,auVar130);
            auVar130 = vmulps_avx512f(auVar128,auVar128);
            auVar39._8_4_ = 0xb2d70013;
            auVar39._0_8_ = 0xb2d70013b2d70013;
            auVar39._12_4_ = 0xb2d70013;
            auVar39._16_4_ = 0xb2d70013;
            auVar39._20_4_ = 0xb2d70013;
            auVar39._24_4_ = 0xb2d70013;
            auVar39._28_4_ = 0xb2d70013;
            auVar39._32_4_ = 0xb2d70013;
            auVar39._36_4_ = 0xb2d70013;
            auVar39._40_4_ = 0xb2d70013;
            auVar39._44_4_ = 0xb2d70013;
            auVar39._48_4_ = 0xb2d70013;
            auVar39._52_4_ = 0xb2d70013;
            auVar39._56_4_ = 0xb2d70013;
            auVar39._60_4_ = 0xb2d70013;
            auVar132 = vmulps_avx512f(auVar130,auVar39);
            auVar40._8_4_ = 0x363938a8;
            auVar40._0_8_ = 0x363938a8363938a8;
            auVar40._12_4_ = 0x363938a8;
            auVar40._16_4_ = 0x363938a8;
            auVar40._20_4_ = 0x363938a8;
            auVar40._24_4_ = 0x363938a8;
            auVar40._28_4_ = 0x363938a8;
            auVar40._32_4_ = 0x363938a8;
            auVar40._36_4_ = 0x363938a8;
            auVar40._40_4_ = 0x363938a8;
            auVar40._44_4_ = 0x363938a8;
            auVar40._48_4_ = 0x363938a8;
            auVar40._52_4_ = 0x363938a8;
            auVar40._56_4_ = 0x363938a8;
            auVar40._60_4_ = 0x363938a8;
            auVar132 = vaddps_avx512f(auVar132,auVar40);
            auVar41._8_4_ = 0xb48b634d;
            auVar41._0_8_ = 0xb48b634db48b634d;
            auVar41._12_4_ = 0xb48b634d;
            auVar41._16_4_ = 0xb48b634d;
            auVar41._20_4_ = 0xb48b634d;
            auVar41._24_4_ = 0xb48b634d;
            auVar41._28_4_ = 0xb48b634d;
            auVar41._32_4_ = 0xb48b634d;
            auVar41._36_4_ = 0xb48b634d;
            auVar41._40_4_ = 0xb48b634d;
            auVar41._44_4_ = 0xb48b634d;
            auVar41._48_4_ = 0xb48b634d;
            auVar41._52_4_ = 0xb48b634d;
            auVar41._56_4_ = 0xb48b634d;
            auVar41._60_4_ = 0xb48b634d;
            auVar133 = vmulps_avx512f(auVar130,auVar41);
            uVar28 = vpcmpud_avx512f(auVar105,auVar106,1);
            auVar42._8_4_ = 0x37cfab9c;
            auVar42._0_8_ = 0x37cfab9c37cfab9c;
            auVar42._12_4_ = 0x37cfab9c;
            auVar42._16_4_ = 0x37cfab9c;
            auVar42._20_4_ = 0x37cfab9c;
            auVar42._24_4_ = 0x37cfab9c;
            auVar42._28_4_ = 0x37cfab9c;
            auVar42._32_4_ = 0x37cfab9c;
            auVar42._36_4_ = 0x37cfab9c;
            auVar42._40_4_ = 0x37cfab9c;
            auVar42._44_4_ = 0x37cfab9c;
            auVar42._48_4_ = 0x37cfab9c;
            auVar42._52_4_ = 0x37cfab9c;
            auVar42._56_4_ = 0x37cfab9c;
            auVar42._60_4_ = 0x37cfab9c;
            auVar105 = vaddps_avx512f(auVar133,auVar42);
            auVar132 = vmulps_avx512f(auVar130,auVar132);
            auVar43._8_4_ = 0xb9501096;
            auVar43._0_8_ = 0xb9501096b9501096;
            auVar43._12_4_ = 0xb9501096;
            auVar43._16_4_ = 0xb9501096;
            auVar43._20_4_ = 0xb9501096;
            auVar43._24_4_ = 0xb9501096;
            auVar43._28_4_ = 0xb9501096;
            auVar43._32_4_ = 0xb9501096;
            auVar43._36_4_ = 0xb9501096;
            auVar43._40_4_ = 0xb9501096;
            auVar43._44_4_ = 0xb9501096;
            auVar43._48_4_ = 0xb9501096;
            auVar43._52_4_ = 0xb9501096;
            auVar43._56_4_ = 0xb9501096;
            auVar43._60_4_ = 0xb9501096;
            auVar132 = vaddps_avx512f(auVar132,auVar43);
            auVar105 = vmulps_avx512f(auVar130,auVar105);
            auVar44._8_4_ = 0xbab60981;
            auVar44._0_8_ = 0xbab60981bab60981;
            auVar44._12_4_ = 0xbab60981;
            auVar44._16_4_ = 0xbab60981;
            auVar44._20_4_ = 0xbab60981;
            auVar44._24_4_ = 0xbab60981;
            auVar44._28_4_ = 0xbab60981;
            auVar44._32_4_ = 0xbab60981;
            auVar44._36_4_ = 0xbab60981;
            auVar44._40_4_ = 0xbab60981;
            auVar44._44_4_ = 0xbab60981;
            auVar44._48_4_ = 0xbab60981;
            auVar44._52_4_ = 0xbab60981;
            auVar44._56_4_ = 0xbab60981;
            auVar44._60_4_ = 0xbab60981;
            auVar105 = vaddps_avx512f(auVar105,auVar44);
            auVar132 = vmulps_avx512f(auVar130,auVar132);
            auVar45._8_4_ = 0x3c088898;
            auVar45._0_8_ = 0x3c0888983c088898;
            auVar45._12_4_ = 0x3c088898;
            auVar45._16_4_ = 0x3c088898;
            auVar45._20_4_ = 0x3c088898;
            auVar45._24_4_ = 0x3c088898;
            auVar45._28_4_ = 0x3c088898;
            auVar45._32_4_ = 0x3c088898;
            auVar45._36_4_ = 0x3c088898;
            auVar45._40_4_ = 0x3c088898;
            auVar45._44_4_ = 0x3c088898;
            auVar45._48_4_ = 0x3c088898;
            auVar45._52_4_ = 0x3c088898;
            auVar45._56_4_ = 0x3c088898;
            auVar45._60_4_ = 0x3c088898;
            auVar132 = vaddps_avx512f(auVar132,auVar45);
            auVar105 = vmulps_avx512f(auVar130,auVar105);
            auVar46._8_4_ = 0x3d2aaaa4;
            auVar46._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar46._12_4_ = 0x3d2aaaa4;
            auVar46._16_4_ = 0x3d2aaaa4;
            auVar46._20_4_ = 0x3d2aaaa4;
            auVar46._24_4_ = 0x3d2aaaa4;
            auVar46._28_4_ = 0x3d2aaaa4;
            auVar46._32_4_ = 0x3d2aaaa4;
            auVar46._36_4_ = 0x3d2aaaa4;
            auVar46._40_4_ = 0x3d2aaaa4;
            auVar46._44_4_ = 0x3d2aaaa4;
            auVar46._48_4_ = 0x3d2aaaa4;
            auVar46._52_4_ = 0x3d2aaaa4;
            auVar46._56_4_ = 0x3d2aaaa4;
            auVar46._60_4_ = 0x3d2aaaa4;
            auVar105 = vaddps_avx512f(auVar105,auVar46);
            auVar132 = vmulps_avx512f(auVar130,auVar132);
            auVar47._8_4_ = 0xbe2aaaab;
            auVar47._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar47._12_4_ = 0xbe2aaaab;
            auVar47._16_4_ = 0xbe2aaaab;
            auVar47._20_4_ = 0xbe2aaaab;
            auVar47._24_4_ = 0xbe2aaaab;
            auVar47._28_4_ = 0xbe2aaaab;
            auVar47._32_4_ = 0xbe2aaaab;
            auVar47._36_4_ = 0xbe2aaaab;
            auVar47._40_4_ = 0xbe2aaaab;
            auVar47._44_4_ = 0xbe2aaaab;
            auVar47._48_4_ = 0xbe2aaaab;
            auVar47._52_4_ = 0xbe2aaaab;
            auVar47._56_4_ = 0xbe2aaaab;
            auVar47._60_4_ = 0xbe2aaaab;
            auVar132 = vaddps_avx512f(auVar132,auVar47);
            auVar105 = vmulps_avx512f(auVar130,auVar105);
            auVar133 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
            auVar105 = vaddps_avx512f(auVar105,auVar133);
            auVar132 = vmulps_avx512f(auVar130,auVar132);
            auVar105 = vmulps_avx512f(auVar130,auVar105);
            auVar130 = vaddps_avx512f(auVar132,auVar134);
            auVar128 = vmulps_avx512f(auVar128,auVar130);
            auVar105 = vaddps_avx512f(auVar105,auVar134);
            auVar132 = vblendmps_avx512f(auVar128,auVar105);
            bVar14 = (bool)((byte)uVar67 & 1);
            auVar138._0_4_ = (uint)bVar14 * auVar132._0_4_ | (uint)!bVar14 * auVar130._0_4_;
            bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar14 * auVar132._4_4_ | (uint)!bVar14 * auVar130._4_4_;
            bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar14 * auVar132._8_4_ | (uint)!bVar14 * auVar130._8_4_;
            bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar14 * auVar132._12_4_ | (uint)!bVar14 * auVar130._12_4_;
            bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar138._16_4_ = (uint)bVar14 * auVar132._16_4_ | (uint)!bVar14 * auVar130._16_4_;
            bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar138._20_4_ = (uint)bVar14 * auVar132._20_4_ | (uint)!bVar14 * auVar130._20_4_;
            bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar138._24_4_ = (uint)bVar14 * auVar132._24_4_ | (uint)!bVar14 * auVar130._24_4_;
            bVar14 = (bool)((byte)(uVar67 >> 7) & 1);
            auVar138._28_4_ = (uint)bVar14 * auVar132._28_4_ | (uint)!bVar14 * auVar130._28_4_;
            bVar14 = (bool)((byte)(uVar67 >> 8) & 1);
            auVar138._32_4_ = (uint)bVar14 * auVar132._32_4_ | (uint)!bVar14 * auVar130._32_4_;
            bVar14 = (bool)((byte)(uVar67 >> 9) & 1);
            auVar138._36_4_ = (uint)bVar14 * auVar132._36_4_ | (uint)!bVar14 * auVar130._36_4_;
            bVar14 = (bool)((byte)(uVar67 >> 10) & 1);
            auVar138._40_4_ = (uint)bVar14 * auVar132._40_4_ | (uint)!bVar14 * auVar130._40_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xb) & 1);
            auVar138._44_4_ = (uint)bVar14 * auVar132._44_4_ | (uint)!bVar14 * auVar130._44_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xc) & 1);
            auVar138._48_4_ = (uint)bVar14 * auVar132._48_4_ | (uint)!bVar14 * auVar130._48_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xd) & 1);
            auVar138._52_4_ = (uint)bVar14 * auVar132._52_4_ | (uint)!bVar14 * auVar130._52_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xe) & 1);
            auVar138._56_4_ = (uint)bVar14 * auVar132._56_4_ | (uint)!bVar14 * auVar130._56_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xf) & 1);
            auVar138._60_4_ = (uint)bVar14 * auVar132._60_4_ | (uint)!bVar14 * auVar130._60_4_;
            bVar14 = (bool)((byte)uVar30 & 1);
            auVar139._0_4_ = (uint)bVar14 * auVar105._0_4_ | (uint)!bVar14 * auVar128._0_4_;
            bVar14 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar139._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar128._4_4_;
            bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar139._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar128._8_4_;
            bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
            auVar139._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar128._12_4_;
            bVar14 = (bool)((byte)(uVar30 >> 4) & 1);
            auVar139._16_4_ = (uint)bVar14 * auVar105._16_4_ | (uint)!bVar14 * auVar128._16_4_;
            bVar14 = (bool)((byte)(uVar30 >> 5) & 1);
            auVar139._20_4_ = (uint)bVar14 * auVar105._20_4_ | (uint)!bVar14 * auVar128._20_4_;
            bVar14 = (bool)((byte)(uVar30 >> 6) & 1);
            auVar139._24_4_ = (uint)bVar14 * auVar105._24_4_ | (uint)!bVar14 * auVar128._24_4_;
            bVar14 = (bool)((byte)(uVar30 >> 7) & 1);
            auVar139._28_4_ = (uint)bVar14 * auVar105._28_4_ | (uint)!bVar14 * auVar128._28_4_;
            bVar14 = (bool)((byte)(uVar30 >> 8) & 1);
            auVar139._32_4_ = (uint)bVar14 * auVar105._32_4_ | (uint)!bVar14 * auVar128._32_4_;
            bVar14 = (bool)((byte)(uVar30 >> 9) & 1);
            auVar139._36_4_ = (uint)bVar14 * auVar105._36_4_ | (uint)!bVar14 * auVar128._36_4_;
            bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
            auVar139._40_4_ = (uint)bVar14 * auVar105._40_4_ | (uint)!bVar14 * auVar128._40_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xb) & 1);
            auVar139._44_4_ = (uint)bVar14 * auVar105._44_4_ | (uint)!bVar14 * auVar128._44_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xc) & 1);
            auVar139._48_4_ = (uint)bVar14 * auVar105._48_4_ | (uint)!bVar14 * auVar128._48_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xd) & 1);
            auVar139._52_4_ = (uint)bVar14 * auVar105._52_4_ | (uint)!bVar14 * auVar128._52_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xe) & 1);
            auVar139._56_4_ = (uint)bVar14 * auVar105._56_4_ | (uint)!bVar14 * auVar128._56_4_;
            bVar14 = SUB81(uVar30 >> 0xf,0);
            auVar139._60_4_ = (uint)bVar14 * auVar105._60_4_ | (uint)!bVar14 * auVar128._60_4_;
            auVar105 = vxorps_avx512dq(auVar127,auVar129);
            bVar13 = (byte)uVar61;
            auVar140._0_4_ =
                 (uint)(bVar13 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar127._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar127._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar127._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar127._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar14 * auVar105._16_4_ | (uint)!bVar14 * auVar127._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar14 * auVar105._20_4_ | (uint)!bVar14 * auVar127._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar14 * auVar105._24_4_ | (uint)!bVar14 * auVar127._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar140._28_4_ = (uint)bVar14 * auVar105._28_4_ | (uint)!bVar14 * auVar127._28_4_;
            bVar21 = (byte)(uVar61 >> 8);
            auVar140._32_4_ =
                 (uint)(bVar21 & 1) * auVar105._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar127._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar140._36_4_ = (uint)bVar14 * auVar105._36_4_ | (uint)!bVar14 * auVar127._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar140._40_4_ = (uint)bVar14 * auVar105._40_4_ | (uint)!bVar14 * auVar127._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar140._44_4_ = (uint)bVar14 * auVar105._44_4_ | (uint)!bVar14 * auVar127._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar140._48_4_ = (uint)bVar14 * auVar105._48_4_ | (uint)!bVar14 * auVar127._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar140._52_4_ = (uint)bVar14 * auVar105._52_4_ | (uint)!bVar14 * auVar127._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar140._56_4_ = (uint)bVar14 * auVar105._56_4_ | (uint)!bVar14 * auVar127._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar140._60_4_ = (uint)bVar14 * auVar105._60_4_ | (uint)!bVar14 * auVar127._60_4_;
            auVar105 = vxorps_avx512dq(auVar124,auVar129);
            auVar141._0_4_ =
                 (uint)(bVar13 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar124._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar124._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar124._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar124._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar141._16_4_ = (uint)bVar14 * auVar105._16_4_ | (uint)!bVar14 * auVar124._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar141._20_4_ = (uint)bVar14 * auVar105._20_4_ | (uint)!bVar14 * auVar124._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar141._24_4_ = (uint)bVar14 * auVar105._24_4_ | (uint)!bVar14 * auVar124._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar141._28_4_ = (uint)bVar14 * auVar105._28_4_ | (uint)!bVar14 * auVar124._28_4_;
            auVar141._32_4_ =
                 (uint)(bVar21 & 1) * auVar105._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar124._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar141._36_4_ = (uint)bVar14 * auVar105._36_4_ | (uint)!bVar14 * auVar124._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar141._40_4_ = (uint)bVar14 * auVar105._40_4_ | (uint)!bVar14 * auVar124._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar141._44_4_ = (uint)bVar14 * auVar105._44_4_ | (uint)!bVar14 * auVar124._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar141._48_4_ = (uint)bVar14 * auVar105._48_4_ | (uint)!bVar14 * auVar124._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar141._52_4_ = (uint)bVar14 * auVar105._52_4_ | (uint)!bVar14 * auVar124._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar141._56_4_ = (uint)bVar14 * auVar105._56_4_ | (uint)!bVar14 * auVar124._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar141._60_4_ = (uint)bVar14 * auVar105._60_4_ | (uint)!bVar14 * auVar124._60_4_;
            auVar105 = vfmsub213ps_avx512f(auVar122,auVar131,auVar140);
            auVar124 = vfmsub213ps_avx512f(auVar177,auVar131,auVar141);
            auVar127 = vmulps_avx512f(auVar105,auVar105);
            auVar128 = vmulps_avx512f(auVar124,auVar124);
            auVar127 = vaddps_avx512f(auVar127,auVar128);
            auVar128 = vxorps_avx512dq(auVar125,auVar129);
            auVar142._0_4_ =
                 (uint)(bVar13 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar125._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar142._4_4_ = (uint)bVar14 * auVar128._4_4_ | (uint)!bVar14 * auVar125._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar142._8_4_ = (uint)bVar14 * auVar128._8_4_ | (uint)!bVar14 * auVar125._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar142._12_4_ = (uint)bVar14 * auVar128._12_4_ | (uint)!bVar14 * auVar125._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar142._16_4_ = (uint)bVar14 * auVar128._16_4_ | (uint)!bVar14 * auVar125._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar142._20_4_ = (uint)bVar14 * auVar128._20_4_ | (uint)!bVar14 * auVar125._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar142._24_4_ = (uint)bVar14 * auVar128._24_4_ | (uint)!bVar14 * auVar125._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar142._28_4_ = (uint)bVar14 * auVar128._28_4_ | (uint)!bVar14 * auVar125._28_4_;
            auVar142._32_4_ =
                 (uint)(bVar21 & 1) * auVar128._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar125._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar142._36_4_ = (uint)bVar14 * auVar128._36_4_ | (uint)!bVar14 * auVar125._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar142._40_4_ = (uint)bVar14 * auVar128._40_4_ | (uint)!bVar14 * auVar125._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar142._44_4_ = (uint)bVar14 * auVar128._44_4_ | (uint)!bVar14 * auVar125._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar142._48_4_ = (uint)bVar14 * auVar128._48_4_ | (uint)!bVar14 * auVar125._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar142._52_4_ = (uint)bVar14 * auVar128._52_4_ | (uint)!bVar14 * auVar125._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar142._56_4_ = (uint)bVar14 * auVar128._56_4_ | (uint)!bVar14 * auVar125._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar142._60_4_ = (uint)bVar14 * auVar128._60_4_ | (uint)!bVar14 * auVar125._60_4_;
            auVar125 = vfmsub213ps_avx512f(auVar75,auVar131,auVar142);
            auVar128 = vmulps_avx512f(auVar125,auVar125);
            auVar127 = vaddps_avx512f(auVar128,auVar127);
            auVar128 = vxorps_avx512dq(auVar126,auVar129);
            auVar143._0_4_ =
                 (uint)(bVar13 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar126._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar14 * auVar128._4_4_ | (uint)!bVar14 * auVar126._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar14 * auVar128._8_4_ | (uint)!bVar14 * auVar126._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar14 * auVar128._12_4_ | (uint)!bVar14 * auVar126._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar143._16_4_ = (uint)bVar14 * auVar128._16_4_ | (uint)!bVar14 * auVar126._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar143._20_4_ = (uint)bVar14 * auVar128._20_4_ | (uint)!bVar14 * auVar126._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar143._24_4_ = (uint)bVar14 * auVar128._24_4_ | (uint)!bVar14 * auVar126._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar143._28_4_ = (uint)bVar14 * auVar128._28_4_ | (uint)!bVar14 * auVar126._28_4_;
            auVar143._32_4_ =
                 (uint)(bVar21 & 1) * auVar128._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar126._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar143._36_4_ = (uint)bVar14 * auVar128._36_4_ | (uint)!bVar14 * auVar126._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar143._40_4_ = (uint)bVar14 * auVar128._40_4_ | (uint)!bVar14 * auVar126._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar143._44_4_ = (uint)bVar14 * auVar128._44_4_ | (uint)!bVar14 * auVar126._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar143._48_4_ = (uint)bVar14 * auVar128._48_4_ | (uint)!bVar14 * auVar126._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar143._52_4_ = (uint)bVar14 * auVar128._52_4_ | (uint)!bVar14 * auVar126._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar143._56_4_ = (uint)bVar14 * auVar128._56_4_ | (uint)!bVar14 * auVar126._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar143._60_4_ = (uint)bVar14 * auVar128._60_4_ | (uint)!bVar14 * auVar126._60_4_;
            auVar126 = vfmsub213ps_avx512f(auVar114,auVar131,auVar143);
            auVar128 = vmulps_avx512f(auVar126,auVar126);
            auVar127 = vaddps_avx512f(auVar128,auVar127);
            auVar128 = vrsqrt14ps_avx512f(auVar127);
            auVar127 = vmulps_avx512f(auVar127,auVar133);
            auVar127 = vmulps_avx512f(auVar128,auVar127);
            auVar130 = vmulps_avx512f(auVar128,auVar128);
            auVar127 = vmulps_avx512f(auVar130,auVar127);
            auVar130 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar127 = vfmadd231ps_avx512f(auVar127,auVar130,auVar128);
            auVar105 = vmulps_avx512f(auVar105,auVar127);
            auVar124 = vmulps_avx512f(auVar124,auVar127);
            auVar125 = vmulps_avx512f(auVar125,auVar127);
            auVar126 = vmulps_avx512f(auVar126,auVar127);
            auVar127 = vxorps_avx512dq(auVar139,auVar129);
            bVar14 = (bool)((byte)uVar28 & 1);
            auVar144._0_4_ = (uint)bVar14 * auVar127._0_4_ | !bVar14 * auVar139._0_4_;
            bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar14 * auVar127._4_4_ | !bVar14 * auVar139._4_4_;
            bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar14 * auVar127._8_4_ | !bVar14 * auVar139._8_4_;
            bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar14 * auVar127._12_4_ | !bVar14 * auVar139._12_4_;
            bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar144._16_4_ = (uint)bVar14 * auVar127._16_4_ | !bVar14 * auVar139._16_4_;
            bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar144._20_4_ = (uint)bVar14 * auVar127._20_4_ | !bVar14 * auVar139._20_4_;
            bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar144._24_4_ = (uint)bVar14 * auVar127._24_4_ | !bVar14 * auVar139._24_4_;
            bVar14 = (bool)((byte)(uVar28 >> 7) & 1);
            auVar144._28_4_ = (uint)bVar14 * auVar127._28_4_ | !bVar14 * auVar139._28_4_;
            bVar14 = (bool)((byte)(uVar28 >> 8) & 1);
            auVar144._32_4_ = (uint)bVar14 * auVar127._32_4_ | !bVar14 * auVar139._32_4_;
            bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
            auVar144._36_4_ = (uint)bVar14 * auVar127._36_4_ | !bVar14 * auVar139._36_4_;
            bVar14 = (bool)((byte)(uVar28 >> 10) & 1);
            auVar144._40_4_ = (uint)bVar14 * auVar127._40_4_ | !bVar14 * auVar139._40_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xb) & 1);
            auVar144._44_4_ = (uint)bVar14 * auVar127._44_4_ | !bVar14 * auVar139._44_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xc) & 1);
            auVar144._48_4_ = (uint)bVar14 * auVar127._48_4_ | !bVar14 * auVar139._48_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xd) & 1);
            auVar144._52_4_ = (uint)bVar14 * auVar127._52_4_ | !bVar14 * auVar139._52_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xe) & 1);
            auVar144._56_4_ = (uint)bVar14 * auVar127._56_4_ | !bVar14 * auVar139._56_4_;
            bVar14 = SUB81(uVar28 >> 0xf,0);
            auVar144._60_4_ = (uint)bVar14 * auVar127._60_4_ | !bVar14 * auVar139._60_4_;
            auVar127 = vxorps_avx512dq(auVar138,auVar129);
            bVar14 = (bool)((byte)uVar64 & 1);
            auVar145._0_4_ = bVar14 * auVar138._0_4_ | (uint)!bVar14 * auVar127._0_4_;
            bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar145._4_4_ = bVar14 * auVar138._4_4_ | (uint)!bVar14 * auVar127._4_4_;
            bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar145._8_4_ = bVar14 * auVar138._8_4_ | (uint)!bVar14 * auVar127._8_4_;
            bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar145._12_4_ = bVar14 * auVar138._12_4_ | (uint)!bVar14 * auVar127._12_4_;
            bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar145._16_4_ = bVar14 * auVar138._16_4_ | (uint)!bVar14 * auVar127._16_4_;
            bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar145._20_4_ = bVar14 * auVar138._20_4_ | (uint)!bVar14 * auVar127._20_4_;
            bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar145._24_4_ = bVar14 * auVar138._24_4_ | (uint)!bVar14 * auVar127._24_4_;
            bVar14 = (bool)((byte)(uVar64 >> 7) & 1);
            auVar145._28_4_ = bVar14 * auVar138._28_4_ | (uint)!bVar14 * auVar127._28_4_;
            bVar14 = (bool)((byte)(uVar64 >> 8) & 1);
            auVar145._32_4_ = bVar14 * auVar138._32_4_ | (uint)!bVar14 * auVar127._32_4_;
            bVar14 = (bool)((byte)(uVar64 >> 9) & 1);
            auVar145._36_4_ = bVar14 * auVar138._36_4_ | (uint)!bVar14 * auVar127._36_4_;
            bVar14 = (bool)((byte)(uVar64 >> 10) & 1);
            auVar145._40_4_ = bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar127._40_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xb) & 1);
            auVar145._44_4_ = bVar14 * auVar138._44_4_ | (uint)!bVar14 * auVar127._44_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xc) & 1);
            auVar145._48_4_ = bVar14 * auVar138._48_4_ | (uint)!bVar14 * auVar127._48_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xd) & 1);
            auVar145._52_4_ = bVar14 * auVar138._52_4_ | (uint)!bVar14 * auVar127._52_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xe) & 1);
            auVar145._56_4_ = bVar14 * auVar138._56_4_ | (uint)!bVar14 * auVar127._56_4_;
            bVar14 = SUB81(uVar64 >> 0xf,0);
            auVar145._60_4_ = bVar14 * auVar138._60_4_ | (uint)!bVar14 * auVar127._60_4_;
            auVar105 = vmulps_avx512f(auVar105,auVar145);
            auVar124 = vmulps_avx512f(auVar124,auVar145);
            auVar125 = vmulps_avx512f(auVar125,auVar145);
            auVar126 = vmulps_avx512f(auVar126,auVar145);
            auVar105 = vfmadd231ps_avx512f(auVar105,auVar144,auVar122);
            auVar124 = vfmadd231ps_avx512f(auVar124,auVar144,auVar177);
            auVar125 = vfmadd231ps_avx512f(auVar125,auVar144,auVar75);
            auVar126 = vfmadd231ps_avx512f(auVar126,auVar114,auVar144);
            auVar127 = vsubps_avx512f(auVar140,auVar122);
            auVar122 = vfmadd213ps_avx512f(auVar127,auVar74,auVar122);
            auVar127 = vsubps_avx512f(auVar141,auVar177);
            auVar177 = vfmadd213ps_avx512f(auVar127,auVar74,auVar177);
            auVar127 = vsubps_avx512f(auVar142,auVar75);
            auVar75 = vfmadd213ps_avx512f(auVar127,auVar74,auVar75);
            auVar127 = vsubps_avx512f(auVar143,auVar114);
            auVar127 = vfmadd213ps_avx512f(auVar127,auVar74,auVar114);
            auVar128 = vmulps_avx512f(auVar122,auVar122);
            auVar129 = vmulps_avx512f(auVar177,auVar177);
            auVar128 = vaddps_avx512f(auVar128,auVar129);
            auVar129 = vmulps_avx512f(auVar75,auVar75);
            auVar128 = vaddps_avx512f(auVar129,auVar128);
            auVar129 = vmulps_avx512f(auVar127,auVar127);
            auVar128 = vaddps_avx512f(auVar129,auVar128);
            auVar129 = vmulps_avx512f(auVar128,auVar133);
            auVar128 = vrsqrt14ps_avx512f(auVar128);
            auVar129 = vmulps_avx512f(auVar128,auVar129);
            auVar132 = vmulps_avx512f(auVar128,auVar128);
            auVar129 = vmulps_avx512f(auVar132,auVar129);
            auVar128 = vfmadd231ps_avx512f(auVar129,auVar128,auVar130);
            auVar48._8_4_ = 0x3f7fdf3b;
            auVar48._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar48._12_4_ = 0x3f7fdf3b;
            auVar48._16_4_ = 0x3f7fdf3b;
            auVar48._20_4_ = 0x3f7fdf3b;
            auVar48._24_4_ = 0x3f7fdf3b;
            auVar48._28_4_ = 0x3f7fdf3b;
            auVar48._32_4_ = 0x3f7fdf3b;
            auVar48._36_4_ = 0x3f7fdf3b;
            auVar48._40_4_ = 0x3f7fdf3b;
            auVar48._44_4_ = 0x3f7fdf3b;
            auVar48._48_4_ = 0x3f7fdf3b;
            auVar48._52_4_ = 0x3f7fdf3b;
            auVar48._56_4_ = 0x3f7fdf3b;
            auVar48._60_4_ = 0x3f7fdf3b;
            uVar61 = vcmpps_avx512f(auVar131,auVar48,6);
            auVar122 = vmulps_avx512f(auVar122,auVar128);
            bVar13 = (byte)uVar61;
            auVar146._0_4_ =
                 (uint)(bVar13 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar105._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar105._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar105._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar105._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar146._16_4_ = (uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar105._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar146._20_4_ = (uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar105._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar146._24_4_ = (uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar105._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar146._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar105._28_4_;
            bVar21 = (byte)(uVar61 >> 8);
            auVar146._32_4_ =
                 (uint)(bVar21 & 1) * auVar122._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar105._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar146._36_4_ = (uint)bVar14 * auVar122._36_4_ | (uint)!bVar14 * auVar105._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar146._40_4_ = (uint)bVar14 * auVar122._40_4_ | (uint)!bVar14 * auVar105._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar146._44_4_ = (uint)bVar14 * auVar122._44_4_ | (uint)!bVar14 * auVar105._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar146._48_4_ = (uint)bVar14 * auVar122._48_4_ | (uint)!bVar14 * auVar105._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar146._52_4_ = (uint)bVar14 * auVar122._52_4_ | (uint)!bVar14 * auVar105._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar146._56_4_ = (uint)bVar14 * auVar122._56_4_ | (uint)!bVar14 * auVar105._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar146._60_4_ = (uint)bVar14 * auVar122._60_4_ | (uint)!bVar14 * auVar105._60_4_;
            auVar177 = vmulps_avx512f(auVar177,auVar128);
            auVar147._0_4_ =
                 (uint)(bVar13 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar124._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar124._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar124._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar124._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar147._16_4_ = (uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar124._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar147._20_4_ = (uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar124._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar147._24_4_ = (uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar124._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar147._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar124._28_4_;
            auVar147._32_4_ =
                 (uint)(bVar21 & 1) * auVar177._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar124._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar147._36_4_ = (uint)bVar14 * auVar177._36_4_ | (uint)!bVar14 * auVar124._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar147._40_4_ = (uint)bVar14 * auVar177._40_4_ | (uint)!bVar14 * auVar124._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar147._44_4_ = (uint)bVar14 * auVar177._44_4_ | (uint)!bVar14 * auVar124._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar147._48_4_ = (uint)bVar14 * auVar177._48_4_ | (uint)!bVar14 * auVar124._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar147._52_4_ = (uint)bVar14 * auVar177._52_4_ | (uint)!bVar14 * auVar124._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar147._56_4_ = (uint)bVar14 * auVar177._56_4_ | (uint)!bVar14 * auVar124._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar147._60_4_ = (uint)bVar14 * auVar177._60_4_ | (uint)!bVar14 * auVar124._60_4_;
            auVar177 = vbroadcastss_avx512f(in_ZMM20._0_16_);
            auVar75 = vmulps_avx512f(auVar75,auVar128);
            auVar148._0_4_ =
                 (uint)(bVar13 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar125._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar148._4_4_ = (uint)bVar14 * auVar75._4_4_ | (uint)!bVar14 * auVar125._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar148._8_4_ = (uint)bVar14 * auVar75._8_4_ | (uint)!bVar14 * auVar125._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar148._12_4_ = (uint)bVar14 * auVar75._12_4_ | (uint)!bVar14 * auVar125._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar148._16_4_ = (uint)bVar14 * auVar75._16_4_ | (uint)!bVar14 * auVar125._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar148._20_4_ = (uint)bVar14 * auVar75._20_4_ | (uint)!bVar14 * auVar125._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar148._24_4_ = (uint)bVar14 * auVar75._24_4_ | (uint)!bVar14 * auVar125._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar148._28_4_ = (uint)bVar14 * auVar75._28_4_ | (uint)!bVar14 * auVar125._28_4_;
            auVar148._32_4_ =
                 (uint)(bVar21 & 1) * auVar75._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar125._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar148._36_4_ = (uint)bVar14 * auVar75._36_4_ | (uint)!bVar14 * auVar125._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar148._40_4_ = (uint)bVar14 * auVar75._40_4_ | (uint)!bVar14 * auVar125._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar148._44_4_ = (uint)bVar14 * auVar75._44_4_ | (uint)!bVar14 * auVar125._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar148._48_4_ = (uint)bVar14 * auVar75._48_4_ | (uint)!bVar14 * auVar125._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar148._52_4_ = (uint)bVar14 * auVar75._52_4_ | (uint)!bVar14 * auVar125._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar148._56_4_ = (uint)bVar14 * auVar75._56_4_ | (uint)!bVar14 * auVar125._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar148._60_4_ = (uint)bVar14 * auVar75._60_4_ | (uint)!bVar14 * auVar125._60_4_;
            auVar75 = vpermps_avx512f(auVar77,in_ZMM20);
            auVar105 = vpermps_avx512f(auVar106,in_ZMM20);
            auVar122 = vmulps_avx512f(auVar127,auVar128);
            auVar149._0_4_ =
                 (uint)(bVar13 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar126._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar149._4_4_ = (uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar126._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar149._8_4_ = (uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar126._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar149._12_4_ = (uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar126._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar149._16_4_ = (uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar126._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar149._20_4_ = (uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar126._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar149._24_4_ = (uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar126._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar149._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar126._28_4_;
            auVar149._32_4_ =
                 (uint)(bVar21 & 1) * auVar122._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar126._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar149._36_4_ = (uint)bVar14 * auVar122._36_4_ | (uint)!bVar14 * auVar126._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar149._40_4_ = (uint)bVar14 * auVar122._40_4_ | (uint)!bVar14 * auVar126._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar149._44_4_ = (uint)bVar14 * auVar122._44_4_ | (uint)!bVar14 * auVar126._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar149._48_4_ = (uint)bVar14 * auVar122._48_4_ | (uint)!bVar14 * auVar126._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar149._52_4_ = (uint)bVar14 * auVar122._52_4_ | (uint)!bVar14 * auVar126._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar149._56_4_ = (uint)bVar14 * auVar122._56_4_ | (uint)!bVar14 * auVar126._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar149._60_4_ = (uint)bVar14 * auVar122._60_4_ | (uint)!bVar14 * auVar126._60_4_;
            auVar122 = vbroadcastss_avx512f(in_ZMM23._0_16_);
            auVar124 = vpermps_avx512f(auVar77,in_ZMM23);
            auVar125 = vpermps_avx512f(auVar106,in_ZMM23);
            auVar126 = vsubps_avx512f(auVar134,auVar74);
            auVar177 = vmulps_avx512f(auVar74,auVar177);
            auVar177 = vfmadd213ps_avx512f(auVar76,auVar126,auVar177);
            auVar76 = vbroadcastss_avx512f(in_ZMM21._0_16_);
            auVar75 = vmulps_avx512f(auVar74,auVar75);
            auVar75 = vfmadd213ps_avx512f(auVar78,auVar126,auVar75);
            auVar78 = vpermps_avx512f(auVar77,in_ZMM21);
            auVar127 = vpermps_avx512f(auVar106,in_ZMM21);
            auVar77 = vpermps_avx512f(auVar77,in_ZMM22);
            auVar106 = vpermps_avx512f(auVar106,in_ZMM22);
            auVar128 = vbroadcastss_avx512f(in_ZMM22._0_16_);
            auVar105 = vmulps_avx512f(auVar74,auVar105);
            auVar108 = vfmadd213ps_avx512f(auVar108,auVar126,auVar105);
            auVar105 = vmulps_avx512f(auVar74,auVar122);
            auVar122 = vmulps_avx512f(auVar74,auVar124);
            auVar124 = vmulps_avx512f(auVar74,auVar125);
            auVar105 = vfmadd213ps_avx512f(auVar107,auVar126,auVar105);
            auVar107 = vfmadd213ps_avx512f(auVar109,auVar126,auVar122);
            auVar109 = vfmadd213ps_avx512f(auVar110,auVar126,auVar124);
            auVar76 = vmulps_avx512f(auVar74,auVar76);
            auVar78 = vmulps_avx512f(auVar74,auVar78);
            auVar110 = vmulps_avx512f(auVar74,auVar127);
            auVar76 = vfmadd213ps_avx512f(auVar111,auVar126,auVar76);
            auVar78 = vfmadd213ps_avx512f(auVar112,auVar126,auVar78);
            auVar110 = vfmadd213ps_avx512f(auVar113,auVar126,auVar110);
            auVar111 = vmulps_avx512f(auVar74,auVar128);
            auVar77 = vmulps_avx512f(auVar74,auVar77);
            auVar74 = vmulps_avx512f(auVar74,auVar106);
            auVar106 = vfmadd213ps_avx512f(auVar115,auVar126,auVar111);
            auVar77 = vfmadd213ps_avx512f(auVar116,auVar126,auVar77);
            auVar74 = vfmadd213ps_avx512f(auVar121,auVar126,auVar74);
            auVar111 = vmulps_avx512f(auVar146,auVar146);
            auVar112 = vmulps_avx512f(auVar147,auVar147);
            auVar113 = vaddps_avx512f(auVar111,auVar112);
            auVar115 = vmulps_avx512f(auVar148,auVar148);
            auVar113 = vsubps_avx512f(auVar113,auVar115);
            auVar116 = vmulps_avx512f(auVar149,auVar149);
            auVar113 = vsubps_avx512f(auVar113,auVar116);
            auVar121 = vmulps_avx512f(auVar147,auVar148);
            auVar122 = vmulps_avx512f(auVar146,auVar149);
            auVar124 = vaddps_avx512f(auVar121,auVar122);
            auVar124 = vaddps_avx512f(auVar124,auVar124);
            auVar125 = vmulps_avx512f(auVar147,auVar149);
            auVar126 = vmulps_avx512f(auVar146,auVar148);
            auVar127 = vsubps_avx512f(auVar125,auVar126);
            auVar127 = vaddps_avx512f(auVar127,auVar127);
            auVar121 = vsubps_avx512f(auVar121,auVar122);
            auVar121 = vaddps_avx512f(auVar121,auVar121);
            auVar111 = vsubps_avx512f(auVar111,auVar112);
            auVar112 = vaddps_avx512f(auVar115,auVar111);
            auVar112 = vsubps_avx512f(auVar112,auVar116);
            auVar122 = vmulps_avx512f(auVar148,auVar149);
            auVar128 = vmulps_avx512f(auVar146,auVar147);
            auVar129 = vaddps_avx512f(auVar122,auVar128);
            auVar129 = vaddps_avx512f(auVar129,auVar129);
            auVar125 = vaddps_avx512f(auVar125,auVar126);
            auVar125 = vaddps_avx512f(auVar125,auVar125);
            auVar122 = vsubps_avx512f(auVar122,auVar128);
            auVar122 = vaddps_avx512f(auVar122,auVar122);
            auVar111 = vsubps_avx512f(auVar111,auVar115);
            auVar111 = vaddps_avx512f(auVar116,auVar111);
            auVar115 = vmulps_avx512f(auVar127,auVar205);
            auVar68 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
            auVar114 = vfmadd213ps_avx512f(ZEXT1664(auVar68),auVar124,auVar115);
            auVar115 = vaddps_avx512f(auVar124,auVar115);
            auVar116 = vfmadd213ps_avx512f(auVar124,auVar205,auVar127);
            auVar115 = vfmadd231ps_avx512f(auVar115,auVar113,auVar205);
            auVar116 = vfmadd231ps_avx512f(auVar116,auVar205,auVar113);
            auVar124 = vmulps_avx512f(auVar129,auVar205);
            auVar127 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar112,auVar124);
            auVar124 = vaddps_avx512f(auVar112,auVar124);
            auVar112 = vfmadd213ps_avx512f(auVar112,auVar205,auVar129);
            auVar127 = vaddps_avx512f(auVar121,auVar127);
            auVar124 = vfmadd231ps_avx512f(auVar124,auVar121,auVar205);
            auVar112 = vfmadd231ps_avx512f(auVar112,auVar205,auVar121);
            auVar121 = vmulps_avx512f(auVar111,auVar205);
            auVar128 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar122,auVar121);
            auVar121 = vaddps_avx512f(auVar122,auVar121);
            auVar111 = vfmadd213ps_avx512f(auVar122,auVar205,auVar111);
            auVar122 = vaddps_avx512f(auVar125,auVar128);
            auVar121 = vfmadd231ps_avx512f(auVar121,auVar125,auVar205);
            auVar111 = vfmadd231ps_avx512f(auVar111,auVar205,auVar125);
            auVar75 = vaddps_avx512f(auVar75,auVar205);
            auVar108 = vaddps_avx512f(auVar108,auVar205);
            auVar125 = vaddps_avx512f(auVar109,auVar205);
            auVar109 = vmulps_avx512f(auVar122,auVar205);
            auVar128 = vmulps_avx512f(auVar121,auVar205);
            auVar129 = vmulps_avx512f(auVar111,auVar205);
            auVar130 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar127,auVar109);
            auVar68 = vxorps_avx512vl(auVar126._0_16_,auVar126._0_16_);
            auVar126 = vfmadd213ps_avx512f(ZEXT1664(auVar68),auVar124,auVar128);
            auVar131 = vfmadd213ps_avx512f(auVar205,auVar112,auVar129);
            auVar109 = vfmadd231ps_avx512f(auVar109,auVar107,auVar127);
            auVar128 = vfmadd231ps_avx512f(auVar128,auVar107,auVar124);
            auVar107 = vfmadd213ps_avx512f(auVar107,auVar112,auVar129);
            auVar129 = vmulps_avx512f(auVar110,auVar122);
            auVar132 = vmulps_avx512f(auVar110,auVar121);
            auVar110 = vmulps_avx512f(auVar110,auVar111);
            auVar129 = vfmadd231ps_avx512f(auVar129,auVar78,auVar127);
            auVar132 = vfmadd231ps_avx512f(auVar132,auVar78,auVar124);
            auVar78 = vfmadd231ps_avx512f(auVar110,auVar112,auVar78);
            auVar110 = vmulps_avx512f(auVar74,auVar122);
            auVar121 = vmulps_avx512f(auVar74,auVar121);
            auVar74 = vmulps_avx512f(auVar74,auVar111);
            auVar110 = vfmadd231ps_avx512f(auVar110,auVar77,auVar127);
            auVar111 = vfmadd231ps_avx512f(auVar121,auVar77,auVar124);
            auVar74 = vfmadd231ps_avx512f(auVar74,auVar77,auVar112);
            auVar77 = vaddps_avx512f(auVar113,auVar114);
            auVar112 = vfmadd231ps_avx512f(auVar130,auVar177,auVar77);
            auVar113 = vfmadd231ps_avx512f(auVar126,auVar177,auVar115);
            auVar177 = vfmadd231ps_avx512f(auVar131,auVar116,auVar177);
            auVar114 = vfmadd231ps_avx512f(auVar109,auVar105,auVar77);
            auVar121 = vfmadd231ps_avx512f(auVar128,auVar105,auVar115);
            auVar105 = vfmadd231ps_avx512f(auVar107,auVar116,auVar105);
            auVar122 = vfmadd231ps_avx512f(auVar129,auVar76,auVar77);
            auVar124 = vfmadd231ps_avx512f(auVar132,auVar76,auVar115);
            auVar76 = vfmadd231ps_avx512f(auVar78,auVar116,auVar76);
            auVar77 = vfmadd231ps_avx512f(auVar110,auVar106,auVar77);
            auVar107 = vaddps_avx512f(auVar75,auVar77);
            auVar75 = vfmadd231ps_avx512f(auVar111,auVar106,auVar115);
            auVar109 = vaddps_avx512f(auVar108,auVar75);
            auVar74 = vfmadd231ps_avx512f(auVar74,auVar106,auVar116);
            auVar115 = vaddps_avx512f(auVar125,auVar74);
            auVar74 = vmulps_avx512f(auVar124,auVar105);
            auVar74 = vfmsub231ps_avx512f(auVar74,auVar121,auVar76);
            auVar75 = vmulps_avx512f(auVar76,auVar114);
            auVar77 = vfmsub231ps_avx512f(auVar75,auVar105,auVar122);
            auVar75 = vmulps_avx512f(auVar122,auVar121);
            auVar106 = vfmsub231ps_avx512f(auVar75,auVar114,auVar124);
            auVar75 = vmulps_avx512f(auVar177,auVar122);
            auVar78 = vfmsub231ps_avx512f(auVar75,auVar112,auVar76);
            auVar75 = vmulps_avx512f(auVar113,auVar76);
            auVar75 = vfmsub231ps_avx512f(auVar75,auVar124,auVar177);
            auVar76 = vmulps_avx512f(auVar112,auVar124);
            auVar108 = vfmsub231ps_avx512f(auVar76,auVar113,auVar122);
            auVar76 = vmulps_avx512f(auVar121,auVar177);
            auVar76 = vfmsub231ps_avx512f(auVar76,auVar113,auVar105);
            auVar105 = vmulps_avx512f(auVar105,auVar112);
            auVar105 = vfmsub231ps_avx512f(auVar105,auVar177,auVar114);
            auVar110 = vmulps_avx512f(auVar114,auVar113);
            auVar110 = vfmsub231ps_avx512f(auVar110,auVar112,auVar121);
            auVar177 = vmulps_avx512f(auVar177,auVar106);
            auVar177 = vfmadd231ps_avx512f(auVar177,auVar77,auVar113);
            auVar111 = vfmadd231ps_avx512f(auVar177,auVar74,auVar112);
            auVar74 = vdivps_avx512f(auVar74,auVar111);
            auVar177 = vdivps_avx512f(auVar75,auVar111);
            auVar75 = vdivps_avx512f(auVar76,auVar111);
            auVar76 = vdivps_avx512f(auVar77,auVar111);
            auVar77 = vdivps_avx512f(auVar78,auVar111);
            auVar78 = vdivps_avx512f(auVar105,auVar111);
            auVar106 = vdivps_avx512f(auVar106,auVar111);
            auVar108 = vdivps_avx512f(auVar108,auVar111);
            auVar105 = vdivps_avx512f(auVar110,auVar111);
            auVar110 = vmulps_avx512f(auVar115,auVar106);
            auVar111 = vmulps_avx512f(auVar115,auVar108);
            auVar112 = vmulps_avx512f(auVar115,auVar105);
          }
          else {
            uVar64 = uVar60;
            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              uVar65 = 0;
              uVar63 = (uint)uVar64;
              for (uVar8 = uVar63; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
                uVar65 = uVar65 + 1;
              }
              plVar1 = (long *)(*(long *)&pGVar10[1].fnumTimeSegments +
                               (long)*(int *)(local_200 + (ulong)uVar65 * 4) * 0x38);
              iVar9 = *(int *)(*(long *)&pGVar10[1].fnumTimeSegments + 0x20 +
                              (long)*(int *)(local_200 + (ulong)uVar65 * 4) * 0x38);
              if (iVar9 == 0x9134) {
                lVar12 = *plVar1;
                lVar66 = plVar1[2] * uVar61;
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28);
                in_ZMM5 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28);
                in_ZMM7 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28);
                in_ZMM8 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28);
                in_ZMM10 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0x9234) {
                lVar12 = *plVar1;
                lVar66 = plVar1[2] * uVar61;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
                auVar69._8_8_ = 0;
                auVar69._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                             auVar68);
                in_ZMM5 = ZEXT1664(auVar68);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),_DAT_01fefe80
                                             ,auVar69);
                in_ZMM7 = ZEXT1664(auVar68);
                auVar70._8_8_ = 0;
                auVar70._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),
                                             _DAT_01fefe80,auVar70);
                in_ZMM8 = ZEXT1664(auVar68);
                auVar71._8_8_ = 0;
                auVar71._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),
                                             _DAT_01fefe80,auVar71);
                in_ZMM10 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0xb001) {
                lVar12 = *plVar1;
                lVar66 = plVar1[2] * uVar61;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar73 = vinsertps_avx512f(auVar72,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20);
                in_ZMM16 = ZEXT1664(auVar73);
                auVar190._8_8_ = 0;
                auVar190._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
                auVar69 = vpermt2ps_avx512vl(auVar190,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + lVar66)));
                auVar196._8_8_ = 0;
                auVar196._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar70 = vpermt2ps_avx512vl(auVar196,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
                fVar2 = *(float *)(lVar12 + 0x24 + lVar66);
                fVar3 = *(float *)(lVar12 + 0x28 + lVar66);
                fVar4 = *(float *)(lVar12 + 0x2c + lVar66);
                fVar5 = *(float *)(lVar12 + 0x30 + lVar66);
                auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                          ZEXT416((uint)fVar2));
                auVar68 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
                auVar68 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
                auVar195._4_12_ = ZEXT812(0) << 0x20;
                auVar195._0_4_ = auVar68._0_4_;
                auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar195);
                fVar165 = auVar71._0_4_;
                fVar165 = fVar165 * 1.5 + auVar68._0_4_ * -0.5 * fVar165 * fVar165 * fVar165;
                auVar68 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar2 * fVar165)),0x30);
                in_ZMM10 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar3 * fVar165)),0x30);
                in_ZMM5 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx512f(auVar73,ZEXT416((uint)(fVar5 * fVar165)),0x30);
                in_ZMM8 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),0x20);
                auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar4 * fVar165)),0x30);
                in_ZMM7 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0x9244) {
                lVar12 = *plVar1;
                lVar66 = plVar1[2] * uVar61;
                in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
                in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
                in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
                in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
              }
              auVar77 = vpbroadcastd_avx512f();
              uVar29 = vpcmpeqd_avx512f(auVar77,auVar75);
              iVar9 = (int)plVar1[0xb];
              if (iVar9 == 0x9134) {
                lVar12 = plVar1[7];
                lVar66 = plVar1[9] * uVar61;
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28);
                in_ZMM6 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28);
                in_ZMM9 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28);
                auVar177 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28);
                in_ZMM4 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0x9234) {
                lVar12 = plVar1[7];
                lVar66 = plVar1[9] * uVar61;
                auVar170._8_8_ = 0;
                auVar170._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
                auVar182._8_8_ = 0;
                auVar182._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                             auVar170);
                in_ZMM6 = ZEXT1664(auVar68);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),_DAT_01fefe80
                                             ,auVar182);
                in_ZMM9 = ZEXT1664(auVar68);
                auVar183._8_8_ = 0;
                auVar183._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),
                                             _DAT_01fefe80,auVar183);
                auVar177 = ZEXT1664(auVar68);
                auVar203._8_8_ = 0;
                auVar203._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),
                                             _DAT_01fefe80,auVar203);
                in_ZMM4 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0xb001) {
                lVar12 = plVar1[7];
                lVar66 = plVar1[9] * uVar61;
                auVar171._8_8_ = 0;
                auVar171._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vinsertps_avx(auVar171,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20);
                auVar194._8_8_ = 0;
                auVar194._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
                auVar69 = vpermt2ps_avx512vl(auVar194,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + lVar66)));
                auVar184._8_8_ = 0;
                auVar184._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar70 = vpermt2ps_avx512vl(auVar184,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
                fVar2 = *(float *)(lVar12 + 0x24 + lVar66);
                fVar3 = *(float *)(lVar12 + 0x28 + lVar66);
                fVar4 = *(float *)(lVar12 + 0x2c + lVar66);
                fVar5 = *(float *)(lVar12 + 0x30 + lVar66);
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                          ZEXT416((uint)fVar2));
                auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
                auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
                auVar77._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
                auVar177._4_60_ = auVar77._4_60_;
                auVar177._0_4_ = auVar73._0_4_;
                auVar71 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar177._0_16_);
                auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
                in_ZMM16 = ZEXT1664(auVar72);
                fVar165 = auVar71._0_4_;
                auVar73 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar73._0_4_ * -0.5 * fVar165 *
                                                               fVar165 * fVar165)));
                fVar165 = auVar73._0_4_;
                auVar73 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar2 * fVar165)),0x30);
                in_ZMM4 = ZEXT1664(auVar73);
                auVar73 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar3 * fVar165)),0x30);
                in_ZMM6 = ZEXT1664(auVar73);
                auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar5 * fVar165)),0x30);
                auVar177 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),0x20);
                auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar4 * fVar165)),0x30);
                in_ZMM9 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0x9244) {
                lVar12 = plVar1[7];
                lVar66 = plVar1[9] * uVar61;
                in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
                in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
                auVar177 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
                in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
              }
              uVar65 = (uint)uVar29 & uVar63;
              uVar64 = (ulong)(~uVar65 & uVar63);
              auVar77 = vbroadcastss_avx512f(in_ZMM5._0_16_);
              bVar13 = (byte)uVar65;
              auVar78._0_4_ =
                   (uint)(bVar13 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM18._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar78._4_4_ = (uint)bVar14 * auVar77._4_4_ | (uint)!bVar14 * in_ZMM18._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar78._8_4_ = (uint)bVar14 * auVar77._8_4_ | (uint)!bVar14 * in_ZMM18._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar78._12_4_ = (uint)bVar14 * auVar77._12_4_ | (uint)!bVar14 * in_ZMM18._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar78._16_4_ = (uint)bVar14 * auVar77._16_4_ | (uint)!bVar14 * in_ZMM18._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar78._20_4_ = (uint)bVar14 * auVar77._20_4_ | (uint)!bVar14 * in_ZMM18._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar78._24_4_ = (uint)bVar14 * auVar77._24_4_ | (uint)!bVar14 * in_ZMM18._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar78._28_4_ = (uint)bVar14 * auVar77._28_4_ | (uint)!bVar14 * in_ZMM18._28_4_;
              bVar21 = (byte)(uVar65 >> 8);
              auVar78._32_4_ =
                   (uint)(bVar21 & 1) * auVar77._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM18._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar78._36_4_ = (uint)bVar14 * auVar77._36_4_ | (uint)!bVar14 * in_ZMM18._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar78._40_4_ = (uint)bVar14 * auVar77._40_4_ | (uint)!bVar14 * in_ZMM18._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar78._44_4_ = (uint)bVar14 * auVar77._44_4_ | (uint)!bVar14 * in_ZMM18._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar78._48_4_ = (uint)bVar14 * auVar77._48_4_ | (uint)!bVar14 * in_ZMM18._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar78._52_4_ = (uint)bVar14 * auVar77._52_4_ | (uint)!bVar14 * in_ZMM18._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar78._56_4_ = (uint)bVar14 * auVar77._56_4_ | (uint)!bVar14 * in_ZMM18._56_4_;
              auVar78._60_4_ =
                   (uVar65 >> 0xf) * auVar77._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM18._60_4_;
              auVar77 = vbroadcastss_avx512f(ZEXT416(1));
              auVar106 = vpermps_avx512f(auVar77,in_ZMM5);
              auVar108._0_4_ =
                   (uint)(bVar13 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM17._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar108._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * in_ZMM17._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar108._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * in_ZMM17._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar108._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * in_ZMM17._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar108._16_4_ = (uint)bVar14 * auVar106._16_4_ | (uint)!bVar14 * in_ZMM17._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar108._20_4_ = (uint)bVar14 * auVar106._20_4_ | (uint)!bVar14 * in_ZMM17._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar108._24_4_ = (uint)bVar14 * auVar106._24_4_ | (uint)!bVar14 * in_ZMM17._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar108._28_4_ = (uint)bVar14 * auVar106._28_4_ | (uint)!bVar14 * in_ZMM17._28_4_;
              auVar108._32_4_ =
                   (uint)(bVar21 & 1) * auVar106._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM17._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar108._36_4_ = (uint)bVar14 * auVar106._36_4_ | (uint)!bVar14 * in_ZMM17._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar108._40_4_ = (uint)bVar14 * auVar106._40_4_ | (uint)!bVar14 * in_ZMM17._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar108._44_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * in_ZMM17._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar108._48_4_ = (uint)bVar14 * auVar106._48_4_ | (uint)!bVar14 * in_ZMM17._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar108._52_4_ = (uint)bVar14 * auVar106._52_4_ | (uint)!bVar14 * in_ZMM17._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar108._56_4_ = (uint)bVar14 * auVar106._56_4_ | (uint)!bVar14 * in_ZMM17._56_4_;
              auVar108._60_4_ =
                   (uVar65 >> 0xf) * auVar106._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM17._60_4_;
              auVar106 = vbroadcastss_avx512f(ZEXT416(2));
              auVar105 = vpermps_avx512f(auVar106,in_ZMM5);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_240._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * local_240._4_4_;
              local_240._0_4_ =
                   (uint)(bVar13 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar13 & 1) * local_240._0_4_
              ;
              local_240._8_4_ = (uint)bVar15 * auVar105._8_4_ | (uint)!bVar15 * local_240._8_4_;
              local_240._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * local_240._12_4_;
              local_240._16_4_ = (uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * local_240._16_4_;
              local_240._20_4_ = (uint)bVar18 * auVar105._20_4_ | (uint)!bVar18 * local_240._20_4_;
              local_240._24_4_ = (uint)bVar19 * auVar105._24_4_ | (uint)!bVar19 * local_240._24_4_;
              local_240._28_4_ = (uint)bVar20 * auVar105._28_4_ | (uint)!bVar20 * local_240._28_4_;
              local_240._32_4_ =
                   (uint)(bVar21 & 1) * auVar105._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_240._32_4_;
              local_240._36_4_ = (uint)bVar22 * auVar105._36_4_ | (uint)!bVar22 * local_240._36_4_;
              local_240._40_4_ = (uint)bVar23 * auVar105._40_4_ | (uint)!bVar23 * local_240._40_4_;
              local_240._44_4_ = (uint)bVar24 * auVar105._44_4_ | (uint)!bVar24 * local_240._44_4_;
              local_240._48_4_ = (uint)bVar25 * auVar105._48_4_ | (uint)!bVar25 * local_240._48_4_;
              local_240._52_4_ = (uint)bVar26 * auVar105._52_4_ | (uint)!bVar26 * local_240._52_4_;
              local_240._56_4_ = (uint)bVar27 * auVar105._56_4_ | (uint)!bVar27 * local_240._56_4_;
              local_240._60_4_ =
                   (uVar65 >> 0xf) * auVar105._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_240._60_4_;
              auVar105 = vbroadcastss_avx512f(ZEXT416(3));
              auVar109 = vpermps_avx512f(auVar105,in_ZMM5);
              auVar107._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM28._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar107._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * in_ZMM28._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar107._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * in_ZMM28._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar107._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * in_ZMM28._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar107._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * in_ZMM28._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar107._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * in_ZMM28._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar107._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * in_ZMM28._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar107._28_4_ = (uint)bVar14 * auVar109._28_4_ | (uint)!bVar14 * in_ZMM28._28_4_;
              auVar107._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM28._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar107._36_4_ = (uint)bVar14 * auVar109._36_4_ | (uint)!bVar14 * in_ZMM28._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar107._40_4_ = (uint)bVar14 * auVar109._40_4_ | (uint)!bVar14 * in_ZMM28._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar107._44_4_ = (uint)bVar14 * auVar109._44_4_ | (uint)!bVar14 * in_ZMM28._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar107._48_4_ = (uint)bVar14 * auVar109._48_4_ | (uint)!bVar14 * in_ZMM28._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar107._52_4_ = (uint)bVar14 * auVar109._52_4_ | (uint)!bVar14 * in_ZMM28._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar107._56_4_ = (uint)bVar14 * auVar109._56_4_ | (uint)!bVar14 * in_ZMM28._56_4_;
              auVar107._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM28._60_4_;
              auVar109 = vbroadcastss_avx512f(in_ZMM7._0_16_);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_340._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_340._4_4_;
              local_340._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_340._0_4_
              ;
              local_340._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_340._8_4_;
              local_340._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_340._12_4_;
              local_340._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_340._16_4_;
              local_340._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_340._20_4_;
              local_340._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_340._24_4_;
              local_340._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_340._28_4_;
              local_340._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_340._32_4_;
              local_340._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_340._36_4_;
              local_340._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_340._40_4_;
              local_340._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_340._44_4_;
              local_340._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_340._48_4_;
              local_340._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_340._52_4_;
              local_340._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_340._56_4_;
              local_340._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_340._60_4_;
              auVar109 = vpermps_avx512f(auVar77,in_ZMM7);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_400._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_400._4_4_;
              local_400._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_400._0_4_
              ;
              local_400._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_400._8_4_;
              local_400._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_400._12_4_;
              local_400._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_400._16_4_;
              local_400._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_400._20_4_;
              local_400._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_400._24_4_;
              local_400._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_400._28_4_;
              local_400._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_400._32_4_;
              local_400._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_400._36_4_;
              local_400._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_400._40_4_;
              local_400._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_400._44_4_;
              local_400._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_400._48_4_;
              local_400._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_400._52_4_;
              local_400._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_400._56_4_;
              local_400._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_400._60_4_;
              auVar109 = vpermps_avx512f(auVar106,in_ZMM7);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_300._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_300._4_4_;
              local_300._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_300._0_4_
              ;
              local_300._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_300._8_4_;
              local_300._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_300._12_4_;
              local_300._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_300._16_4_;
              local_300._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_300._20_4_;
              local_300._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_300._24_4_;
              local_300._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_300._28_4_;
              local_300._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_300._32_4_;
              local_300._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_300._36_4_;
              local_300._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_300._40_4_;
              local_300._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_300._44_4_;
              local_300._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_300._48_4_;
              local_300._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_300._52_4_;
              local_300._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_300._56_4_;
              local_300._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_300._60_4_;
              auVar109 = vpermps_avx512f(auVar105,in_ZMM7);
              auVar110._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM27._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar110._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * in_ZMM27._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar110._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * in_ZMM27._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar110._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * in_ZMM27._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar110._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * in_ZMM27._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar110._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * in_ZMM27._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar110._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * in_ZMM27._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar110._28_4_ = (uint)bVar14 * auVar109._28_4_ | (uint)!bVar14 * in_ZMM27._28_4_;
              auVar110._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM27._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar110._36_4_ = (uint)bVar14 * auVar109._36_4_ | (uint)!bVar14 * in_ZMM27._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar110._40_4_ = (uint)bVar14 * auVar109._40_4_ | (uint)!bVar14 * in_ZMM27._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar110._44_4_ = (uint)bVar14 * auVar109._44_4_ | (uint)!bVar14 * in_ZMM27._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar110._48_4_ = (uint)bVar14 * auVar109._48_4_ | (uint)!bVar14 * in_ZMM27._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar110._52_4_ = (uint)bVar14 * auVar109._52_4_ | (uint)!bVar14 * in_ZMM27._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar110._56_4_ = (uint)bVar14 * auVar109._56_4_ | (uint)!bVar14 * in_ZMM27._56_4_;
              auVar110._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM27._60_4_;
              auVar109 = vbroadcastss_avx512f(in_ZMM8._0_16_);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_480._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_480._4_4_;
              local_480._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_480._0_4_
              ;
              local_480._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_480._8_4_;
              local_480._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_480._12_4_;
              local_480._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_480._16_4_;
              local_480._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_480._20_4_;
              local_480._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_480._24_4_;
              local_480._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_480._28_4_;
              local_480._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_480._32_4_;
              local_480._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_480._36_4_;
              local_480._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_480._40_4_;
              local_480._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_480._44_4_;
              local_480._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_480._48_4_;
              local_480._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_480._52_4_;
              local_480._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_480._56_4_;
              local_480._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_480._60_4_;
              auVar109 = vpermps_avx512f(auVar77,in_ZMM8);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_380._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_380._4_4_;
              local_380._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_380._0_4_
              ;
              local_380._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_380._8_4_;
              local_380._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_380._12_4_;
              local_380._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_380._16_4_;
              local_380._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_380._20_4_;
              local_380._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_380._24_4_;
              local_380._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_380._28_4_;
              local_380._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_380._32_4_;
              local_380._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_380._36_4_;
              local_380._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_380._40_4_;
              local_380._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_380._44_4_;
              local_380._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_380._48_4_;
              local_380._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_380._52_4_;
              local_380._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_380._56_4_;
              local_380._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_380._60_4_;
              auVar109 = vpermps_avx512f(auVar106,in_ZMM8);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_2c0._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_2c0._4_4_;
              local_2c0._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_2c0._0_4_
              ;
              local_2c0._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_2c0._8_4_;
              local_2c0._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_2c0._12_4_;
              local_2c0._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_2c0._16_4_;
              local_2c0._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_2c0._20_4_;
              local_2c0._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_2c0._24_4_;
              local_2c0._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_2c0._28_4_;
              local_2c0._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_2c0._32_4_;
              local_2c0._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_2c0._36_4_;
              local_2c0._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_2c0._40_4_;
              local_2c0._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_2c0._44_4_;
              local_2c0._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_2c0._48_4_;
              local_2c0._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_2c0._52_4_;
              local_2c0._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_2c0._56_4_;
              local_2c0._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_2c0._60_4_;
              auVar109 = vpermps_avx512f(auVar105,in_ZMM8);
              auVar111._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM24._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar111._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * in_ZMM24._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar111._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * in_ZMM24._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar111._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * in_ZMM24._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar111._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * in_ZMM24._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar111._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * in_ZMM24._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar111._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * in_ZMM24._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar111._28_4_ = (uint)bVar14 * auVar109._28_4_ | (uint)!bVar14 * in_ZMM24._28_4_;
              auVar111._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM24._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar111._36_4_ = (uint)bVar14 * auVar109._36_4_ | (uint)!bVar14 * in_ZMM24._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar111._40_4_ = (uint)bVar14 * auVar109._40_4_ | (uint)!bVar14 * in_ZMM24._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar111._44_4_ = (uint)bVar14 * auVar109._44_4_ | (uint)!bVar14 * in_ZMM24._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar111._48_4_ = (uint)bVar14 * auVar109._48_4_ | (uint)!bVar14 * in_ZMM24._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar111._52_4_ = (uint)bVar14 * auVar109._52_4_ | (uint)!bVar14 * in_ZMM24._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar111._56_4_ = (uint)bVar14 * auVar109._56_4_ | (uint)!bVar14 * in_ZMM24._56_4_;
              auVar111._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM24._60_4_;
              auVar109 = vbroadcastss_avx512f(in_ZMM10._0_16_);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_440._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_440._4_4_;
              local_440._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_440._0_4_
              ;
              local_440._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_440._8_4_;
              local_440._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_440._12_4_;
              local_440._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_440._16_4_;
              local_440._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_440._20_4_;
              local_440._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_440._24_4_;
              local_440._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_440._28_4_;
              local_440._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_440._32_4_;
              local_440._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_440._36_4_;
              local_440._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_440._40_4_;
              local_440._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_440._44_4_;
              local_440._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_440._48_4_;
              local_440._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_440._52_4_;
              local_440._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_440._56_4_;
              local_440._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_440._60_4_;
              auVar109 = vpermps_avx512f(auVar77,in_ZMM10);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_4c0._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_4c0._4_4_;
              local_4c0._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_4c0._0_4_
              ;
              local_4c0._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_4c0._8_4_;
              local_4c0._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_4c0._12_4_;
              local_4c0._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_4c0._16_4_;
              local_4c0._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_4c0._20_4_;
              local_4c0._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_4c0._24_4_;
              local_4c0._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_4c0._28_4_;
              local_4c0._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_4c0._32_4_;
              local_4c0._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_4c0._36_4_;
              local_4c0._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_4c0._40_4_;
              local_4c0._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_4c0._44_4_;
              local_4c0._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_4c0._48_4_;
              local_4c0._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_4c0._52_4_;
              local_4c0._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_4c0._56_4_;
              local_4c0._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_4c0._60_4_;
              auVar109 = vpermps_avx512f(auVar106,in_ZMM10);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_3c0._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_3c0._4_4_;
              local_3c0._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * local_3c0._0_4_
              ;
              local_3c0._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * local_3c0._8_4_;
              local_3c0._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * local_3c0._12_4_;
              local_3c0._16_4_ = (uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * local_3c0._16_4_;
              local_3c0._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * local_3c0._20_4_;
              local_3c0._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * local_3c0._24_4_;
              local_3c0._28_4_ = (uint)bVar20 * auVar109._28_4_ | (uint)!bVar20 * local_3c0._28_4_;
              local_3c0._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_3c0._32_4_;
              local_3c0._36_4_ = (uint)bVar22 * auVar109._36_4_ | (uint)!bVar22 * local_3c0._36_4_;
              local_3c0._40_4_ = (uint)bVar23 * auVar109._40_4_ | (uint)!bVar23 * local_3c0._40_4_;
              local_3c0._44_4_ = (uint)bVar24 * auVar109._44_4_ | (uint)!bVar24 * local_3c0._44_4_;
              local_3c0._48_4_ = (uint)bVar25 * auVar109._48_4_ | (uint)!bVar25 * local_3c0._48_4_;
              local_3c0._52_4_ = (uint)bVar26 * auVar109._52_4_ | (uint)!bVar26 * local_3c0._52_4_;
              local_3c0._56_4_ = (uint)bVar27 * auVar109._56_4_ | (uint)!bVar27 * local_3c0._56_4_;
              local_3c0._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_3c0._60_4_;
              auVar109 = vpermps_avx512f(auVar105,in_ZMM10);
              auVar112._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM26._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar112._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * in_ZMM26._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar112._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * in_ZMM26._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar112._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * in_ZMM26._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar112._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * in_ZMM26._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar112._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * in_ZMM26._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar112._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * in_ZMM26._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar112._28_4_ = (uint)bVar14 * auVar109._28_4_ | (uint)!bVar14 * in_ZMM26._28_4_;
              auVar112._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM26._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar112._36_4_ = (uint)bVar14 * auVar109._36_4_ | (uint)!bVar14 * in_ZMM26._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar112._40_4_ = (uint)bVar14 * auVar109._40_4_ | (uint)!bVar14 * in_ZMM26._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar112._44_4_ = (uint)bVar14 * auVar109._44_4_ | (uint)!bVar14 * in_ZMM26._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar112._48_4_ = (uint)bVar14 * auVar109._48_4_ | (uint)!bVar14 * in_ZMM26._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar112._52_4_ = (uint)bVar14 * auVar109._52_4_ | (uint)!bVar14 * in_ZMM26._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar112._56_4_ = (uint)bVar14 * auVar109._56_4_ | (uint)!bVar14 * in_ZMM26._56_4_;
              auVar112._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM26._60_4_;
              auVar109 = vbroadcastss_avx512f(in_ZMM6._0_16_);
              auVar113._0_4_ =
                   (uint)(bVar13 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM25._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar113._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * in_ZMM25._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar113._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * in_ZMM25._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar113._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * in_ZMM25._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar113._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * in_ZMM25._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar113._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * in_ZMM25._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar113._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * in_ZMM25._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar113._28_4_ = (uint)bVar14 * auVar109._28_4_ | (uint)!bVar14 * in_ZMM25._28_4_;
              auVar113._32_4_ =
                   (uint)(bVar21 & 1) * auVar109._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM25._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar113._36_4_ = (uint)bVar14 * auVar109._36_4_ | (uint)!bVar14 * in_ZMM25._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar113._40_4_ = (uint)bVar14 * auVar109._40_4_ | (uint)!bVar14 * in_ZMM25._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar113._44_4_ = (uint)bVar14 * auVar109._44_4_ | (uint)!bVar14 * in_ZMM25._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar113._48_4_ = (uint)bVar14 * auVar109._48_4_ | (uint)!bVar14 * in_ZMM25._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar113._52_4_ = (uint)bVar14 * auVar109._52_4_ | (uint)!bVar14 * in_ZMM25._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar113._56_4_ = (uint)bVar14 * auVar109._56_4_ | (uint)!bVar14 * in_ZMM25._56_4_;
              auVar113._60_4_ =
                   (uVar65 >> 0xf) * auVar109._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM25._60_4_;
              auVar114 = vpermps_avx512f(auVar77,in_ZMM6);
              auVar109._0_4_ =
                   (uint)(bVar13 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM23._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar109._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * in_ZMM23._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar109._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * in_ZMM23._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar109._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * in_ZMM23._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar109._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * in_ZMM23._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar109._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * in_ZMM23._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar109._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * in_ZMM23._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar109._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * in_ZMM23._28_4_;
              auVar109._32_4_ =
                   (uint)(bVar21 & 1) * auVar114._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM23._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar109._36_4_ = (uint)bVar14 * auVar114._36_4_ | (uint)!bVar14 * in_ZMM23._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar109._40_4_ = (uint)bVar14 * auVar114._40_4_ | (uint)!bVar14 * in_ZMM23._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar109._44_4_ = (uint)bVar14 * auVar114._44_4_ | (uint)!bVar14 * in_ZMM23._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar109._48_4_ = (uint)bVar14 * auVar114._48_4_ | (uint)!bVar14 * in_ZMM23._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar109._52_4_ = (uint)bVar14 * auVar114._52_4_ | (uint)!bVar14 * in_ZMM23._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar109._56_4_ = (uint)bVar14 * auVar114._56_4_ | (uint)!bVar14 * in_ZMM23._56_4_;
              auVar109._60_4_ =
                   (uVar65 >> 0xf) * auVar114._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM23._60_4_;
              auVar115 = vpermps_avx512f(auVar106,in_ZMM6);
              auVar114._0_4_ =
                   (uint)(bVar13 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM22._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar114._4_4_ = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * in_ZMM22._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar114._8_4_ = (uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * in_ZMM22._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar114._12_4_ = (uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * in_ZMM22._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar114._16_4_ = (uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * in_ZMM22._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar114._20_4_ = (uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * in_ZMM22._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar114._24_4_ = (uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * in_ZMM22._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar114._28_4_ = (uint)bVar14 * auVar115._28_4_ | (uint)!bVar14 * in_ZMM22._28_4_;
              auVar114._32_4_ =
                   (uint)(bVar21 & 1) * auVar115._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM22._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar114._36_4_ = (uint)bVar14 * auVar115._36_4_ | (uint)!bVar14 * in_ZMM22._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar114._40_4_ = (uint)bVar14 * auVar115._40_4_ | (uint)!bVar14 * in_ZMM22._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar114._44_4_ = (uint)bVar14 * auVar115._44_4_ | (uint)!bVar14 * in_ZMM22._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar114._48_4_ = (uint)bVar14 * auVar115._48_4_ | (uint)!bVar14 * in_ZMM22._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar114._52_4_ = (uint)bVar14 * auVar115._52_4_ | (uint)!bVar14 * in_ZMM22._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar114._56_4_ = (uint)bVar14 * auVar115._56_4_ | (uint)!bVar14 * in_ZMM22._56_4_;
              auVar114._60_4_ =
                   (uVar65 >> 0xf) * auVar115._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM22._60_4_;
              auVar116 = vpermps_avx512f(auVar105,in_ZMM6);
              auVar115._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar76._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar115._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar76._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar115._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar76._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar115._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar76._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar115._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * auVar76._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar115._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * auVar76._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar115._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * auVar76._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar115._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * auVar76._28_4_;
              auVar115._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar76._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar115._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * auVar76._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar115._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * auVar76._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar115._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * auVar76._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar115._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * auVar76._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar115._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * auVar76._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar115._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * auVar76._56_4_;
              auVar115._60_4_ =
                   (uVar65 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * auVar76._60_4_;
              auVar76 = vbroadcastss_avx512f(in_ZMM9._0_16_);
              auVar116._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM21._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar116._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * in_ZMM21._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar116._8_4_ = (uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * in_ZMM21._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar116._12_4_ = (uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * in_ZMM21._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar116._16_4_ = (uint)bVar14 * auVar76._16_4_ | (uint)!bVar14 * in_ZMM21._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar116._20_4_ = (uint)bVar14 * auVar76._20_4_ | (uint)!bVar14 * in_ZMM21._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar116._24_4_ = (uint)bVar14 * auVar76._24_4_ | (uint)!bVar14 * in_ZMM21._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar116._28_4_ = (uint)bVar14 * auVar76._28_4_ | (uint)!bVar14 * in_ZMM21._28_4_;
              auVar116._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM21._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar116._36_4_ = (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * in_ZMM21._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar116._40_4_ = (uint)bVar14 * auVar76._40_4_ | (uint)!bVar14 * in_ZMM21._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar116._44_4_ = (uint)bVar14 * auVar76._44_4_ | (uint)!bVar14 * in_ZMM21._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar116._48_4_ = (uint)bVar14 * auVar76._48_4_ | (uint)!bVar14 * in_ZMM21._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar116._52_4_ = (uint)bVar14 * auVar76._52_4_ | (uint)!bVar14 * in_ZMM21._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar116._56_4_ = (uint)bVar14 * auVar76._56_4_ | (uint)!bVar14 * in_ZMM21._56_4_;
              auVar116._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM21._60_4_;
              auVar76 = vpermps_avx512f(auVar77,in_ZMM9);
              auVar121._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM20._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar121._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * in_ZMM20._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar121._8_4_ = (uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * in_ZMM20._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar121._12_4_ = (uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * in_ZMM20._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar121._16_4_ = (uint)bVar14 * auVar76._16_4_ | (uint)!bVar14 * in_ZMM20._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar121._20_4_ = (uint)bVar14 * auVar76._20_4_ | (uint)!bVar14 * in_ZMM20._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar121._24_4_ = (uint)bVar14 * auVar76._24_4_ | (uint)!bVar14 * in_ZMM20._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar121._28_4_ = (uint)bVar14 * auVar76._28_4_ | (uint)!bVar14 * in_ZMM20._28_4_;
              auVar121._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM20._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar121._36_4_ = (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * in_ZMM20._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar121._40_4_ = (uint)bVar14 * auVar76._40_4_ | (uint)!bVar14 * in_ZMM20._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar121._44_4_ = (uint)bVar14 * auVar76._44_4_ | (uint)!bVar14 * in_ZMM20._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar121._48_4_ = (uint)bVar14 * auVar76._48_4_ | (uint)!bVar14 * in_ZMM20._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar121._52_4_ = (uint)bVar14 * auVar76._52_4_ | (uint)!bVar14 * in_ZMM20._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar121._56_4_ = (uint)bVar14 * auVar76._56_4_ | (uint)!bVar14 * in_ZMM20._56_4_;
              auVar121._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM20._60_4_;
              auVar76 = vpermps_avx512f(auVar106,in_ZMM9);
              auVar122._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM19._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar122._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * in_ZMM19._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar122._8_4_ = (uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * in_ZMM19._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar122._12_4_ = (uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * in_ZMM19._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar122._16_4_ = (uint)bVar14 * auVar76._16_4_ | (uint)!bVar14 * in_ZMM19._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar122._20_4_ = (uint)bVar14 * auVar76._20_4_ | (uint)!bVar14 * in_ZMM19._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar122._24_4_ = (uint)bVar14 * auVar76._24_4_ | (uint)!bVar14 * in_ZMM19._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar122._28_4_ = (uint)bVar14 * auVar76._28_4_ | (uint)!bVar14 * in_ZMM19._28_4_;
              auVar122._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM19._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar122._36_4_ = (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * in_ZMM19._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar122._40_4_ = (uint)bVar14 * auVar76._40_4_ | (uint)!bVar14 * in_ZMM19._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar122._44_4_ = (uint)bVar14 * auVar76._44_4_ | (uint)!bVar14 * in_ZMM19._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar122._48_4_ = (uint)bVar14 * auVar76._48_4_ | (uint)!bVar14 * in_ZMM19._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar122._52_4_ = (uint)bVar14 * auVar76._52_4_ | (uint)!bVar14 * in_ZMM19._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar122._56_4_ = (uint)bVar14 * auVar76._56_4_ | (uint)!bVar14 * in_ZMM19._56_4_;
              auVar122._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM19._60_4_;
              auVar76 = vpermps_avx512f(auVar105,in_ZMM9);
              auVar124._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM31._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar124._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * in_ZMM31._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar124._8_4_ = (uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * in_ZMM31._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar124._12_4_ = (uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * in_ZMM31._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar124._16_4_ = (uint)bVar14 * auVar76._16_4_ | (uint)!bVar14 * in_ZMM31._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar124._20_4_ = (uint)bVar14 * auVar76._20_4_ | (uint)!bVar14 * in_ZMM31._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar124._24_4_ = (uint)bVar14 * auVar76._24_4_ | (uint)!bVar14 * in_ZMM31._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar124._28_4_ = (uint)bVar14 * auVar76._28_4_ | (uint)!bVar14 * in_ZMM31._28_4_;
              auVar124._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM31._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar124._36_4_ = (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * in_ZMM31._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar124._40_4_ = (uint)bVar14 * auVar76._40_4_ | (uint)!bVar14 * in_ZMM31._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar124._44_4_ = (uint)bVar14 * auVar76._44_4_ | (uint)!bVar14 * in_ZMM31._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar124._48_4_ = (uint)bVar14 * auVar76._48_4_ | (uint)!bVar14 * in_ZMM31._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar124._52_4_ = (uint)bVar14 * auVar76._52_4_ | (uint)!bVar14 * in_ZMM31._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar124._56_4_ = (uint)bVar14 * auVar76._56_4_ | (uint)!bVar14 * in_ZMM31._56_4_;
              auVar124._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM31._60_4_;
              auVar76 = vbroadcastss_avx512f(auVar177._0_16_);
              local_1c0 = (uint)(bVar13 & 1) * auVar76._0_4_ | !(bool)(bVar13 & 1) * local_1c0;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              uStack_1bc = (uint)bVar14 * auVar76._4_4_ | !bVar14 * uStack_1bc;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              uStack_1b8 = (uint)bVar14 * auVar76._8_4_ | !bVar14 * uStack_1b8;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              uStack_1b4 = (uint)bVar14 * auVar76._12_4_ | !bVar14 * uStack_1b4;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              uStack_1b0 = (uint)bVar14 * auVar76._16_4_ | !bVar14 * uStack_1b0;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              uStack_1ac = (uint)bVar14 * auVar76._20_4_ | !bVar14 * uStack_1ac;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              uStack_1a8 = (uint)bVar14 * auVar76._24_4_ | !bVar14 * uStack_1a8;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              uStack_1a4 = (uint)bVar14 * auVar76._28_4_ | !bVar14 * uStack_1a4;
              uStack_1a0 = (uint)(bVar21 & 1) * auVar76._32_4_ | !(bool)(bVar21 & 1) * uStack_1a0;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              uStack_19c = (uint)bVar14 * auVar76._36_4_ | !bVar14 * uStack_19c;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              uStack_198 = (uint)bVar14 * auVar76._40_4_ | !bVar14 * uStack_198;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              uStack_194 = (uint)bVar14 * auVar76._44_4_ | !bVar14 * uStack_194;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              uStack_190 = (uint)bVar14 * auVar76._48_4_ | !bVar14 * uStack_190;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              uStack_18c = (uint)bVar14 * auVar76._52_4_ | !bVar14 * uStack_18c;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              uStack_188 = (uint)bVar14 * auVar76._56_4_ | !bVar14 * uStack_188;
              uStack_184 = (uVar65 >> 0xf) * auVar76._60_4_ | !SUB41(uVar65 >> 0xf,0) * uStack_184;
              auVar76 = vpermps_avx512f(auVar77,auVar177);
              local_180 = (uint)(bVar13 & 1) * auVar76._0_4_ | !(bool)(bVar13 & 1) * local_180;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              uStack_17c = (uint)bVar14 * auVar76._4_4_ | !bVar14 * uStack_17c;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              uStack_178 = (uint)bVar14 * auVar76._8_4_ | !bVar14 * uStack_178;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              uStack_174 = (uint)bVar14 * auVar76._12_4_ | !bVar14 * uStack_174;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              uStack_170 = (uint)bVar14 * auVar76._16_4_ | !bVar14 * uStack_170;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              uStack_16c = (uint)bVar14 * auVar76._20_4_ | !bVar14 * uStack_16c;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              uStack_168 = (uint)bVar14 * auVar76._24_4_ | !bVar14 * uStack_168;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              uStack_164 = (uint)bVar14 * auVar76._28_4_ | !bVar14 * uStack_164;
              uStack_160 = (uint)(bVar21 & 1) * auVar76._32_4_ | !(bool)(bVar21 & 1) * uStack_160;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              uStack_15c = (uint)bVar14 * auVar76._36_4_ | !bVar14 * uStack_15c;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              uStack_158 = (uint)bVar14 * auVar76._40_4_ | !bVar14 * uStack_158;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              uStack_154 = (uint)bVar14 * auVar76._44_4_ | !bVar14 * uStack_154;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              uStack_150 = (uint)bVar14 * auVar76._48_4_ | !bVar14 * uStack_150;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              uStack_14c = (uint)bVar14 * auVar76._52_4_ | !bVar14 * uStack_14c;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              uStack_148 = (uint)bVar14 * auVar76._56_4_ | !bVar14 * uStack_148;
              uStack_144 = (uVar65 >> 0xf) * auVar76._60_4_ | !SUB41(uVar65 >> 0xf,0) * uStack_144;
              auVar76 = vpermps_avx512f(auVar106,auVar177);
              local_140 = (uint)(bVar13 & 1) * auVar76._0_4_ | !(bool)(bVar13 & 1) * local_140;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              uStack_13c = (uint)bVar14 * auVar76._4_4_ | !bVar14 * uStack_13c;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              uStack_138 = (uint)bVar14 * auVar76._8_4_ | !bVar14 * uStack_138;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              uStack_134 = (uint)bVar14 * auVar76._12_4_ | !bVar14 * uStack_134;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              uStack_130 = (uint)bVar14 * auVar76._16_4_ | !bVar14 * uStack_130;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              uStack_12c = (uint)bVar14 * auVar76._20_4_ | !bVar14 * uStack_12c;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              uStack_128 = (uint)bVar14 * auVar76._24_4_ | !bVar14 * uStack_128;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              uStack_124 = (uint)bVar14 * auVar76._28_4_ | !bVar14 * uStack_124;
              uStack_120 = (uint)(bVar21 & 1) * auVar76._32_4_ | !(bool)(bVar21 & 1) * uStack_120;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              uStack_11c = (uint)bVar14 * auVar76._36_4_ | !bVar14 * uStack_11c;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              uStack_118 = (uint)bVar14 * auVar76._40_4_ | !bVar14 * uStack_118;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              uStack_114 = (uint)bVar14 * auVar76._44_4_ | !bVar14 * uStack_114;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              uStack_110 = (uint)bVar14 * auVar76._48_4_ | !bVar14 * uStack_110;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              uStack_10c = (uint)bVar14 * auVar76._52_4_ | !bVar14 * uStack_10c;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              uStack_108 = (uint)bVar14 * auVar76._56_4_ | !bVar14 * uStack_108;
              uStack_104 = (uVar65 >> 0xf) * auVar76._60_4_ | !SUB41(uVar65 >> 0xf,0) * uStack_104;
              auVar76 = vpermps_avx512f(auVar105,auVar177);
              auVar125._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM29._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar125._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * in_ZMM29._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar125._8_4_ = (uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * in_ZMM29._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar125._12_4_ = (uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * in_ZMM29._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar125._16_4_ = (uint)bVar14 * auVar76._16_4_ | (uint)!bVar14 * in_ZMM29._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar125._20_4_ = (uint)bVar14 * auVar76._20_4_ | (uint)!bVar14 * in_ZMM29._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar125._24_4_ = (uint)bVar14 * auVar76._24_4_ | (uint)!bVar14 * in_ZMM29._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar125._28_4_ = (uint)bVar14 * auVar76._28_4_ | (uint)!bVar14 * in_ZMM29._28_4_;
              auVar125._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM29._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar125._36_4_ = (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * in_ZMM29._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar125._40_4_ = (uint)bVar14 * auVar76._40_4_ | (uint)!bVar14 * in_ZMM29._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar125._44_4_ = (uint)bVar14 * auVar76._44_4_ | (uint)!bVar14 * in_ZMM29._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar125._48_4_ = (uint)bVar14 * auVar76._48_4_ | (uint)!bVar14 * in_ZMM29._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar125._52_4_ = (uint)bVar14 * auVar76._52_4_ | (uint)!bVar14 * in_ZMM29._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar125._56_4_ = (uint)bVar14 * auVar76._56_4_ | (uint)!bVar14 * in_ZMM29._56_4_;
              auVar125._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM29._60_4_;
              auVar76 = vbroadcastss_avx512f(in_ZMM4._0_16_);
              local_100 = (uint)(bVar13 & 1) * auVar76._0_4_ | !(bool)(bVar13 & 1) * local_100;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              uStack_fc = (uint)bVar14 * auVar76._4_4_ | !bVar14 * uStack_fc;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              uStack_f8 = (uint)bVar14 * auVar76._8_4_ | !bVar14 * uStack_f8;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              uStack_f4 = (uint)bVar14 * auVar76._12_4_ | !bVar14 * uStack_f4;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              uStack_f0 = (uint)bVar14 * auVar76._16_4_ | !bVar14 * uStack_f0;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              uStack_ec = (uint)bVar14 * auVar76._20_4_ | !bVar14 * uStack_ec;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              uStack_e8 = (uint)bVar14 * auVar76._24_4_ | !bVar14 * uStack_e8;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              uStack_e4 = (uint)bVar14 * auVar76._28_4_ | !bVar14 * uStack_e4;
              uStack_e0 = (uint)(bVar21 & 1) * auVar76._32_4_ | !(bool)(bVar21 & 1) * uStack_e0;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              uStack_dc = (uint)bVar14 * auVar76._36_4_ | !bVar14 * uStack_dc;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              uStack_d8 = (uint)bVar14 * auVar76._40_4_ | !bVar14 * uStack_d8;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              uStack_d4 = (uint)bVar14 * auVar76._44_4_ | !bVar14 * uStack_d4;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              uStack_d0 = (uint)bVar14 * auVar76._48_4_ | !bVar14 * uStack_d0;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              uStack_cc = (uint)bVar14 * auVar76._52_4_ | !bVar14 * uStack_cc;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              uStack_c8 = (uint)bVar14 * auVar76._56_4_ | !bVar14 * uStack_c8;
              uStack_c4 = (uVar65 >> 0xf) * auVar76._60_4_ | !SUB41(uVar65 >> 0xf,0) * uStack_c4;
              auVar76 = vpermps_avx512f(auVar77,in_ZMM4);
              local_c0 = (uint)(bVar13 & 1) * auVar76._0_4_ | !(bool)(bVar13 & 1) * local_c0;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              uStack_bc = (uint)bVar14 * auVar76._4_4_ | !bVar14 * uStack_bc;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              uStack_b8 = (uint)bVar14 * auVar76._8_4_ | !bVar14 * uStack_b8;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              uStack_b4 = (uint)bVar14 * auVar76._12_4_ | !bVar14 * uStack_b4;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              uStack_b0 = (uint)bVar14 * auVar76._16_4_ | !bVar14 * uStack_b0;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              uStack_ac = (uint)bVar14 * auVar76._20_4_ | !bVar14 * uStack_ac;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              uStack_a8 = (uint)bVar14 * auVar76._24_4_ | !bVar14 * uStack_a8;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              uStack_a4 = (uint)bVar14 * auVar76._28_4_ | !bVar14 * uStack_a4;
              uStack_a0 = (uint)(bVar21 & 1) * auVar76._32_4_ | !(bool)(bVar21 & 1) * uStack_a0;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              uStack_9c = (uint)bVar14 * auVar76._36_4_ | !bVar14 * uStack_9c;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              uStack_98 = (uint)bVar14 * auVar76._40_4_ | !bVar14 * uStack_98;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              uStack_94 = (uint)bVar14 * auVar76._44_4_ | !bVar14 * uStack_94;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              uStack_90 = (uint)bVar14 * auVar76._48_4_ | !bVar14 * uStack_90;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              uStack_8c = (uint)bVar14 * auVar76._52_4_ | !bVar14 * uStack_8c;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              uStack_88 = (uint)bVar14 * auVar76._56_4_ | !bVar14 * uStack_88;
              uStack_84 = (uVar65 >> 0xf) * auVar76._60_4_ | !SUB41(uVar65 >> 0xf,0) * uStack_84;
              auVar76 = vpermps_avx512f(auVar106,in_ZMM4);
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar65 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar65 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar65 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar65 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar65 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar65 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar65 >> 0xe) & 1);
              local_280._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * local_280._4_4_;
              local_280._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * local_280._0_4_;
              local_280._8_4_ = (uint)bVar15 * auVar76._8_4_ | (uint)!bVar15 * local_280._8_4_;
              local_280._12_4_ = (uint)bVar16 * auVar76._12_4_ | (uint)!bVar16 * local_280._12_4_;
              local_280._16_4_ = (uint)bVar17 * auVar76._16_4_ | (uint)!bVar17 * local_280._16_4_;
              local_280._20_4_ = (uint)bVar18 * auVar76._20_4_ | (uint)!bVar18 * local_280._20_4_;
              local_280._24_4_ = (uint)bVar19 * auVar76._24_4_ | (uint)!bVar19 * local_280._24_4_;
              local_280._28_4_ = (uint)bVar20 * auVar76._28_4_ | (uint)!bVar20 * local_280._28_4_;
              local_280._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_280._32_4_;
              local_280._36_4_ = (uint)bVar22 * auVar76._36_4_ | (uint)!bVar22 * local_280._36_4_;
              local_280._40_4_ = (uint)bVar23 * auVar76._40_4_ | (uint)!bVar23 * local_280._40_4_;
              local_280._44_4_ = (uint)bVar24 * auVar76._44_4_ | (uint)!bVar24 * local_280._44_4_;
              local_280._48_4_ = (uint)bVar25 * auVar76._48_4_ | (uint)!bVar25 * local_280._48_4_;
              local_280._52_4_ = (uint)bVar26 * auVar76._52_4_ | (uint)!bVar26 * local_280._52_4_;
              local_280._56_4_ = (uint)bVar27 * auVar76._56_4_ | (uint)!bVar27 * local_280._56_4_;
              local_280._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * local_280._60_4_;
              auVar76 = vpermps_avx512f(auVar105,in_ZMM4);
              auVar106._0_4_ =
                   (uint)(bVar13 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM30._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar106._4_4_ = (uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * in_ZMM30._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar106._8_4_ = (uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * in_ZMM30._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar106._12_4_ = (uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * in_ZMM30._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar106._16_4_ = (uint)bVar14 * auVar76._16_4_ | (uint)!bVar14 * in_ZMM30._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar106._20_4_ = (uint)bVar14 * auVar76._20_4_ | (uint)!bVar14 * in_ZMM30._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar106._24_4_ = (uint)bVar14 * auVar76._24_4_ | (uint)!bVar14 * in_ZMM30._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar106._28_4_ = (uint)bVar14 * auVar76._28_4_ | (uint)!bVar14 * in_ZMM30._28_4_;
              auVar106._32_4_ =
                   (uint)(bVar21 & 1) * auVar76._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM30._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar106._36_4_ = (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * in_ZMM30._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar106._40_4_ = (uint)bVar14 * auVar76._40_4_ | (uint)!bVar14 * in_ZMM30._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar106._44_4_ = (uint)bVar14 * auVar76._44_4_ | (uint)!bVar14 * in_ZMM30._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar106._48_4_ = (uint)bVar14 * auVar76._48_4_ | (uint)!bVar14 * in_ZMM30._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar106._52_4_ = (uint)bVar14 * auVar76._52_4_ | (uint)!bVar14 * in_ZMM30._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar106._56_4_ = (uint)bVar14 * auVar76._56_4_ | (uint)!bVar14 * in_ZMM30._56_4_;
              auVar106._60_4_ =
                   (uVar65 >> 0xf) * auVar76._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM30._60_4_;
              auVar76 = auVar115;
              in_ZMM17 = auVar108;
              in_ZMM18 = auVar78;
              in_ZMM19 = auVar122;
              in_ZMM20 = auVar121;
              in_ZMM21 = auVar116;
              in_ZMM22 = auVar114;
              in_ZMM23 = auVar109;
              in_ZMM24 = auVar111;
              in_ZMM25 = auVar113;
              in_ZMM26 = auVar112;
              in_ZMM27 = auVar110;
              in_ZMM28 = auVar107;
              in_ZMM29 = auVar125;
              in_ZMM30 = auVar106;
              in_ZMM31 = auVar124;
            } while ((short)(~uVar65 & uVar63) != 0);
            auVar177 = vmulps_avx512f(auVar106,auVar112);
            auVar75 = vmulps_avx512f(auVar115,auVar107);
            auVar177 = vaddps_avx512f(auVar75,auVar177);
            auVar75 = vmulps_avx512f(auVar124,auVar110);
            auVar177 = vaddps_avx512f(auVar75,auVar177);
            auVar75 = vmulps_avx512f(auVar125,auVar111);
            auVar177 = vaddps_avx512f(auVar75,auVar177);
            auVar77 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar75 = vxorps_avx512dq(auVar177,auVar77);
            uVar61 = vcmpps_avx512f(auVar177,auVar75,1);
            auVar177 = vmaxps_avx512f(auVar75,auVar177);
            auVar75._8_4_ = 0x7fffffff;
            auVar75._0_8_ = 0x7fffffff7fffffff;
            auVar75._12_4_ = 0x7fffffff;
            auVar75._16_4_ = 0x7fffffff;
            auVar75._20_4_ = 0x7fffffff;
            auVar75._24_4_ = 0x7fffffff;
            auVar75._28_4_ = 0x7fffffff;
            auVar75._32_4_ = 0x7fffffff;
            auVar75._36_4_ = 0x7fffffff;
            auVar75._40_4_ = 0x7fffffff;
            auVar75._44_4_ = 0x7fffffff;
            auVar75._48_4_ = 0x7fffffff;
            auVar75._52_4_ = 0x7fffffff;
            auVar75._56_4_ = 0x7fffffff;
            auVar75._60_4_ = 0x7fffffff;
            auVar75 = vandpd_avx512dq(auVar177,auVar75);
            auVar76._8_4_ = 0xbb8d3753;
            auVar76._0_8_ = 0xbb8d3753bb8d3753;
            auVar76._12_4_ = 0xbb8d3753;
            auVar76._16_4_ = 0xbb8d3753;
            auVar76._20_4_ = 0xbb8d3753;
            auVar76._24_4_ = 0xbb8d3753;
            auVar76._28_4_ = 0xbb8d3753;
            auVar76._32_4_ = 0xbb8d3753;
            auVar76._36_4_ = 0xbb8d3753;
            auVar76._40_4_ = 0xbb8d3753;
            auVar76._44_4_ = 0xbb8d3753;
            auVar76._48_4_ = 0xbb8d3753;
            auVar76._52_4_ = 0xbb8d3753;
            auVar76._56_4_ = 0xbb8d3753;
            auVar76._60_4_ = 0xbb8d3753;
            auVar76 = vmulps_avx512f(auVar75,auVar76);
            auVar105._8_4_ = 0x3c9df1b8;
            auVar105._0_8_ = 0x3c9df1b83c9df1b8;
            auVar105._12_4_ = 0x3c9df1b8;
            auVar105._16_4_ = 0x3c9df1b8;
            auVar105._20_4_ = 0x3c9df1b8;
            auVar105._24_4_ = 0x3c9df1b8;
            auVar105._28_4_ = 0x3c9df1b8;
            auVar105._32_4_ = 0x3c9df1b8;
            auVar105._36_4_ = 0x3c9df1b8;
            auVar105._40_4_ = 0x3c9df1b8;
            auVar105._44_4_ = 0x3c9df1b8;
            auVar105._48_4_ = 0x3c9df1b8;
            auVar105._52_4_ = 0x3c9df1b8;
            auVar105._56_4_ = 0x3c9df1b8;
            auVar105._60_4_ = 0x3c9df1b8;
            auVar76 = vaddps_avx512f(auVar76,auVar105);
            auVar76 = vmulps_avx512f(auVar76,auVar75);
            auVar126._8_4_ = 0xbd37e81c;
            auVar126._0_8_ = 0xbd37e81cbd37e81c;
            auVar126._12_4_ = 0xbd37e81c;
            auVar126._16_4_ = 0xbd37e81c;
            auVar126._20_4_ = 0xbd37e81c;
            auVar126._24_4_ = 0xbd37e81c;
            auVar126._28_4_ = 0xbd37e81c;
            auVar126._32_4_ = 0xbd37e81c;
            auVar126._36_4_ = 0xbd37e81c;
            auVar126._40_4_ = 0xbd37e81c;
            auVar126._44_4_ = 0xbd37e81c;
            auVar126._48_4_ = 0xbd37e81c;
            auVar126._52_4_ = 0xbd37e81c;
            auVar126._56_4_ = 0xbd37e81c;
            auVar126._60_4_ = 0xbd37e81c;
            auVar76 = vaddps_avx512f(auVar76,auVar126);
            auVar76 = vmulps_avx512f(auVar76,auVar75);
            auVar127._8_4_ = 0x3db3edac;
            auVar127._0_8_ = 0x3db3edac3db3edac;
            auVar127._12_4_ = 0x3db3edac;
            auVar127._16_4_ = 0x3db3edac;
            auVar127._20_4_ = 0x3db3edac;
            auVar127._24_4_ = 0x3db3edac;
            auVar127._28_4_ = 0x3db3edac;
            auVar127._32_4_ = 0x3db3edac;
            auVar127._36_4_ = 0x3db3edac;
            auVar127._40_4_ = 0x3db3edac;
            auVar127._44_4_ = 0x3db3edac;
            auVar127._48_4_ = 0x3db3edac;
            auVar127._52_4_ = 0x3db3edac;
            auVar127._56_4_ = 0x3db3edac;
            auVar127._60_4_ = 0x3db3edac;
            auVar76 = vaddps_avx512f(auVar76,auVar127);
            auVar76 = vmulps_avx512f(auVar76,auVar75);
            auVar128._8_4_ = 0xbe5ba881;
            auVar128._0_8_ = 0xbe5ba881be5ba881;
            auVar128._12_4_ = 0xbe5ba881;
            auVar128._16_4_ = 0xbe5ba881;
            auVar128._20_4_ = 0xbe5ba881;
            auVar128._24_4_ = 0xbe5ba881;
            auVar128._28_4_ = 0xbe5ba881;
            auVar128._32_4_ = 0xbe5ba881;
            auVar128._36_4_ = 0xbe5ba881;
            auVar128._40_4_ = 0xbe5ba881;
            auVar128._44_4_ = 0xbe5ba881;
            auVar128._48_4_ = 0xbe5ba881;
            auVar128._52_4_ = 0xbe5ba881;
            auVar128._56_4_ = 0xbe5ba881;
            auVar128._60_4_ = 0xbe5ba881;
            auVar76 = vaddps_avx512f(auVar76,auVar128);
            auVar76 = vmulps_avx512f(auVar76,auVar75);
            auVar129._8_4_ = 0x3fc90fd1;
            auVar129._0_8_ = 0x3fc90fd13fc90fd1;
            auVar129._12_4_ = 0x3fc90fd1;
            auVar129._16_4_ = 0x3fc90fd1;
            auVar129._20_4_ = 0x3fc90fd1;
            auVar129._24_4_ = 0x3fc90fd1;
            auVar129._28_4_ = 0x3fc90fd1;
            auVar129._32_4_ = 0x3fc90fd1;
            auVar129._36_4_ = 0x3fc90fd1;
            auVar129._40_4_ = 0x3fc90fd1;
            auVar129._44_4_ = 0x3fc90fd1;
            auVar129._48_4_ = 0x3fc90fd1;
            auVar129._52_4_ = 0x3fc90fd1;
            auVar129._56_4_ = 0x3fc90fd1;
            auVar129._60_4_ = 0x3fc90fd1;
            auVar76 = vaddps_avx512f(auVar76,auVar129);
            auVar105 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar126 = vsubps_avx512f(auVar105,auVar75);
            auVar126 = vsqrtps_avx512f(auVar126);
            uVar64 = vcmpps_avx512f(auVar75,auVar105,6);
            auVar75 = vmulps_avx512f(auVar126,auVar76);
            auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar28 = vcmpps_avx512f(auVar177,auVar172,1);
            auVar76 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar75 = vsubps_avx512f(auVar76,auVar75);
            auVar75 = vmaxps_avx512f(auVar172,auVar75);
            auVar126 = vxorps_avx512dq(auVar75,auVar77);
            bVar14 = (bool)((byte)uVar28 & 1);
            auVar150._0_4_ = (uint)bVar14 * auVar126._0_4_ | (uint)!bVar14 * auVar75._0_4_;
            bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar75._4_4_;
            bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar75._8_4_;
            bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar75._12_4_;
            bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar150._16_4_ = (uint)bVar14 * auVar126._16_4_ | (uint)!bVar14 * auVar75._16_4_;
            bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar150._20_4_ = (uint)bVar14 * auVar126._20_4_ | (uint)!bVar14 * auVar75._20_4_;
            bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar150._24_4_ = (uint)bVar14 * auVar126._24_4_ | (uint)!bVar14 * auVar75._24_4_;
            bVar14 = (bool)((byte)(uVar28 >> 7) & 1);
            auVar150._28_4_ = (uint)bVar14 * auVar126._28_4_ | (uint)!bVar14 * auVar75._28_4_;
            bVar14 = (bool)((byte)(uVar28 >> 8) & 1);
            auVar150._32_4_ = (uint)bVar14 * auVar126._32_4_ | (uint)!bVar14 * auVar75._32_4_;
            bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
            auVar150._36_4_ = (uint)bVar14 * auVar126._36_4_ | (uint)!bVar14 * auVar75._36_4_;
            bVar14 = (bool)((byte)(uVar28 >> 10) & 1);
            auVar150._40_4_ = (uint)bVar14 * auVar126._40_4_ | (uint)!bVar14 * auVar75._40_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xb) & 1);
            auVar150._44_4_ = (uint)bVar14 * auVar126._44_4_ | (uint)!bVar14 * auVar75._44_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xc) & 1);
            auVar150._48_4_ = (uint)bVar14 * auVar126._48_4_ | (uint)!bVar14 * auVar75._48_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xd) & 1);
            auVar150._52_4_ = (uint)bVar14 * auVar126._52_4_ | (uint)!bVar14 * auVar75._52_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xe) & 1);
            auVar150._56_4_ = (uint)bVar14 * auVar126._56_4_ | (uint)!bVar14 * auVar75._56_4_;
            bVar14 = SUB81(uVar28 >> 0xf,0);
            auVar150._60_4_ = (uint)bVar14 * auVar126._60_4_ | (uint)!bVar14 * auVar75._60_4_;
            auVar75 = vsubps_avx512f(auVar76,auVar150);
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fc00000));
            bVar14 = (bool)((byte)uVar64 & 1);
            auVar151._0_4_ = (uint)bVar14 * auVar126._0_4_ | (uint)!bVar14 * auVar75._0_4_;
            bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar151._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar75._4_4_;
            bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar151._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar75._8_4_;
            bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar151._12_4_ = (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar75._12_4_;
            bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar151._16_4_ = (uint)bVar14 * auVar126._16_4_ | (uint)!bVar14 * auVar75._16_4_;
            bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar151._20_4_ = (uint)bVar14 * auVar126._20_4_ | (uint)!bVar14 * auVar75._20_4_;
            bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar151._24_4_ = (uint)bVar14 * auVar126._24_4_ | (uint)!bVar14 * auVar75._24_4_;
            bVar14 = (bool)((byte)(uVar64 >> 7) & 1);
            auVar151._28_4_ = (uint)bVar14 * auVar126._28_4_ | (uint)!bVar14 * auVar75._28_4_;
            bVar14 = (bool)((byte)(uVar64 >> 8) & 1);
            auVar151._32_4_ = (uint)bVar14 * auVar126._32_4_ | (uint)!bVar14 * auVar75._32_4_;
            bVar14 = (bool)((byte)(uVar64 >> 9) & 1);
            auVar151._36_4_ = (uint)bVar14 * auVar126._36_4_ | (uint)!bVar14 * auVar75._36_4_;
            bVar14 = (bool)((byte)(uVar64 >> 10) & 1);
            auVar151._40_4_ = (uint)bVar14 * auVar126._40_4_ | (uint)!bVar14 * auVar75._40_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xb) & 1);
            auVar151._44_4_ = (uint)bVar14 * auVar126._44_4_ | (uint)!bVar14 * auVar75._44_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xc) & 1);
            auVar151._48_4_ = (uint)bVar14 * auVar126._48_4_ | (uint)!bVar14 * auVar75._48_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xd) & 1);
            auVar151._52_4_ = (uint)bVar14 * auVar126._52_4_ | (uint)!bVar14 * auVar75._52_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xe) & 1);
            auVar151._56_4_ = (uint)bVar14 * auVar126._56_4_ | (uint)!bVar14 * auVar75._56_4_;
            bVar14 = SUB81(uVar64 >> 0xf,0);
            auVar151._60_4_ = (uint)bVar14 * auVar126._60_4_ | (uint)!bVar14 * auVar75._60_4_;
            auVar75 = vmulps_avx512f(auVar74,auVar151);
            auVar130._8_4_ = 0x3f22f983;
            auVar130._0_8_ = 0x3f22f9833f22f983;
            auVar130._12_4_ = 0x3f22f983;
            auVar130._16_4_ = 0x3f22f983;
            auVar130._20_4_ = 0x3f22f983;
            auVar130._24_4_ = 0x3f22f983;
            auVar130._28_4_ = 0x3f22f983;
            auVar130._32_4_ = 0x3f22f983;
            auVar130._36_4_ = 0x3f22f983;
            auVar130._40_4_ = 0x3f22f983;
            auVar130._44_4_ = 0x3f22f983;
            auVar130._48_4_ = 0x3f22f983;
            auVar130._52_4_ = 0x3f22f983;
            auVar130._56_4_ = 0x3f22f983;
            auVar130._60_4_ = 0x3f22f983;
            auVar126 = vmulps_avx512f(auVar75,auVar130);
            auVar126 = vrndscaleps_avx512f(auVar126,1);
            auVar76 = vmulps_avx512f(auVar126,auVar76);
            auVar75 = vsubps_avx512f(auVar75,auVar76);
            auVar76 = vcvtps2dq_avx512f(auVar126);
            auVar126 = vpbroadcastd_avx512f(ZEXT416(1));
            uVar30 = vptestnmd_avx512f(auVar76,auVar126);
            auVar131._8_4_ = 3;
            auVar131._0_8_ = 0x300000003;
            auVar131._12_4_ = 3;
            auVar131._16_4_ = 3;
            auVar131._20_4_ = 3;
            auVar131._24_4_ = 3;
            auVar131._28_4_ = 3;
            auVar131._32_4_ = 3;
            auVar131._36_4_ = 3;
            auVar131._40_4_ = 3;
            auVar131._44_4_ = 3;
            auVar131._48_4_ = 3;
            auVar131._52_4_ = 3;
            auVar131._56_4_ = 3;
            auVar131._60_4_ = 3;
            auVar127 = vpandd_avx512f(auVar76,auVar131);
            uVar64 = vpcmpgtd_avx512f(auVar127,auVar126);
            auVar126 = vpternlogd_avx512f(auVar126,auVar126,auVar126,0xff);
            auVar126 = vpaddd_avx512f(auVar127,auVar126);
            auVar132._8_4_ = 2;
            auVar132._0_8_ = 0x200000002;
            auVar132._12_4_ = 2;
            auVar132._16_4_ = 2;
            auVar132._20_4_ = 2;
            auVar132._24_4_ = 2;
            auVar132._28_4_ = 2;
            auVar132._32_4_ = 2;
            auVar132._36_4_ = 2;
            auVar132._40_4_ = 2;
            auVar132._44_4_ = 2;
            auVar132._48_4_ = 2;
            auVar132._52_4_ = 2;
            auVar132._56_4_ = 2;
            auVar132._60_4_ = 2;
            uVar28 = vpcmpud_avx512f(auVar126,auVar132,1);
            auVar76 = vpslld_avx512f(auVar76,0x1f);
            auVar126 = vmulps_avx512f(auVar75,auVar75);
            auVar133._8_4_ = 0xb2d70013;
            auVar133._0_8_ = 0xb2d70013b2d70013;
            auVar133._12_4_ = 0xb2d70013;
            auVar133._16_4_ = 0xb2d70013;
            auVar133._20_4_ = 0xb2d70013;
            auVar133._24_4_ = 0xb2d70013;
            auVar133._28_4_ = 0xb2d70013;
            auVar133._32_4_ = 0xb2d70013;
            auVar133._36_4_ = 0xb2d70013;
            auVar133._40_4_ = 0xb2d70013;
            auVar133._44_4_ = 0xb2d70013;
            auVar133._48_4_ = 0xb2d70013;
            auVar133._52_4_ = 0xb2d70013;
            auVar133._56_4_ = 0xb2d70013;
            auVar133._60_4_ = 0xb2d70013;
            auVar127 = vmulps_avx512f(auVar126,auVar133);
            auVar134._8_4_ = 0x363938a8;
            auVar134._0_8_ = 0x363938a8363938a8;
            auVar134._12_4_ = 0x363938a8;
            auVar134._16_4_ = 0x363938a8;
            auVar134._20_4_ = 0x363938a8;
            auVar134._24_4_ = 0x363938a8;
            auVar134._28_4_ = 0x363938a8;
            auVar134._32_4_ = 0x363938a8;
            auVar134._36_4_ = 0x363938a8;
            auVar134._40_4_ = 0x363938a8;
            auVar134._44_4_ = 0x363938a8;
            auVar134._48_4_ = 0x363938a8;
            auVar134._52_4_ = 0x363938a8;
            auVar134._56_4_ = 0x363938a8;
            auVar134._60_4_ = 0x363938a8;
            auVar127 = vaddps_avx512f(auVar127,auVar134);
            auVar135._8_4_ = 0xb48b634d;
            auVar135._0_8_ = 0xb48b634db48b634d;
            auVar135._12_4_ = 0xb48b634d;
            auVar135._16_4_ = 0xb48b634d;
            auVar135._20_4_ = 0xb48b634d;
            auVar135._24_4_ = 0xb48b634d;
            auVar135._28_4_ = 0xb48b634d;
            auVar135._32_4_ = 0xb48b634d;
            auVar135._36_4_ = 0xb48b634d;
            auVar135._40_4_ = 0xb48b634d;
            auVar135._44_4_ = 0xb48b634d;
            auVar135._48_4_ = 0xb48b634d;
            auVar135._52_4_ = 0xb48b634d;
            auVar135._56_4_ = 0xb48b634d;
            auVar135._60_4_ = 0xb48b634d;
            auVar128 = vmulps_avx512f(auVar126,auVar135);
            uVar67 = vpmovd2m_avx512dq(auVar76);
            auVar205._8_4_ = 0x37cfab9c;
            auVar205._0_8_ = 0x37cfab9c37cfab9c;
            auVar205._12_4_ = 0x37cfab9c;
            auVar205._16_4_ = 0x37cfab9c;
            auVar205._20_4_ = 0x37cfab9c;
            auVar205._24_4_ = 0x37cfab9c;
            auVar205._28_4_ = 0x37cfab9c;
            auVar205._32_4_ = 0x37cfab9c;
            auVar205._36_4_ = 0x37cfab9c;
            auVar205._40_4_ = 0x37cfab9c;
            auVar205._44_4_ = 0x37cfab9c;
            auVar205._48_4_ = 0x37cfab9c;
            auVar205._52_4_ = 0x37cfab9c;
            auVar205._56_4_ = 0x37cfab9c;
            auVar205._60_4_ = 0x37cfab9c;
            auVar76 = vaddps_avx512f(auVar128,auVar205);
            auVar127 = vmulps_avx512f(auVar126,auVar127);
            auVar49._8_4_ = 0xb9501096;
            auVar49._0_8_ = 0xb9501096b9501096;
            auVar49._12_4_ = 0xb9501096;
            auVar49._16_4_ = 0xb9501096;
            auVar49._20_4_ = 0xb9501096;
            auVar49._24_4_ = 0xb9501096;
            auVar49._28_4_ = 0xb9501096;
            auVar49._32_4_ = 0xb9501096;
            auVar49._36_4_ = 0xb9501096;
            auVar49._40_4_ = 0xb9501096;
            auVar49._44_4_ = 0xb9501096;
            auVar49._48_4_ = 0xb9501096;
            auVar49._52_4_ = 0xb9501096;
            auVar49._56_4_ = 0xb9501096;
            auVar49._60_4_ = 0xb9501096;
            auVar127 = vaddps_avx512f(auVar127,auVar49);
            auVar76 = vmulps_avx512f(auVar126,auVar76);
            auVar50._8_4_ = 0xbab60981;
            auVar50._0_8_ = 0xbab60981bab60981;
            auVar50._12_4_ = 0xbab60981;
            auVar50._16_4_ = 0xbab60981;
            auVar50._20_4_ = 0xbab60981;
            auVar50._24_4_ = 0xbab60981;
            auVar50._28_4_ = 0xbab60981;
            auVar50._32_4_ = 0xbab60981;
            auVar50._36_4_ = 0xbab60981;
            auVar50._40_4_ = 0xbab60981;
            auVar50._44_4_ = 0xbab60981;
            auVar50._48_4_ = 0xbab60981;
            auVar50._52_4_ = 0xbab60981;
            auVar50._56_4_ = 0xbab60981;
            auVar50._60_4_ = 0xbab60981;
            auVar76 = vaddps_avx512f(auVar76,auVar50);
            auVar127 = vmulps_avx512f(auVar126,auVar127);
            auVar51._8_4_ = 0x3c088898;
            auVar51._0_8_ = 0x3c0888983c088898;
            auVar51._12_4_ = 0x3c088898;
            auVar51._16_4_ = 0x3c088898;
            auVar51._20_4_ = 0x3c088898;
            auVar51._24_4_ = 0x3c088898;
            auVar51._28_4_ = 0x3c088898;
            auVar51._32_4_ = 0x3c088898;
            auVar51._36_4_ = 0x3c088898;
            auVar51._40_4_ = 0x3c088898;
            auVar51._44_4_ = 0x3c088898;
            auVar51._48_4_ = 0x3c088898;
            auVar51._52_4_ = 0x3c088898;
            auVar51._56_4_ = 0x3c088898;
            auVar51._60_4_ = 0x3c088898;
            auVar127 = vaddps_avx512f(auVar127,auVar51);
            auVar76 = vmulps_avx512f(auVar126,auVar76);
            auVar52._8_4_ = 0x3d2aaaa4;
            auVar52._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar52._12_4_ = 0x3d2aaaa4;
            auVar52._16_4_ = 0x3d2aaaa4;
            auVar52._20_4_ = 0x3d2aaaa4;
            auVar52._24_4_ = 0x3d2aaaa4;
            auVar52._28_4_ = 0x3d2aaaa4;
            auVar52._32_4_ = 0x3d2aaaa4;
            auVar52._36_4_ = 0x3d2aaaa4;
            auVar52._40_4_ = 0x3d2aaaa4;
            auVar52._44_4_ = 0x3d2aaaa4;
            auVar52._48_4_ = 0x3d2aaaa4;
            auVar52._52_4_ = 0x3d2aaaa4;
            auVar52._56_4_ = 0x3d2aaaa4;
            auVar52._60_4_ = 0x3d2aaaa4;
            auVar76 = vaddps_avx512f(auVar76,auVar52);
            auVar127 = vmulps_avx512f(auVar126,auVar127);
            auVar53._8_4_ = 0xbe2aaaab;
            auVar53._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar53._12_4_ = 0xbe2aaaab;
            auVar53._16_4_ = 0xbe2aaaab;
            auVar53._20_4_ = 0xbe2aaaab;
            auVar53._24_4_ = 0xbe2aaaab;
            auVar53._28_4_ = 0xbe2aaaab;
            auVar53._32_4_ = 0xbe2aaaab;
            auVar53._36_4_ = 0xbe2aaaab;
            auVar53._40_4_ = 0xbe2aaaab;
            auVar53._44_4_ = 0xbe2aaaab;
            auVar53._48_4_ = 0xbe2aaaab;
            auVar53._52_4_ = 0xbe2aaaab;
            auVar53._56_4_ = 0xbe2aaaab;
            auVar53._60_4_ = 0xbe2aaaab;
            auVar127 = vaddps_avx512f(auVar127,auVar53);
            auVar76 = vmulps_avx512f(auVar126,auVar76);
            auVar128 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
            auVar76 = vaddps_avx512f(auVar76,auVar128);
            auVar127 = vmulps_avx512f(auVar126,auVar127);
            auVar76 = vmulps_avx512f(auVar126,auVar76);
            auVar126 = vaddps_avx512f(auVar127,auVar105);
            auVar75 = vmulps_avx512f(auVar75,auVar126);
            auVar126 = vaddps_avx512f(auVar76,auVar105);
            auVar127 = vblendmps_avx512f(auVar75,auVar126);
            bVar14 = (bool)((byte)uVar67 & 1);
            auVar152._0_4_ = (uint)bVar14 * auVar127._0_4_ | (uint)!bVar14 * auVar76._0_4_;
            bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar152._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar76._4_4_;
            bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar152._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar76._8_4_;
            bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar152._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar76._12_4_;
            bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar152._16_4_ = (uint)bVar14 * auVar127._16_4_ | (uint)!bVar14 * auVar76._16_4_;
            bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar152._20_4_ = (uint)bVar14 * auVar127._20_4_ | (uint)!bVar14 * auVar76._20_4_;
            bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar152._24_4_ = (uint)bVar14 * auVar127._24_4_ | (uint)!bVar14 * auVar76._24_4_;
            bVar14 = (bool)((byte)(uVar67 >> 7) & 1);
            auVar152._28_4_ = (uint)bVar14 * auVar127._28_4_ | (uint)!bVar14 * auVar76._28_4_;
            bVar14 = (bool)((byte)(uVar67 >> 8) & 1);
            auVar152._32_4_ = (uint)bVar14 * auVar127._32_4_ | (uint)!bVar14 * auVar76._32_4_;
            bVar14 = (bool)((byte)(uVar67 >> 9) & 1);
            auVar152._36_4_ = (uint)bVar14 * auVar127._36_4_ | (uint)!bVar14 * auVar76._36_4_;
            bVar14 = (bool)((byte)(uVar67 >> 10) & 1);
            auVar152._40_4_ = (uint)bVar14 * auVar127._40_4_ | (uint)!bVar14 * auVar76._40_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xb) & 1);
            auVar152._44_4_ = (uint)bVar14 * auVar127._44_4_ | (uint)!bVar14 * auVar76._44_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xc) & 1);
            auVar152._48_4_ = (uint)bVar14 * auVar127._48_4_ | (uint)!bVar14 * auVar76._48_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xd) & 1);
            auVar152._52_4_ = (uint)bVar14 * auVar127._52_4_ | (uint)!bVar14 * auVar76._52_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xe) & 1);
            auVar152._56_4_ = (uint)bVar14 * auVar127._56_4_ | (uint)!bVar14 * auVar76._56_4_;
            bVar14 = (bool)((byte)(uVar67 >> 0xf) & 1);
            auVar152._60_4_ = (uint)bVar14 * auVar127._60_4_ | (uint)!bVar14 * auVar76._60_4_;
            bVar14 = (bool)((byte)uVar30 & 1);
            auVar153._0_4_ = (uint)bVar14 * auVar126._0_4_ | (uint)!bVar14 * auVar75._0_4_;
            bVar14 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar153._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar75._4_4_;
            bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar153._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar75._8_4_;
            bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
            auVar153._12_4_ = (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar75._12_4_;
            bVar14 = (bool)((byte)(uVar30 >> 4) & 1);
            auVar153._16_4_ = (uint)bVar14 * auVar126._16_4_ | (uint)!bVar14 * auVar75._16_4_;
            bVar14 = (bool)((byte)(uVar30 >> 5) & 1);
            auVar153._20_4_ = (uint)bVar14 * auVar126._20_4_ | (uint)!bVar14 * auVar75._20_4_;
            bVar14 = (bool)((byte)(uVar30 >> 6) & 1);
            auVar153._24_4_ = (uint)bVar14 * auVar126._24_4_ | (uint)!bVar14 * auVar75._24_4_;
            bVar14 = (bool)((byte)(uVar30 >> 7) & 1);
            auVar153._28_4_ = (uint)bVar14 * auVar126._28_4_ | (uint)!bVar14 * auVar75._28_4_;
            bVar14 = (bool)((byte)(uVar30 >> 8) & 1);
            auVar153._32_4_ = (uint)bVar14 * auVar126._32_4_ | (uint)!bVar14 * auVar75._32_4_;
            bVar14 = (bool)((byte)(uVar30 >> 9) & 1);
            auVar153._36_4_ = (uint)bVar14 * auVar126._36_4_ | (uint)!bVar14 * auVar75._36_4_;
            bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
            auVar153._40_4_ = (uint)bVar14 * auVar126._40_4_ | (uint)!bVar14 * auVar75._40_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xb) & 1);
            auVar153._44_4_ = (uint)bVar14 * auVar126._44_4_ | (uint)!bVar14 * auVar75._44_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xc) & 1);
            auVar153._48_4_ = (uint)bVar14 * auVar126._48_4_ | (uint)!bVar14 * auVar75._48_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xd) & 1);
            auVar153._52_4_ = (uint)bVar14 * auVar126._52_4_ | (uint)!bVar14 * auVar75._52_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xe) & 1);
            auVar153._56_4_ = (uint)bVar14 * auVar126._56_4_ | (uint)!bVar14 * auVar75._56_4_;
            bVar14 = SUB81(uVar30 >> 0xf,0);
            auVar153._60_4_ = (uint)bVar14 * auVar126._60_4_ | (uint)!bVar14 * auVar75._60_4_;
            auVar75 = vxorps_avx512dq(auVar106,auVar77);
            bVar13 = (byte)uVar61;
            auVar154._0_4_ =
                 (uint)(bVar13 & 1) * auVar75._0_4_ | !(bool)(bVar13 & 1) * auVar106._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar154._4_4_ = (uint)bVar14 * auVar75._4_4_ | !bVar14 * auVar106._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar154._8_4_ = (uint)bVar14 * auVar75._8_4_ | !bVar14 * auVar106._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar154._12_4_ = (uint)bVar14 * auVar75._12_4_ | !bVar14 * auVar106._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar154._16_4_ = (uint)bVar14 * auVar75._16_4_ | !bVar14 * auVar106._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar154._20_4_ = (uint)bVar14 * auVar75._20_4_ | !bVar14 * auVar106._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar154._24_4_ = (uint)bVar14 * auVar75._24_4_ | !bVar14 * auVar106._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar154._28_4_ = (uint)bVar14 * auVar75._28_4_ | !bVar14 * auVar106._28_4_;
            bVar21 = (byte)(uVar61 >> 8);
            auVar154._32_4_ =
                 (uint)(bVar21 & 1) * auVar75._32_4_ | !(bool)(bVar21 & 1) * auVar106._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar154._36_4_ = (uint)bVar14 * auVar75._36_4_ | !bVar14 * auVar106._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar154._40_4_ = (uint)bVar14 * auVar75._40_4_ | !bVar14 * auVar106._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar154._44_4_ = (uint)bVar14 * auVar75._44_4_ | !bVar14 * auVar106._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar154._48_4_ = (uint)bVar14 * auVar75._48_4_ | !bVar14 * auVar106._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar154._52_4_ = (uint)bVar14 * auVar75._52_4_ | !bVar14 * auVar106._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar154._56_4_ = (uint)bVar14 * auVar75._56_4_ | !bVar14 * auVar106._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar154._60_4_ = (uint)bVar14 * auVar75._60_4_ | !bVar14 * auVar106._60_4_;
            auVar75 = vxorps_avx512dq(auVar115,auVar77);
            auVar155._0_4_ =
                 (uint)(bVar13 & 1) * auVar75._0_4_ | !(bool)(bVar13 & 1) * auVar115._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar155._4_4_ = (uint)bVar14 * auVar75._4_4_ | !bVar14 * auVar115._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar155._8_4_ = (uint)bVar14 * auVar75._8_4_ | !bVar14 * auVar115._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar155._12_4_ = (uint)bVar14 * auVar75._12_4_ | !bVar14 * auVar115._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar155._16_4_ = (uint)bVar14 * auVar75._16_4_ | !bVar14 * auVar115._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar155._20_4_ = (uint)bVar14 * auVar75._20_4_ | !bVar14 * auVar115._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar155._24_4_ = (uint)bVar14 * auVar75._24_4_ | !bVar14 * auVar115._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar155._28_4_ = (uint)bVar14 * auVar75._28_4_ | !bVar14 * auVar115._28_4_;
            auVar155._32_4_ =
                 (uint)(bVar21 & 1) * auVar75._32_4_ | !(bool)(bVar21 & 1) * auVar115._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar155._36_4_ = (uint)bVar14 * auVar75._36_4_ | !bVar14 * auVar115._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar155._40_4_ = (uint)bVar14 * auVar75._40_4_ | !bVar14 * auVar115._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar155._44_4_ = (uint)bVar14 * auVar75._44_4_ | !bVar14 * auVar115._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar155._48_4_ = (uint)bVar14 * auVar75._48_4_ | !bVar14 * auVar115._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar155._52_4_ = (uint)bVar14 * auVar75._52_4_ | !bVar14 * auVar115._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar155._56_4_ = (uint)bVar14 * auVar75._56_4_ | !bVar14 * auVar115._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar155._60_4_ = (uint)bVar14 * auVar75._60_4_ | !bVar14 * auVar115._60_4_;
            auVar75 = vfmsub213ps_avx512f(auVar112,auVar177,auVar154);
            auVar76 = vfmsub213ps_avx512f(auVar107,auVar177,auVar155);
            auVar106 = vmulps_avx512f(auVar75,auVar75);
            auVar115 = vmulps_avx512f(auVar76,auVar76);
            auVar106 = vaddps_avx512f(auVar106,auVar115);
            auVar115 = vxorps_avx512dq(auVar124,auVar77);
            auVar156._0_4_ =
                 (uint)(bVar13 & 1) * auVar115._0_4_ | !(bool)(bVar13 & 1) * auVar124._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar156._4_4_ = (uint)bVar14 * auVar115._4_4_ | !bVar14 * auVar124._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar156._8_4_ = (uint)bVar14 * auVar115._8_4_ | !bVar14 * auVar124._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar156._12_4_ = (uint)bVar14 * auVar115._12_4_ | !bVar14 * auVar124._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar156._16_4_ = (uint)bVar14 * auVar115._16_4_ | !bVar14 * auVar124._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar156._20_4_ = (uint)bVar14 * auVar115._20_4_ | !bVar14 * auVar124._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar156._24_4_ = (uint)bVar14 * auVar115._24_4_ | !bVar14 * auVar124._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar156._28_4_ = (uint)bVar14 * auVar115._28_4_ | !bVar14 * auVar124._28_4_;
            auVar156._32_4_ =
                 (uint)(bVar21 & 1) * auVar115._32_4_ | !(bool)(bVar21 & 1) * auVar124._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar156._36_4_ = (uint)bVar14 * auVar115._36_4_ | !bVar14 * auVar124._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar156._40_4_ = (uint)bVar14 * auVar115._40_4_ | !bVar14 * auVar124._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar156._44_4_ = (uint)bVar14 * auVar115._44_4_ | !bVar14 * auVar124._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar156._48_4_ = (uint)bVar14 * auVar115._48_4_ | !bVar14 * auVar124._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar156._52_4_ = (uint)bVar14 * auVar115._52_4_ | !bVar14 * auVar124._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar156._56_4_ = (uint)bVar14 * auVar115._56_4_ | !bVar14 * auVar124._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar156._60_4_ = (uint)bVar14 * auVar115._60_4_ | !bVar14 * auVar124._60_4_;
            auVar115 = vfmsub213ps_avx512f(auVar110,auVar177,auVar156);
            auVar124 = vmulps_avx512f(auVar115,auVar115);
            auVar106 = vaddps_avx512f(auVar124,auVar106);
            auVar124 = vxorps_avx512dq(auVar125,auVar77);
            auVar157._0_4_ =
                 (uint)(bVar13 & 1) * auVar124._0_4_ | !(bool)(bVar13 & 1) * auVar125._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar157._4_4_ = (uint)bVar14 * auVar124._4_4_ | !bVar14 * auVar125._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar157._8_4_ = (uint)bVar14 * auVar124._8_4_ | !bVar14 * auVar125._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar157._12_4_ = (uint)bVar14 * auVar124._12_4_ | !bVar14 * auVar125._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar157._16_4_ = (uint)bVar14 * auVar124._16_4_ | !bVar14 * auVar125._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar157._20_4_ = (uint)bVar14 * auVar124._20_4_ | !bVar14 * auVar125._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar157._24_4_ = (uint)bVar14 * auVar124._24_4_ | !bVar14 * auVar125._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar157._28_4_ = (uint)bVar14 * auVar124._28_4_ | !bVar14 * auVar125._28_4_;
            auVar157._32_4_ =
                 (uint)(bVar21 & 1) * auVar124._32_4_ | !(bool)(bVar21 & 1) * auVar125._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar157._36_4_ = (uint)bVar14 * auVar124._36_4_ | !bVar14 * auVar125._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar157._40_4_ = (uint)bVar14 * auVar124._40_4_ | !bVar14 * auVar125._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar157._44_4_ = (uint)bVar14 * auVar124._44_4_ | !bVar14 * auVar125._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar157._48_4_ = (uint)bVar14 * auVar124._48_4_ | !bVar14 * auVar125._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar157._52_4_ = (uint)bVar14 * auVar124._52_4_ | !bVar14 * auVar125._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar157._56_4_ = (uint)bVar14 * auVar124._56_4_ | !bVar14 * auVar125._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar157._60_4_ = (uint)bVar14 * auVar124._60_4_ | !bVar14 * auVar125._60_4_;
            auVar124 = vfmsub213ps_avx512f(auVar111,auVar177,auVar157);
            auVar125 = vmulps_avx512f(auVar124,auVar124);
            auVar106 = vaddps_avx512f(auVar125,auVar106);
            auVar125 = vrsqrt14ps_avx512f(auVar106);
            auVar106 = vmulps_avx512f(auVar106,auVar128);
            auVar106 = vmulps_avx512f(auVar106,auVar125);
            auVar126 = vmulps_avx512f(auVar125,auVar125);
            auVar106 = vmulps_avx512f(auVar106,auVar126);
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar106 = vfmadd231ps_avx512f(auVar106,auVar126,auVar125);
            auVar75 = vmulps_avx512f(auVar75,auVar106);
            auVar76 = vmulps_avx512f(auVar76,auVar106);
            auVar115 = vmulps_avx512f(auVar115,auVar106);
            auVar106 = vmulps_avx512f(auVar124,auVar106);
            auVar124 = vxorps_avx512dq(auVar153,auVar77);
            bVar14 = (bool)((byte)uVar28 & 1);
            auVar158._0_4_ = (uint)bVar14 * auVar124._0_4_ | !bVar14 * auVar153._0_4_;
            bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar158._4_4_ = (uint)bVar14 * auVar124._4_4_ | !bVar14 * auVar153._4_4_;
            bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar158._8_4_ = (uint)bVar14 * auVar124._8_4_ | !bVar14 * auVar153._8_4_;
            bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar158._12_4_ = (uint)bVar14 * auVar124._12_4_ | !bVar14 * auVar153._12_4_;
            bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar158._16_4_ = (uint)bVar14 * auVar124._16_4_ | !bVar14 * auVar153._16_4_;
            bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar158._20_4_ = (uint)bVar14 * auVar124._20_4_ | !bVar14 * auVar153._20_4_;
            bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar158._24_4_ = (uint)bVar14 * auVar124._24_4_ | !bVar14 * auVar153._24_4_;
            bVar14 = (bool)((byte)(uVar28 >> 7) & 1);
            auVar158._28_4_ = (uint)bVar14 * auVar124._28_4_ | !bVar14 * auVar153._28_4_;
            bVar14 = (bool)((byte)(uVar28 >> 8) & 1);
            auVar158._32_4_ = (uint)bVar14 * auVar124._32_4_ | !bVar14 * auVar153._32_4_;
            bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
            auVar158._36_4_ = (uint)bVar14 * auVar124._36_4_ | !bVar14 * auVar153._36_4_;
            bVar14 = (bool)((byte)(uVar28 >> 10) & 1);
            auVar158._40_4_ = (uint)bVar14 * auVar124._40_4_ | !bVar14 * auVar153._40_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xb) & 1);
            auVar158._44_4_ = (uint)bVar14 * auVar124._44_4_ | !bVar14 * auVar153._44_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xc) & 1);
            auVar158._48_4_ = (uint)bVar14 * auVar124._48_4_ | !bVar14 * auVar153._48_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xd) & 1);
            auVar158._52_4_ = (uint)bVar14 * auVar124._52_4_ | !bVar14 * auVar153._52_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xe) & 1);
            auVar158._56_4_ = (uint)bVar14 * auVar124._56_4_ | !bVar14 * auVar153._56_4_;
            bVar14 = SUB81(uVar28 >> 0xf,0);
            auVar158._60_4_ = (uint)bVar14 * auVar124._60_4_ | !bVar14 * auVar153._60_4_;
            auVar77 = vxorps_avx512dq(auVar152,auVar77);
            bVar14 = (bool)((byte)uVar64 & 1);
            auVar159._0_4_ = bVar14 * auVar152._0_4_ | (uint)!bVar14 * auVar77._0_4_;
            bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar159._4_4_ = bVar14 * auVar152._4_4_ | (uint)!bVar14 * auVar77._4_4_;
            bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar159._8_4_ = bVar14 * auVar152._8_4_ | (uint)!bVar14 * auVar77._8_4_;
            bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar159._12_4_ = bVar14 * auVar152._12_4_ | (uint)!bVar14 * auVar77._12_4_;
            bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar159._16_4_ = bVar14 * auVar152._16_4_ | (uint)!bVar14 * auVar77._16_4_;
            bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar159._20_4_ = bVar14 * auVar152._20_4_ | (uint)!bVar14 * auVar77._20_4_;
            bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar159._24_4_ = bVar14 * auVar152._24_4_ | (uint)!bVar14 * auVar77._24_4_;
            bVar14 = (bool)((byte)(uVar64 >> 7) & 1);
            auVar159._28_4_ = bVar14 * auVar152._28_4_ | (uint)!bVar14 * auVar77._28_4_;
            bVar14 = (bool)((byte)(uVar64 >> 8) & 1);
            auVar159._32_4_ = bVar14 * auVar152._32_4_ | (uint)!bVar14 * auVar77._32_4_;
            bVar14 = (bool)((byte)(uVar64 >> 9) & 1);
            auVar159._36_4_ = bVar14 * auVar152._36_4_ | (uint)!bVar14 * auVar77._36_4_;
            bVar14 = (bool)((byte)(uVar64 >> 10) & 1);
            auVar159._40_4_ = bVar14 * auVar152._40_4_ | (uint)!bVar14 * auVar77._40_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xb) & 1);
            auVar159._44_4_ = bVar14 * auVar152._44_4_ | (uint)!bVar14 * auVar77._44_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xc) & 1);
            auVar159._48_4_ = bVar14 * auVar152._48_4_ | (uint)!bVar14 * auVar77._48_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xd) & 1);
            auVar159._52_4_ = bVar14 * auVar152._52_4_ | (uint)!bVar14 * auVar77._52_4_;
            bVar14 = (bool)((byte)(uVar64 >> 0xe) & 1);
            auVar159._56_4_ = bVar14 * auVar152._56_4_ | (uint)!bVar14 * auVar77._56_4_;
            bVar14 = SUB81(uVar64 >> 0xf,0);
            auVar159._60_4_ = bVar14 * auVar152._60_4_ | (uint)!bVar14 * auVar77._60_4_;
            auVar75 = vmulps_avx512f(auVar75,auVar159);
            auVar76 = vmulps_avx512f(auVar76,auVar159);
            auVar77 = vmulps_avx512f(auVar115,auVar159);
            auVar106 = vmulps_avx512f(auVar106,auVar159);
            auVar75 = vfmadd231ps_avx512f(auVar75,auVar158,auVar112);
            auVar76 = vfmadd231ps_avx512f(auVar76,auVar158,auVar107);
            auVar77 = vfmadd231ps_avx512f(auVar77,auVar158,auVar110);
            auVar106 = vfmadd231ps_avx512f(auVar106,auVar111,auVar158);
            auVar115 = vsubps_avx512f(auVar154,auVar112);
            auVar112 = vfmadd213ps_avx512f(auVar115,auVar74,auVar112);
            auVar115 = vsubps_avx512f(auVar155,auVar107);
            auVar107 = vfmadd213ps_avx512f(auVar115,auVar74,auVar107);
            auVar115 = vsubps_avx512f(auVar156,auVar110);
            auVar110 = vfmadd213ps_avx512f(auVar115,auVar74,auVar110);
            auVar115 = vsubps_avx512f(auVar157,auVar111);
            auVar111 = vfmadd213ps_avx512f(auVar115,auVar74,auVar111);
            auVar115 = vmulps_avx512f(auVar112,auVar112);
            auVar124 = vmulps_avx512f(auVar107,auVar107);
            auVar115 = vaddps_avx512f(auVar115,auVar124);
            auVar124 = vmulps_avx512f(auVar110,auVar110);
            auVar115 = vaddps_avx512f(auVar124,auVar115);
            auVar124 = vmulps_avx512f(auVar111,auVar111);
            auVar115 = vaddps_avx512f(auVar124,auVar115);
            auVar124 = vmulps_avx512f(auVar115,auVar128);
            auVar115 = vrsqrt14ps_avx512f(auVar115);
            auVar124 = vmulps_avx512f(auVar124,auVar115);
            auVar125 = vmulps_avx512f(auVar115,auVar115);
            auVar124 = vmulps_avx512f(auVar124,auVar125);
            auVar115 = vfmadd231ps_avx512f(auVar124,auVar115,auVar126);
            auVar54._8_4_ = 0x3f7fdf3b;
            auVar54._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar54._12_4_ = 0x3f7fdf3b;
            auVar54._16_4_ = 0x3f7fdf3b;
            auVar54._20_4_ = 0x3f7fdf3b;
            auVar54._24_4_ = 0x3f7fdf3b;
            auVar54._28_4_ = 0x3f7fdf3b;
            auVar54._32_4_ = 0x3f7fdf3b;
            auVar54._36_4_ = 0x3f7fdf3b;
            auVar54._40_4_ = 0x3f7fdf3b;
            auVar54._44_4_ = 0x3f7fdf3b;
            auVar54._48_4_ = 0x3f7fdf3b;
            auVar54._52_4_ = 0x3f7fdf3b;
            auVar54._56_4_ = 0x3f7fdf3b;
            auVar54._60_4_ = 0x3f7fdf3b;
            uVar61 = vcmpps_avx512f(auVar177,auVar54,6);
            auVar177 = vmulps_avx512f(auVar112,auVar115);
            bVar13 = (byte)uVar61;
            auVar160._0_4_ =
                 (uint)(bVar13 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar75._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar160._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar75._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar160._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar75._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar160._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar75._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar160._16_4_ = (uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar75._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar160._20_4_ = (uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar75._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar160._24_4_ = (uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar75._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar160._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar75._28_4_;
            bVar21 = (byte)(uVar61 >> 8);
            auVar160._32_4_ =
                 (uint)(bVar21 & 1) * auVar177._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar75._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar160._36_4_ = (uint)bVar14 * auVar177._36_4_ | (uint)!bVar14 * auVar75._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar160._40_4_ = (uint)bVar14 * auVar177._40_4_ | (uint)!bVar14 * auVar75._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar160._44_4_ = (uint)bVar14 * auVar177._44_4_ | (uint)!bVar14 * auVar75._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar160._48_4_ = (uint)bVar14 * auVar177._48_4_ | (uint)!bVar14 * auVar75._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar160._52_4_ = (uint)bVar14 * auVar177._52_4_ | (uint)!bVar14 * auVar75._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar160._56_4_ = (uint)bVar14 * auVar177._56_4_ | (uint)!bVar14 * auVar75._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar160._60_4_ = (uint)bVar14 * auVar177._60_4_ | (uint)!bVar14 * auVar75._60_4_;
            auVar177 = vmulps_avx512f(auVar107,auVar115);
            auVar161._0_4_ =
                 (uint)(bVar13 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar76._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar161._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar76._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar161._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar76._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar161._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar76._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar161._16_4_ = (uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar76._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar161._20_4_ = (uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar76._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar161._24_4_ = (uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar76._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar161._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar76._28_4_;
            auVar161._32_4_ =
                 (uint)(bVar21 & 1) * auVar177._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar76._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar161._36_4_ = (uint)bVar14 * auVar177._36_4_ | (uint)!bVar14 * auVar76._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar161._40_4_ = (uint)bVar14 * auVar177._40_4_ | (uint)!bVar14 * auVar76._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar161._44_4_ = (uint)bVar14 * auVar177._44_4_ | (uint)!bVar14 * auVar76._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar161._48_4_ = (uint)bVar14 * auVar177._48_4_ | (uint)!bVar14 * auVar76._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar161._52_4_ = (uint)bVar14 * auVar177._52_4_ | (uint)!bVar14 * auVar76._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar161._56_4_ = (uint)bVar14 * auVar177._56_4_ | (uint)!bVar14 * auVar76._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar161._60_4_ = (uint)bVar14 * auVar177._60_4_ | (uint)!bVar14 * auVar76._60_4_;
            auVar177 = vmulps_avx512f(auVar110,auVar115);
            auVar162._0_4_ =
                 (uint)(bVar13 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar77._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar162._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar77._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar162._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar77._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar162._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar77._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar162._16_4_ = (uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar77._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar162._20_4_ = (uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar77._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar162._24_4_ = (uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar77._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar162._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar77._28_4_;
            auVar162._32_4_ =
                 (uint)(bVar21 & 1) * auVar177._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar77._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar162._36_4_ = (uint)bVar14 * auVar177._36_4_ | (uint)!bVar14 * auVar77._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar162._40_4_ = (uint)bVar14 * auVar177._40_4_ | (uint)!bVar14 * auVar77._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar162._44_4_ = (uint)bVar14 * auVar177._44_4_ | (uint)!bVar14 * auVar77._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar162._48_4_ = (uint)bVar14 * auVar177._48_4_ | (uint)!bVar14 * auVar77._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar162._52_4_ = (uint)bVar14 * auVar177._52_4_ | (uint)!bVar14 * auVar77._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar162._56_4_ = (uint)bVar14 * auVar177._56_4_ | (uint)!bVar14 * auVar77._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar162._60_4_ = (uint)bVar14 * auVar177._60_4_ | (uint)!bVar14 * auVar77._60_4_;
            auVar177 = vmulps_avx512f(auVar111,auVar115);
            auVar163._0_4_ =
                 (uint)(bVar13 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar106._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar163._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar106._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar163._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar106._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar163._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar106._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar163._16_4_ = (uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar106._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar163._20_4_ = (uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar106._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar163._24_4_ = (uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar106._24_4_;
            bVar14 = (bool)((byte)(uVar61 >> 7) & 1);
            auVar163._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar106._28_4_;
            auVar163._32_4_ =
                 (uint)(bVar21 & 1) * auVar177._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar106._32_4_;
            bVar14 = (bool)((byte)(uVar61 >> 9) & 1);
            auVar163._36_4_ = (uint)bVar14 * auVar177._36_4_ | (uint)!bVar14 * auVar106._36_4_;
            bVar14 = (bool)((byte)(uVar61 >> 10) & 1);
            auVar163._40_4_ = (uint)bVar14 * auVar177._40_4_ | (uint)!bVar14 * auVar106._40_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xb) & 1);
            auVar163._44_4_ = (uint)bVar14 * auVar177._44_4_ | (uint)!bVar14 * auVar106._44_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xc) & 1);
            auVar163._48_4_ = (uint)bVar14 * auVar177._48_4_ | (uint)!bVar14 * auVar106._48_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xd) & 1);
            auVar163._52_4_ = (uint)bVar14 * auVar177._52_4_ | (uint)!bVar14 * auVar106._52_4_;
            bVar14 = (bool)((byte)(uVar61 >> 0xe) & 1);
            auVar163._56_4_ = (uint)bVar14 * auVar177._56_4_ | (uint)!bVar14 * auVar106._56_4_;
            bVar14 = SUB81(uVar61 >> 0xf,0);
            auVar163._60_4_ = (uint)bVar14 * auVar177._60_4_ | (uint)!bVar14 * auVar106._60_4_;
            auVar177 = vsubps_avx512f(auVar105,auVar74);
            auVar75 = vmulps_avx512f(auVar74,auVar113);
            auVar75 = vfmadd213ps_avx512f(auVar78,auVar177,auVar75);
            auVar76 = vmulps_avx512f(auVar74,auVar109);
            auVar76 = vfmadd213ps_avx512f(auVar108,auVar177,auVar76);
            auVar77 = vmulps_avx512f(auVar74,auVar114);
            auVar77 = vfmadd213ps_avx512f(local_240,auVar177,auVar77);
            auVar78 = vmulps_avx512f(auVar74,auVar116);
            auVar106 = vmulps_avx512f(auVar74,auVar121);
            auVar108 = vmulps_avx512f(auVar74,auVar122);
            auVar78 = vfmadd213ps_avx512f(local_340,auVar177,auVar78);
            auVar106 = vfmadd213ps_avx512f(local_400,auVar177,auVar106);
            auVar108 = vfmadd213ps_avx512f(local_300,auVar177,auVar108);
            auVar55._4_4_ = uStack_1bc;
            auVar55._0_4_ = local_1c0;
            auVar55._8_4_ = uStack_1b8;
            auVar55._12_4_ = uStack_1b4;
            auVar55._16_4_ = uStack_1b0;
            auVar55._20_4_ = uStack_1ac;
            auVar55._24_4_ = uStack_1a8;
            auVar55._28_4_ = uStack_1a4;
            auVar55._32_4_ = uStack_1a0;
            auVar55._36_4_ = uStack_19c;
            auVar55._40_4_ = uStack_198;
            auVar55._44_4_ = uStack_194;
            auVar55._48_4_ = uStack_190;
            auVar55._52_4_ = uStack_18c;
            auVar55._56_4_ = uStack_188;
            auVar55._60_4_ = uStack_184;
            auVar105 = vmulps_avx512f(auVar74,auVar55);
            auVar56._4_4_ = uStack_17c;
            auVar56._0_4_ = local_180;
            auVar56._8_4_ = uStack_178;
            auVar56._12_4_ = uStack_174;
            auVar56._16_4_ = uStack_170;
            auVar56._20_4_ = uStack_16c;
            auVar56._24_4_ = uStack_168;
            auVar56._28_4_ = uStack_164;
            auVar56._32_4_ = uStack_160;
            auVar56._36_4_ = uStack_15c;
            auVar56._40_4_ = uStack_158;
            auVar56._44_4_ = uStack_154;
            auVar56._48_4_ = uStack_150;
            auVar56._52_4_ = uStack_14c;
            auVar56._56_4_ = uStack_148;
            auVar56._60_4_ = uStack_144;
            auVar107 = vmulps_avx512f(auVar74,auVar56);
            auVar57._4_4_ = uStack_13c;
            auVar57._0_4_ = local_140;
            auVar57._8_4_ = uStack_138;
            auVar57._12_4_ = uStack_134;
            auVar57._16_4_ = uStack_130;
            auVar57._20_4_ = uStack_12c;
            auVar57._24_4_ = uStack_128;
            auVar57._28_4_ = uStack_124;
            auVar57._32_4_ = uStack_120;
            auVar57._36_4_ = uStack_11c;
            auVar57._40_4_ = uStack_118;
            auVar57._44_4_ = uStack_114;
            auVar57._48_4_ = uStack_110;
            auVar57._52_4_ = uStack_10c;
            auVar57._56_4_ = uStack_108;
            auVar57._60_4_ = uStack_104;
            auVar109 = vmulps_avx512f(auVar74,auVar57);
            auVar105 = vfmadd213ps_avx512f(local_480,auVar177,auVar105);
            auVar107 = vfmadd213ps_avx512f(local_380,auVar177,auVar107);
            auVar109 = vfmadd213ps_avx512f(local_2c0,auVar177,auVar109);
            auVar58._4_4_ = uStack_fc;
            auVar58._0_4_ = local_100;
            auVar58._8_4_ = uStack_f8;
            auVar58._12_4_ = uStack_f4;
            auVar58._16_4_ = uStack_f0;
            auVar58._20_4_ = uStack_ec;
            auVar58._24_4_ = uStack_e8;
            auVar58._28_4_ = uStack_e4;
            auVar58._32_4_ = uStack_e0;
            auVar58._36_4_ = uStack_dc;
            auVar58._40_4_ = uStack_d8;
            auVar58._44_4_ = uStack_d4;
            auVar58._48_4_ = uStack_d0;
            auVar58._52_4_ = uStack_cc;
            auVar58._56_4_ = uStack_c8;
            auVar58._60_4_ = uStack_c4;
            auVar110 = vmulps_avx512f(auVar74,auVar58);
            auVar59._4_4_ = uStack_bc;
            auVar59._0_4_ = local_c0;
            auVar59._8_4_ = uStack_b8;
            auVar59._12_4_ = uStack_b4;
            auVar59._16_4_ = uStack_b0;
            auVar59._20_4_ = uStack_ac;
            auVar59._24_4_ = uStack_a8;
            auVar59._28_4_ = uStack_a4;
            auVar59._32_4_ = uStack_a0;
            auVar59._36_4_ = uStack_9c;
            auVar59._40_4_ = uStack_98;
            auVar59._44_4_ = uStack_94;
            auVar59._48_4_ = uStack_90;
            auVar59._52_4_ = uStack_8c;
            auVar59._56_4_ = uStack_88;
            auVar59._60_4_ = uStack_84;
            auVar111 = vmulps_avx512f(auVar74,auVar59);
            auVar74 = vmulps_avx512f(auVar74,local_280);
            auVar110 = vfmadd213ps_avx512f(local_440,auVar177,auVar110);
            auVar111 = vfmadd213ps_avx512f(local_4c0,auVar177,auVar111);
            auVar74 = vfmadd213ps_avx512f(local_3c0,auVar177,auVar74);
            auVar177 = vmulps_avx512f(auVar160,auVar160);
            auVar112 = vmulps_avx512f(auVar161,auVar161);
            auVar113 = vaddps_avx512f(auVar177,auVar112);
            auVar114 = vmulps_avx512f(auVar162,auVar162);
            auVar113 = vsubps_avx512f(auVar113,auVar114);
            auVar115 = vmulps_avx512f(auVar163,auVar163);
            auVar113 = vsubps_avx512f(auVar113,auVar115);
            auVar116 = vmulps_avx512f(auVar161,auVar162);
            auVar121 = vmulps_avx512f(auVar160,auVar163);
            auVar122 = vaddps_avx512f(auVar116,auVar121);
            auVar122 = vaddps_avx512f(auVar122,auVar122);
            auVar124 = vmulps_avx512f(auVar161,auVar163);
            auVar125 = vmulps_avx512f(auVar160,auVar162);
            auVar126 = vsubps_avx512f(auVar124,auVar125);
            auVar126 = vaddps_avx512f(auVar126,auVar126);
            auVar116 = vsubps_avx512f(auVar116,auVar121);
            auVar116 = vaddps_avx512f(auVar116,auVar116);
            auVar177 = vsubps_avx512f(auVar177,auVar112);
            auVar112 = vaddps_avx512f(auVar114,auVar177);
            auVar112 = vsubps_avx512f(auVar112,auVar115);
            auVar121 = vmulps_avx512f(auVar162,auVar163);
            auVar127 = vmulps_avx512f(auVar160,auVar161);
            auVar128 = vaddps_avx512f(auVar121,auVar127);
            auVar128 = vaddps_avx512f(auVar128,auVar128);
            auVar124 = vaddps_avx512f(auVar124,auVar125);
            auVar124 = vaddps_avx512f(auVar124,auVar124);
            auVar121 = vsubps_avx512f(auVar121,auVar127);
            auVar121 = vaddps_avx512f(auVar121,auVar121);
            auVar177 = vsubps_avx512f(auVar177,auVar114);
            auVar177 = vaddps_avx512f(auVar115,auVar177);
            auVar114 = vmulps_avx512f(auVar126,auVar172);
            auVar115 = vfmadd213ps_avx512f(ZEXT864(0) << 0x20,auVar122,auVar114);
            auVar114 = vaddps_avx512f(auVar122,auVar114);
            auVar122 = vfmadd213ps_avx512f(auVar122,auVar172,auVar126);
            auVar114 = vfmadd231ps_avx512f(auVar114,auVar113,auVar172);
            auVar122 = vfmadd231ps_avx512f(auVar122,auVar172,auVar113);
            auVar125 = vmulps_avx512f(auVar128,auVar172);
            auVar126 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar112,auVar125);
            auVar125 = vaddps_avx512f(auVar112,auVar125);
            auVar112 = vfmadd213ps_avx512f(auVar112,auVar172,auVar128);
            auVar126 = vaddps_avx512f(auVar116,auVar126);
            auVar125 = vfmadd231ps_avx512f(auVar125,auVar116,auVar172);
            auVar112 = vfmadd231ps_avx512f(auVar112,auVar172,auVar116);
            auVar116 = vmulps_avx512f(auVar177,auVar172);
            auVar127 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar121,auVar116);
            auVar116 = vaddps_avx512f(auVar121,auVar116);
            auVar177 = vfmadd213ps_avx512f(auVar121,auVar172,auVar177);
            auVar121 = vaddps_avx512f(auVar124,auVar127);
            auVar116 = vfmadd231ps_avx512f(auVar116,auVar124,auVar172);
            auVar177 = vfmadd231ps_avx512f(auVar177,auVar172,auVar124);
            auVar76 = vaddps_avx512f(auVar76,auVar172);
            auVar77 = vaddps_avx512f(auVar77,auVar172);
            auVar108 = vaddps_avx512f(auVar108,auVar172);
            auVar124 = vmulps_avx512f(auVar121,auVar172);
            auVar127 = vmulps_avx512f(auVar116,auVar172);
            auVar128 = vmulps_avx512f(auVar177,auVar172);
            auVar129 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar126,auVar124);
            auVar130 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar125,auVar127);
            auVar131 = vfmadd213ps_avx512f(auVar172,auVar112,auVar128);
            auVar124 = vfmadd231ps_avx512f(auVar124,auVar106,auVar126);
            auVar127 = vfmadd231ps_avx512f(auVar127,auVar106,auVar125);
            auVar106 = vfmadd213ps_avx512f(auVar106,auVar112,auVar128);
            auVar128 = vmulps_avx512f(auVar109,auVar121);
            auVar132 = vmulps_avx512f(auVar109,auVar116);
            auVar109 = vmulps_avx512f(auVar109,auVar177);
            auVar128 = vfmadd231ps_avx512f(auVar128,auVar107,auVar126);
            auVar132 = vfmadd231ps_avx512f(auVar132,auVar107,auVar125);
            auVar107 = vfmadd231ps_avx512f(auVar109,auVar112,auVar107);
            auVar109 = vmulps_avx512f(auVar74,auVar121);
            auVar116 = vmulps_avx512f(auVar74,auVar116);
            auVar74 = vmulps_avx512f(auVar74,auVar177);
            auVar177 = vfmadd231ps_avx512f(auVar109,auVar111,auVar126);
            auVar109 = vfmadd231ps_avx512f(auVar116,auVar111,auVar125);
            auVar74 = vfmadd231ps_avx512f(auVar74,auVar111,auVar112);
            auVar111 = vaddps_avx512f(auVar113,auVar115);
            auVar112 = vfmadd231ps_avx512f(auVar129,auVar75,auVar111);
            auVar113 = vfmadd231ps_avx512f(auVar130,auVar75,auVar114);
            auVar75 = vfmadd231ps_avx512f(auVar131,auVar122,auVar75);
            auVar115 = vfmadd231ps_avx512f(auVar124,auVar78,auVar111);
            auVar116 = vfmadd231ps_avx512f(auVar127,auVar78,auVar114);
            auVar78 = vfmadd231ps_avx512f(auVar106,auVar122,auVar78);
            auVar106 = vfmadd231ps_avx512f(auVar128,auVar105,auVar111);
            auVar121 = vfmadd231ps_avx512f(auVar132,auVar105,auVar114);
            auVar105 = vfmadd231ps_avx512f(auVar107,auVar122,auVar105);
            auVar177 = vfmadd231ps_avx512f(auVar177,auVar110,auVar111);
            auVar107 = vaddps_avx512f(auVar76,auVar177);
            auVar177 = vfmadd231ps_avx512f(auVar109,auVar110,auVar114);
            auVar109 = vaddps_avx512f(auVar77,auVar177);
            auVar74 = vfmadd231ps_avx512f(auVar74,auVar110,auVar122);
            auVar114 = vaddps_avx512f(auVar108,auVar74);
            auVar74 = vmulps_avx512f(auVar121,auVar78);
            auVar74 = vfmsub231ps_avx512f(auVar74,auVar116,auVar105);
            auVar177 = vmulps_avx512f(auVar105,auVar115);
            auVar76 = vfmsub231ps_avx512f(auVar177,auVar78,auVar106);
            auVar177 = vmulps_avx512f(auVar106,auVar116);
            auVar108 = vfmsub231ps_avx512f(auVar177,auVar115,auVar121);
            auVar177 = vmulps_avx512f(auVar75,auVar106);
            auVar77 = vfmsub231ps_avx512f(auVar177,auVar112,auVar105);
            auVar177 = vmulps_avx512f(auVar113,auVar105);
            auVar177 = vfmsub231ps_avx512f(auVar177,auVar121,auVar75);
            auVar105 = vmulps_avx512f(auVar112,auVar121);
            auVar105 = vfmsub231ps_avx512f(auVar105,auVar113,auVar106);
            auVar106 = vmulps_avx512f(auVar116,auVar75);
            auVar106 = vfmsub231ps_avx512f(auVar106,auVar113,auVar78);
            auVar78 = vmulps_avx512f(auVar78,auVar112);
            auVar78 = vfmsub231ps_avx512f(auVar78,auVar75,auVar115);
            auVar110 = vmulps_avx512f(auVar115,auVar113);
            auVar110 = vfmsub231ps_avx512f(auVar110,auVar112,auVar116);
            auVar75 = vmulps_avx512f(auVar75,auVar108);
            auVar75 = vfmadd231ps_avx512f(auVar75,auVar76,auVar113);
            auVar111 = vfmadd231ps_avx512f(auVar75,auVar74,auVar112);
            auVar74 = vdivps_avx512f(auVar74,auVar111);
            auVar177 = vdivps_avx512f(auVar177,auVar111);
            auVar75 = vdivps_avx512f(auVar106,auVar111);
            auVar76 = vdivps_avx512f(auVar76,auVar111);
            auVar77 = vdivps_avx512f(auVar77,auVar111);
            auVar78 = vdivps_avx512f(auVar78,auVar111);
            auVar106 = vdivps_avx512f(auVar108,auVar111);
            auVar108 = vdivps_avx512f(auVar105,auVar111);
            auVar105 = vdivps_avx512f(auVar110,auVar111);
            auVar110 = vmulps_avx512f(auVar114,auVar106);
            auVar111 = vmulps_avx512f(auVar114,auVar108);
            auVar112 = vmulps_avx512f(auVar114,auVar105);
          }
          auVar110 = vfmadd231ps_avx512f(auVar110,auVar109,auVar76);
          auVar111 = vfmadd231ps_avx512f(auVar111,auVar109,auVar77);
          auVar112 = vfmadd231ps_avx512f(auVar112,auVar78,auVar109);
          auVar113 = vfmadd231ps_avx512f(auVar110,auVar107,auVar74);
          auVar109 = vfmadd231ps_avx512f(auVar111,auVar107,auVar177);
          auVar107 = vfmadd231ps_avx512f(auVar112,auVar75,auVar107);
          auVar110 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar111 = vxorps_avx512dq(auVar113,auVar110);
        }
        else {
          auVar164._8_8_ = 0;
          auVar164._0_4_ = (pGVar10->time_range).lower;
          auVar164._4_4_ = (pGVar10->time_range).upper;
          auVar74 = vbroadcastss_avx512f(auVar164);
          auVar75 = vbroadcastss_avx512f(ZEXT416((uint)pGVar10->fnumTimeSegments));
          auVar74 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar74);
          auVar68 = vmovshdup_avx(auVar164);
          auVar177 = ZEXT1664(auVar68);
          auVar68 = vsubps_avx(auVar68,auVar164);
          auVar76 = vbroadcastss_avx512f(auVar68);
          auVar74 = vdivps_avx512f(auVar74,auVar76);
          auVar76 = vmulps_avx512f(auVar75,auVar74);
          auVar74 = vrndscaleps_avx512f(auVar76,1);
          auVar75 = vbroadcastss_avx512f(ZEXT416((uint)(auVar75._0_4_ + -1.0)));
          auVar75 = vminps_avx512f(auVar74,auVar75);
          auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar75 = vmaxps_avx512f(auVar75,auVar74);
          auVar77 = vcvtps2dq_avx512f(auVar75);
          local_200 = vmovdqa64_avx512f(auVar77);
          auVar75 = vsubps_avx512f(auVar76,auVar75);
          uVar8 = 0;
          for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          auVar76 = vpbroadcastd_avx512f();
          uVar29 = vpcmpd_avx512f(auVar77,auVar76,4);
          if (((ushort)uVar29 & uVar62) == 0) {
            plVar1 = (long *)(*(long *)&pGVar10[1].fnumTimeSegments +
                             (long)*(int *)(local_200 + (ulong)uVar8 * 4) * 0x38);
            iVar9 = *(int *)(*(long *)&pGVar10[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_200 + (ulong)uVar8 * 4) * 0x38);
            if (iVar9 == 0x9134) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28);
              auVar76 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28);
              auVar74 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28);
              auVar177 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28);
              in_ZMM13 = ZEXT1664(auVar68);
            }
            else if (iVar9 == 0x9234) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar176._8_8_ = 0;
              auVar176._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
              auVar185._8_8_ = 0;
              auVar185._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                           auVar176);
              auVar76 = ZEXT1664(auVar68);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),_DAT_01fefe80,
                                           auVar185);
              auVar74 = ZEXT1664(auVar68);
              auVar186._8_8_ = 0;
              auVar186._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),_DAT_01fefe80,
                                           auVar186);
              auVar177 = ZEXT1664(auVar68);
              auVar187._8_8_ = 0;
              auVar187._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
              auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),_DAT_01fefe80,
                                           auVar187);
              in_ZMM13 = ZEXT1664(auVar68);
            }
            else if (iVar9 == 0xb001) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar166._8_8_ = 0;
              auVar166._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
              auVar68 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20);
              auVar167._8_8_ = 0;
              auVar167._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
              auVar69 = vpermt2ps_avx512vl(auVar167,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar12 + lVar66)));
              auVar191._8_8_ = 0;
              auVar191._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
              fVar2 = *(float *)(lVar12 + 0x24 + lVar66);
              fVar3 = *(float *)(lVar12 + 0x28 + lVar66);
              fVar4 = *(float *)(lVar12 + 0x2c + lVar66);
              auVar70 = vpermt2ps_avx512vl(auVar191,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
              fVar5 = *(float *)(lVar12 + 0x30 + lVar66);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar2));
              auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
              auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar73._0_4_));
              fVar165 = auVar71._0_4_;
              fVar165 = fVar165 * 1.5 + fVar165 * fVar165 * fVar165 * auVar73._0_4_ * -0.5;
              auVar73 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar2 * fVar165)),0x30);
              in_ZMM13 = ZEXT1664(auVar73);
              auVar73 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar3 * fVar165)),0x30);
              auVar76 = ZEXT1664(auVar73);
              auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar5 * fVar165)),0x30);
              auVar177 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),0x20);
              auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar4 * fVar165)),0x30);
              auVar74 = ZEXT1664(auVar68);
            }
            else if (iVar9 == 0x9244) {
              lVar12 = *plVar1;
              lVar66 = plVar1[2] * uVar61;
              auVar76 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
              auVar74 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
              auVar177 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
              in_ZMM13 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
            }
            auVar77 = vbroadcastss_avx512f(ZEXT416(1));
            auVar78 = vbroadcastss_avx512f(ZEXT416(2));
            iVar9 = (int)plVar1[0xb];
            if (iVar9 == 0x9134) {
              lVar12 = plVar1[7];
              lVar66 = uVar61 * plVar1[9];
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
              auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28);
              in_ZMM15 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28);
              in_ZMM16 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28);
              in_ZMM27 = ZEXT1664(auVar68);
              auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                      ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
              auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28);
              in_ZMM26 = ZEXT1664(auVar68);
            }
            else {
              auVar80._16_48_ = auVar78._16_48_;
              if (iVar9 == 0x9234) {
                lVar12 = plVar1[7];
                lVar66 = uVar61 * plVar1[9];
                auVar178._8_8_ = 0;
                auVar178._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
                auVar192._8_8_ = 0;
                auVar192._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                             auVar178);
                in_ZMM15 = ZEXT1664(auVar68);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),_DAT_01fefe80
                                             ,auVar192);
                in_ZMM16 = ZEXT1664(auVar68);
                auVar179._8_8_ = 0;
                auVar179._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),
                                             _DAT_01fefe80,auVar179);
                in_ZMM27 = ZEXT1664(auVar68);
                auVar180._8_8_ = 0;
                auVar180._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
                auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),
                                             _DAT_01fefe80,auVar180);
                in_ZMM26 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0xb001) {
                lVar12 = plVar1[7];
                lVar66 = uVar61 * plVar1[9];
                auVar181._8_8_ = 0;
                auVar181._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                auVar68 = vinsertps_avx(auVar181,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20);
                auVar188._8_8_ = 0;
                auVar188._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
                auVar69 = vpermt2ps_avx512vl(auVar188,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + lVar66)));
                auVar197._8_8_ = 0;
                auVar197._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                fVar2 = *(float *)(lVar12 + 0x24 + lVar66);
                fVar3 = *(float *)(lVar12 + 0x28 + lVar66);
                fVar4 = *(float *)(lVar12 + 0x2c + lVar66);
                auVar70 = vpermt2ps_avx512vl(auVar197,_DAT_01fefe90,
                                             ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
                fVar5 = *(float *)(lVar12 + 0x30 + lVar66);
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                          ZEXT416((uint)fVar2));
                auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
                auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
                auVar80._0_16_ = ZEXT816(0) << 0x40;
                auVar79._4_60_ = auVar80._4_60_;
                auVar79._0_4_ = auVar73._0_4_;
                auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar79._0_16_);
                auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
                fVar165 = auVar71._0_4_;
                auVar73 = vaddss_avx512f(auVar72,ZEXT416((uint)(fVar165 * fVar165 *
                                                               fVar165 * auVar73._0_4_ * -0.5)));
                fVar165 = auVar73._0_4_;
                auVar73 = vinsertps_avx512f(auVar70,ZEXT416((uint)(fVar2 * fVar165)),0x30);
                in_ZMM26 = ZEXT1664(auVar73);
                auVar73 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar3 * fVar165)),0x30);
                in_ZMM15 = ZEXT1664(auVar73);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416((uint)(fVar5 * fVar165)),0x30);
                in_ZMM27 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                        ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
                auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),0x20);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416((uint)(fVar4 * fVar165)),0x30);
                in_ZMM16 = ZEXT1664(auVar68);
              }
              else if (iVar9 == 0x9244) {
                lVar12 = plVar1[7];
                lVar66 = uVar61 * plVar1[9];
                in_ZMM15 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
                in_ZMM16 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
                in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
                in_ZMM26 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
              }
            }
            auVar81 = vbroadcastss_avx512f(auVar76._0_16_);
            auVar82 = vpermps_avx512f(auVar77,auVar76);
            auVar83 = vpermps_avx512f(auVar78,auVar76);
            auVar84 = vbroadcastss_avx512f(auVar74._0_16_);
            auVar85 = vpermps_avx512f(auVar77,auVar74);
            auVar86 = vpermps_avx512f(auVar78,auVar74);
            auVar87 = vbroadcastss_avx512f(auVar177._0_16_);
            auVar88 = vpermps_avx512f(auVar77,auVar177);
            auVar89 = vpermps_avx512f(auVar78,auVar177);
            auVar90 = vbroadcastss_avx512f(in_ZMM13._0_16_);
            auVar91 = vpermps_avx512f(auVar77,in_ZMM13);
            auVar92 = vpermps_avx512f(auVar78,in_ZMM13);
            auVar93 = vbroadcastss_avx512f(in_ZMM15._0_16_);
            auVar94 = vpermps_avx512f(auVar77,in_ZMM15);
            auVar95 = vpermps_avx512f(auVar78,in_ZMM15);
            auVar96 = vbroadcastss_avx512f(in_ZMM16._0_16_);
            auVar97 = vpermps_avx512f(auVar77,in_ZMM16);
            auVar98 = vpermps_avx512f(auVar78,in_ZMM16);
            auVar99 = vbroadcastss_avx512f(in_ZMM27._0_16_);
            auVar100 = vpermps_avx512f(auVar77,in_ZMM27);
            auVar101 = vpermps_avx512f(auVar78,in_ZMM27);
            auVar102 = vbroadcastss_avx512f(in_ZMM26._0_16_);
            auVar103 = vpermps_avx512f(auVar77,in_ZMM26);
            auVar104 = vpermps_avx512f(auVar78,in_ZMM26);
          }
          else {
            uVar64 = uVar60;
            local_4c0 = in_ZMM26;
            local_480 = in_ZMM26;
            local_440 = in_ZMM26;
            local_3c0 = in_ZMM26;
            do {
              uVar65 = 0;
              uVar63 = (uint)uVar64;
              for (uVar8 = uVar63; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
                uVar65 = uVar65 + 1;
              }
              plVar1 = (long *)(*(long *)&pGVar10[1].fnumTimeSegments +
                               (long)*(int *)(local_200 + (ulong)uVar65 * 4) * 0x38);
              iVar9 = *(int *)(*(long *)&pGVar10[1].fnumTimeSegments + 0x20 +
                              (long)*(int *)(local_200 + (ulong)uVar65 * 4) * 0x38);
              if (iVar9 == 0x9134) {
                lVar12 = *plVar1;
                lVar66 = plVar1[2] * uVar61;
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
                auVar73 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28)
                ;
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
                auVar69 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28)
                ;
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
                auVar70 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28)
                ;
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28)
                ;
LAB_008fbaba:
                local_440 = ZEXT1664(auVar73);
                local_480 = ZEXT1664(auVar69);
                local_4c0 = ZEXT1664(auVar70);
                local_3c0 = ZEXT1664(auVar68);
              }
              else {
                auVar118._16_48_ = in_ZMM30._16_48_;
                if (iVar9 == 0x9234) {
                  lVar12 = *plVar1;
                  lVar66 = plVar1[2] * uVar61;
                  auVar217._8_8_ = 0;
                  auVar217._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                               auVar217);
                  local_440 = ZEXT1664(auVar68);
                  auVar214._8_8_ = 0;
                  auVar214._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                               _DAT_01fefe80,auVar214);
                  local_480 = ZEXT1664(auVar68);
                  auVar207._8_8_ = 0;
                  auVar207._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),
                                               _DAT_01fefe80,auVar207);
                  local_4c0 = ZEXT1664(auVar68);
                  auVar208._8_8_ = 0;
                  auVar208._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),
                                               _DAT_01fefe80,auVar208);
                  local_3c0 = ZEXT1664(auVar68);
                }
                else if (iVar9 == 0xb001) {
                  lVar12 = *plVar1;
                  lVar66 = plVar1[2] * uVar61;
                  auVar210._8_8_ = 0;
                  auVar210._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                  auVar68 = vinsertps_avx512f(auVar210,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20)
                  ;
                  auVar215._8_8_ = 0;
                  auVar215._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
                  auVar69 = vpermt2ps_avx512vl(auVar215,_DAT_01fefe90,
                                               ZEXT416(*(uint *)(lVar12 + lVar66)));
                  auVar218._8_8_ = 0;
                  auVar218._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                  auVar73 = vpermt2ps_avx512vl(auVar218,_DAT_01fefe90,
                                               ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
                  uVar65 = *(uint *)(lVar12 + 0x24 + lVar66);
                  uVar8 = *(uint *)(lVar12 + 0x28 + lVar66);
                  uVar6 = *(uint *)(lVar12 + 0x2c + lVar66);
                  uVar7 = *(uint *)(lVar12 + 0x30 + lVar66);
                  auVar70 = vmulss_avx512f(ZEXT416(uVar8),ZEXT416(uVar8));
                  auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar65),ZEXT416(uVar65));
                  auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar6),ZEXT416(uVar6));
                  auVar71 = ZEXT416(uVar7);
                  auVar70 = vfmadd231ss_avx512f(auVar70,auVar71,auVar71);
                  auVar118._0_16_ = vxorps_avx512vl(auVar71,auVar71);
                  auVar117._4_60_ = auVar118._4_60_;
                  auVar117._0_4_ = auVar70._0_4_;
                  auVar71 = vrsqrt14ss_avx512f(auVar118._0_16_,auVar117._0_16_);
                  auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
                  auVar70 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
                  auVar70 = vmulss_avx512f(auVar71,auVar70);
                  auVar71 = vmulss_avx512f(auVar71,auVar71);
                  auVar70 = vmulss_avx512f(auVar71,auVar70);
                  auVar70 = vaddss_avx512f(auVar72,auVar70);
                  auVar71 = vmulss_avx512f(ZEXT416(uVar65),auVar70);
                  auVar73 = vinsertps_avx512f(auVar73,auVar71,0x30);
                  local_3c0 = ZEXT1664(auVar73);
                  auVar73 = vmulss_avx512f(auVar70,ZEXT416(uVar8));
                  auVar73 = vinsertps_avx512f(auVar69,auVar73,0x30);
                  local_440 = ZEXT1664(auVar73);
                  auVar73 = vmulss_avx512f(auVar70,ZEXT416(uVar6));
                  auVar69 = vmulss_avx512f(auVar70,ZEXT416(uVar7));
                  auVar68 = vinsertps_avx512f(auVar68,auVar69,0x30);
                  local_4c0 = ZEXT1664(auVar68);
                  auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                              ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
                  auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),
                                              0x20);
                  auVar68 = vinsertps_avx512f(auVar68,auVar73,0x30);
                  local_480 = ZEXT1664(auVar68);
                }
                else if (iVar9 == 0x9244) {
                  lVar12 = *plVar1;
                  lVar66 = plVar1[2] * uVar61;
                  auVar73 = *(undefined1 (*) [16])(lVar12 + lVar66);
                  auVar69 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar66);
                  auVar70 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar66);
                  auVar68 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar66);
                  goto LAB_008fbaba;
                }
              }
              auVar78 = vpbroadcastd_avx512f();
              uVar29 = vpcmpeqd_avx512f(auVar78,auVar77);
              iVar9 = (int)plVar1[0xb];
              if (iVar9 == 0x9134) {
                lVar12 = plVar1[7];
                lVar66 = plVar1[9] * uVar61;
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x10 + lVar66)),0x1c);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar66)),0x28)
                ;
                in_ZMM29 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x14 + lVar66)),0x1c);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),0x28)
                ;
                in_ZMM27 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),0x1c);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar66)),0x28)
                ;
                local_400 = ZEXT1664(auVar68);
                auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                            ZEXT416(*(uint *)(lVar12 + 0x1c + lVar66)),0x1c);
                auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar66)),0x28)
                ;
                in_ZMM30 = ZEXT1664(auVar68);
              }
              else {
                auVar120._16_48_ = auVar78._16_48_;
                if (iVar9 == 0x9234) {
                  lVar12 = plVar1[7];
                  lVar66 = plVar1[9] * uVar61;
                  auVar219._8_8_ = 0;
                  auVar219._0_8_ = *(ulong *)(lVar12 + 4 + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar66)),_DAT_01fefe80,
                                               auVar219);
                  in_ZMM29 = ZEXT1664(auVar68);
                  auVar211._8_8_ = 0;
                  auVar211._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                               _DAT_01fefe80,auVar211);
                  in_ZMM27 = ZEXT1664(auVar68);
                  auVar212._8_8_ = 0;
                  auVar212._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)),
                                               _DAT_01fefe80,auVar212);
                  local_400 = ZEXT1664(auVar68);
                  auVar213._8_8_ = 0;
                  auVar213._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar66);
                  auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar66)),
                                               _DAT_01fefe80,auVar213);
                  in_ZMM30 = ZEXT1664(auVar68);
                }
                else if (iVar9 == 0xb001) {
                  lVar12 = plVar1[7];
                  lVar66 = plVar1[9] * uVar61;
                  auVar209._8_8_ = 0;
                  auVar209._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar66);
                  auVar68 = vinsertps_avx512f(auVar209,ZEXT416(*(uint *)(lVar12 + 8 + lVar66)),0x20)
                  ;
                  auVar216._8_8_ = 0;
                  auVar216._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar66);
                  auVar69 = vpermt2ps_avx512vl(auVar216,_DAT_01fefe90,
                                               ZEXT416(*(uint *)(lVar12 + lVar66)));
                  auVar220._8_8_ = 0;
                  auVar220._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar66);
                  auVar73 = vpermt2ps_avx512vl(auVar220,_DAT_01fefe90,
                                               ZEXT416(*(uint *)(lVar12 + 0x18 + lVar66)));
                  uVar65 = *(uint *)(lVar12 + 0x24 + lVar66);
                  uVar8 = *(uint *)(lVar12 + 0x28 + lVar66);
                  uVar6 = *(uint *)(lVar12 + 0x2c + lVar66);
                  uVar7 = *(uint *)(lVar12 + 0x30 + lVar66);
                  auVar70 = vmulss_avx512f(ZEXT416(uVar8),ZEXT416(uVar8));
                  auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar65),ZEXT416(uVar65));
                  auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar6),ZEXT416(uVar6));
                  auVar71 = ZEXT416(uVar7);
                  auVar70 = vfmadd231ss_avx512f(auVar70,auVar71,auVar71);
                  auVar120._0_16_ = vxorps_avx512vl(auVar71,auVar71);
                  auVar119._4_60_ = auVar120._4_60_;
                  auVar119._0_4_ = auVar70._0_4_;
                  auVar71 = vrsqrt14ss_avx512f(auVar120._0_16_,auVar119._0_16_);
                  auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
                  auVar70 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
                  auVar70 = vmulss_avx512f(auVar71,auVar70);
                  auVar71 = vmulss_avx512f(auVar71,auVar71);
                  auVar70 = vmulss_avx512f(auVar71,auVar70);
                  auVar70 = vaddss_avx512f(auVar72,auVar70);
                  auVar71 = vmulss_avx512f(ZEXT416(uVar65),auVar70);
                  auVar73 = vinsertps_avx512f(auVar73,auVar71,0x30);
                  in_ZMM30 = ZEXT1664(auVar73);
                  auVar73 = vmulss_avx512f(auVar70,ZEXT416(uVar8));
                  auVar73 = vinsertps_avx512f(auVar69,auVar73,0x30);
                  in_ZMM29 = ZEXT1664(auVar73);
                  auVar73 = vmulss_avx512f(auVar70,ZEXT416(uVar6));
                  auVar69 = vmulss_avx512f(auVar70,ZEXT416(uVar7));
                  auVar68 = vinsertps_avx512f(auVar68,auVar69,0x30);
                  local_400 = ZEXT1664(auVar68);
                  auVar68 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 0xc + lVar66)),
                                              ZEXT416(*(uint *)(lVar12 + 4 + lVar66)),0x10);
                  auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar66)),
                                              0x20);
                  auVar68 = vinsertps_avx512f(auVar68,auVar73,0x30);
                  in_ZMM27 = ZEXT1664(auVar68);
                }
                else {
                  local_400 = in_ZMM26;
                  if (iVar9 == 0x9244) {
                    lVar12 = plVar1[7];
                    lVar66 = plVar1[9] * uVar61;
                    in_ZMM29 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar66));
                    in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar66));
                    auVar68 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar66));
                    local_400 = vmovdqa64_avx512f(ZEXT1664(auVar68));
                    in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar66));
                  }
                }
              }
              uVar65 = (uint)uVar29 & uVar63;
              uVar64 = (ulong)(~uVar65 & uVar63);
              auVar78 = vbroadcastss_avx512f(local_440._0_16_);
              bVar13 = (byte)uVar65;
              auVar81._0_4_ =
                   (uint)(bVar13 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM12._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar81._4_4_ = (uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * in_ZMM12._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar81._8_4_ = (uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * in_ZMM12._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar81._12_4_ = (uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * in_ZMM12._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar81._16_4_ = (uint)bVar14 * auVar78._16_4_ | (uint)!bVar14 * in_ZMM12._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar81._20_4_ = (uint)bVar14 * auVar78._20_4_ | (uint)!bVar14 * in_ZMM12._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar81._24_4_ = (uint)bVar14 * auVar78._24_4_ | (uint)!bVar14 * in_ZMM12._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar81._28_4_ = (uint)bVar14 * auVar78._28_4_ | (uint)!bVar14 * in_ZMM12._28_4_;
              bVar21 = (byte)(uVar65 >> 8);
              auVar81._32_4_ =
                   (uint)(bVar21 & 1) * auVar78._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM12._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar81._36_4_ = (uint)bVar14 * auVar78._36_4_ | (uint)!bVar14 * in_ZMM12._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar81._40_4_ = (uint)bVar14 * auVar78._40_4_ | (uint)!bVar14 * in_ZMM12._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar81._44_4_ = (uint)bVar14 * auVar78._44_4_ | (uint)!bVar14 * in_ZMM12._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar81._48_4_ = (uint)bVar14 * auVar78._48_4_ | (uint)!bVar14 * in_ZMM12._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar81._52_4_ = (uint)bVar14 * auVar78._52_4_ | (uint)!bVar14 * in_ZMM12._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar81._56_4_ = (uint)bVar14 * auVar78._56_4_ | (uint)!bVar14 * in_ZMM12._56_4_;
              auVar81._60_4_ =
                   (uVar65 >> 0xf) * auVar78._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM12._60_4_;
              auVar78 = vbroadcastss_avx512f(ZEXT416(1));
              auVar106 = vpermps_avx512f(auVar78,local_440);
              auVar82._0_4_ =
                   (uint)(bVar13 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM11._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar82._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * in_ZMM11._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar82._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * in_ZMM11._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar82._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * in_ZMM11._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar82._16_4_ = (uint)bVar14 * auVar106._16_4_ | (uint)!bVar14 * in_ZMM11._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar82._20_4_ = (uint)bVar14 * auVar106._20_4_ | (uint)!bVar14 * in_ZMM11._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar82._24_4_ = (uint)bVar14 * auVar106._24_4_ | (uint)!bVar14 * in_ZMM11._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar82._28_4_ = (uint)bVar14 * auVar106._28_4_ | (uint)!bVar14 * in_ZMM11._28_4_;
              auVar82._32_4_ =
                   (uint)(bVar21 & 1) * auVar106._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM11._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar82._36_4_ = (uint)bVar14 * auVar106._36_4_ | (uint)!bVar14 * in_ZMM11._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar82._40_4_ = (uint)bVar14 * auVar106._40_4_ | (uint)!bVar14 * in_ZMM11._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar82._44_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * in_ZMM11._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar82._48_4_ = (uint)bVar14 * auVar106._48_4_ | (uint)!bVar14 * in_ZMM11._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar82._52_4_ = (uint)bVar14 * auVar106._52_4_ | (uint)!bVar14 * in_ZMM11._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar82._56_4_ = (uint)bVar14 * auVar106._56_4_ | (uint)!bVar14 * in_ZMM11._56_4_;
              auVar82._60_4_ =
                   (uVar65 >> 0xf) * auVar106._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM11._60_4_;
              auVar106 = vbroadcastss_avx512f(ZEXT416(2));
              auVar108 = vpermps_avx512f(auVar106,local_440);
              auVar83._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM10._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar83._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM10._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar83._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM10._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar83._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM10._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar83._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM10._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar83._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM10._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar83._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM10._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar83._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM10._28_4_;
              auVar83._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM10._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar83._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM10._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar83._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM10._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar83._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM10._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar83._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM10._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar83._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM10._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar83._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM10._56_4_;
              auVar83._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM10._60_4_;
              auVar108 = vbroadcastss_avx512f(local_480._0_16_);
              auVar84._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM9._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar84._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM9._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar84._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM9._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar84._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM9._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar84._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM9._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar84._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM9._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar84._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM9._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar84._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM9._28_4_;
              auVar84._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM9._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar84._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM9._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar84._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM9._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar84._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM9._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar84._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM9._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar84._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM9._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar84._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM9._56_4_;
              auVar84._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM9._60_4_;
              auVar108 = vpermps_avx512f(auVar78,local_480);
              auVar85._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM8._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar85._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM8._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar85._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM8._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar85._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM8._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar85._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM8._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar85._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM8._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar85._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM8._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar85._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM8._28_4_;
              auVar85._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM8._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar85._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM8._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar85._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM8._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar85._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM8._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar85._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM8._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar85._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM8._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar85._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM8._56_4_;
              auVar85._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM8._60_4_;
              auVar108 = vpermps_avx512f(auVar106,local_480);
              auVar86._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM7._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar86._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM7._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar86._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM7._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar86._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM7._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar86._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM7._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar86._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM7._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar86._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM7._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar86._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM7._28_4_;
              auVar86._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM7._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar86._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM7._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar86._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM7._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar86._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM7._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar86._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM7._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar86._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM7._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar86._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM7._56_4_;
              auVar86._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM7._60_4_;
              auVar108 = vbroadcastss_avx512f(local_4c0._0_16_);
              auVar87._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM6._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar87._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM6._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar87._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM6._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar87._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM6._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar87._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM6._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar87._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM6._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar87._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM6._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar87._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM6._28_4_;
              auVar87._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM6._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar87._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM6._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar87._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM6._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar87._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM6._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar87._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM6._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar87._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM6._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar87._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM6._56_4_;
              auVar87._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM6._60_4_;
              auVar108 = vpermps_avx512f(auVar78,local_4c0);
              auVar88._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM5._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar88._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM5._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar88._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM5._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar88._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM5._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar88._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM5._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar88._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM5._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar88._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM5._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar88._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM5._28_4_;
              auVar88._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM5._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar88._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM5._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar88._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM5._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar88._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM5._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar88._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM5._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar88._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM5._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar88._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM5._56_4_;
              auVar88._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM5._60_4_;
              auVar108 = vpermps_avx512f(auVar106,local_4c0);
              auVar89._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM4._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar89._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * in_ZMM4._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar89._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * in_ZMM4._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar89._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * in_ZMM4._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar89._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * in_ZMM4._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar89._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * in_ZMM4._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar89._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * in_ZMM4._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar89._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * in_ZMM4._28_4_;
              auVar89._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM4._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar89._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * in_ZMM4._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar89._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * in_ZMM4._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar89._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * in_ZMM4._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar89._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * in_ZMM4._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar89._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * in_ZMM4._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar89._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * in_ZMM4._56_4_;
              auVar89._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM4._60_4_;
              auVar108 = vbroadcastss_avx512f(local_3c0._0_16_);
              auVar90._0_4_ =
                   (uint)(bVar13 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar177._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar90._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar177._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar90._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar177._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar90._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar177._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar90._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * auVar177._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar90._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * auVar177._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar90._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * auVar177._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar90._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * auVar177._28_4_;
              auVar90._32_4_ =
                   (uint)(bVar21 & 1) * auVar108._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * auVar177._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar90._36_4_ = (uint)bVar14 * auVar108._36_4_ | (uint)!bVar14 * auVar177._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar90._40_4_ = (uint)bVar14 * auVar108._40_4_ | (uint)!bVar14 * auVar177._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar90._44_4_ = (uint)bVar14 * auVar108._44_4_ | (uint)!bVar14 * auVar177._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar90._48_4_ = (uint)bVar14 * auVar108._48_4_ | (uint)!bVar14 * auVar177._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar90._52_4_ = (uint)bVar14 * auVar108._52_4_ | (uint)!bVar14 * auVar177._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar90._56_4_ = (uint)bVar14 * auVar108._56_4_ | (uint)!bVar14 * auVar177._56_4_;
              auVar90._60_4_ =
                   (uVar65 >> 0xf) * auVar108._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * auVar177._60_4_;
              auVar177 = vpermps_avx512f(auVar78,local_3c0);
              auVar91._0_4_ =
                   (uint)(bVar13 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar74._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar91._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar74._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar91._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar74._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar91._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar74._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar91._16_4_ = (uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar74._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar91._20_4_ = (uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar74._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar91._24_4_ = (uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar74._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar91._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar74._28_4_;
              auVar91._32_4_ =
                   (uint)(bVar21 & 1) * auVar177._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar74._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar91._36_4_ = (uint)bVar14 * auVar177._36_4_ | (uint)!bVar14 * auVar74._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar91._40_4_ = (uint)bVar14 * auVar177._40_4_ | (uint)!bVar14 * auVar74._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar91._44_4_ = (uint)bVar14 * auVar177._44_4_ | (uint)!bVar14 * auVar74._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar91._48_4_ = (uint)bVar14 * auVar177._48_4_ | (uint)!bVar14 * auVar74._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar91._52_4_ = (uint)bVar14 * auVar177._52_4_ | (uint)!bVar14 * auVar74._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar91._56_4_ = (uint)bVar14 * auVar177._56_4_ | (uint)!bVar14 * auVar74._56_4_;
              auVar91._60_4_ =
                   (uVar65 >> 0xf) * auVar177._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * auVar74._60_4_;
              auVar74 = vpermps_avx512f(auVar106,local_3c0);
              auVar92._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar76._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar92._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * auVar76._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar92._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * auVar76._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar92._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * auVar76._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar92._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * auVar76._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar92._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * auVar76._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar92._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * auVar76._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar92._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * auVar76._28_4_;
              auVar92._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar76._32_4_;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar92._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * auVar76._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar92._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * auVar76._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar92._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * auVar76._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar92._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * auVar76._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar92._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * auVar76._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar92._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * auVar76._56_4_;
              auVar92._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ | (uint)!SUB41(uVar65 >> 0xf,0) * auVar76._60_4_
              ;
              auVar74 = vbroadcastss_avx512f(in_ZMM29._0_16_);
              auVar93._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM24._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar93._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM24._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar93._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM24._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar93._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM24._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar93._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM24._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar93._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM24._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar93._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM24._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar93._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM24._28_4_;
              auVar93._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM24._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar93._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM24._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar93._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM24._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar93._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM24._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar93._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM24._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar93._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM24._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar93._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM24._56_4_;
              auVar93._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM24._60_4_;
              auVar74 = vpermps_avx512f(auVar78,in_ZMM29);
              auVar94._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM23._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar94._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM23._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar94._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM23._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar94._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM23._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar94._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM23._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar94._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM23._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar94._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM23._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar94._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM23._28_4_;
              auVar94._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM23._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar94._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM23._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar94._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM23._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar94._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM23._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar94._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM23._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar94._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM23._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar94._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM23._56_4_;
              auVar94._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM23._60_4_;
              auVar74 = vpermps_avx512f(auVar106,in_ZMM29);
              auVar95._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM22._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar95._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM22._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar95._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM22._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar95._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM22._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar95._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM22._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar95._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM22._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar95._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM22._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar95._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM22._28_4_;
              auVar95._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM22._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar95._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM22._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar95._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM22._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar95._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM22._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar95._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM22._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar95._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM22._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar95._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM22._56_4_;
              auVar95._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM22._60_4_;
              auVar74 = vbroadcastss_avx512f(in_ZMM27._0_16_);
              auVar96._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM21._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar96._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM21._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar96._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM21._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar96._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM21._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar96._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM21._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar96._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM21._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar96._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM21._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar96._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM21._28_4_;
              auVar96._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM21._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar96._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM21._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar96._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM21._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar96._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM21._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar96._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM21._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar96._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM21._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar96._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM21._56_4_;
              auVar96._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM21._60_4_;
              auVar74 = vpermps_avx512f(auVar78,in_ZMM27);
              auVar97._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM20._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar97._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM20._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar97._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM20._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar97._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM20._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar97._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM20._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar97._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM20._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar97._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM20._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar97._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM20._28_4_;
              auVar97._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM20._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar97._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM20._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar97._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM20._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar97._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM20._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar97._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM20._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar97._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM20._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar97._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM20._56_4_;
              auVar97._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM20._60_4_;
              auVar74 = vpermps_avx512f(auVar106,in_ZMM27);
              auVar98._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM19._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar98._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM19._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar98._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM19._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar98._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM19._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar98._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM19._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar98._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM19._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar98._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM19._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar98._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM19._28_4_;
              auVar98._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM19._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar98._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM19._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar98._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM19._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar98._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM19._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar98._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM19._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar98._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM19._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar98._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM19._56_4_;
              auVar98._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM19._60_4_;
              auVar74 = vbroadcastss_avx512f(local_400._0_16_);
              auVar99._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM18._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar99._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM18._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar99._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM18._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar99._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM18._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar99._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM18._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar99._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM18._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar99._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM18._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar99._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM18._28_4_;
              auVar99._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM18._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar99._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM18._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar99._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM18._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar99._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM18._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar99._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM18._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar99._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM18._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar99._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM18._56_4_;
              auVar99._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM18._60_4_;
              auVar74 = vpermps_avx512f(auVar78,local_400);
              auVar100._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM17._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar100._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM17._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar100._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM17._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar100._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM17._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar100._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM17._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar100._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM17._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar100._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM17._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar100._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM17._28_4_;
              auVar100._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM17._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar100._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM17._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar100._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM17._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar100._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM17._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar100._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM17._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar100._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM17._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar100._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM17._56_4_;
              auVar100._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM17._60_4_;
              auVar74 = vpermps_avx512f(auVar106,local_400);
              auVar101._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM16._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar101._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM16._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar101._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM16._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar101._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM16._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar101._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM16._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar101._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM16._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar101._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM16._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar101._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM16._28_4_;
              auVar101._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM16._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar101._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM16._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar101._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM16._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar101._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM16._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar101._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM16._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar101._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM16._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar101._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM16._56_4_;
              auVar101._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM16._60_4_;
              auVar74 = vbroadcastss_avx512f(in_ZMM30._0_16_);
              auVar102._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM15._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar102._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM15._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar102._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM15._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar102._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM15._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar102._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM15._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar102._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM15._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar102._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM15._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar102._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM15._28_4_;
              auVar102._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM15._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar102._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM15._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar102._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM15._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar102._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM15._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar102._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM15._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar102._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM15._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar102._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM15._56_4_;
              auVar102._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM15._60_4_;
              auVar74 = vpermps_avx512f(auVar78,in_ZMM30);
              auVar103._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM14._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar103._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM14._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar103._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM14._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar103._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM14._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar103._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM14._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar103._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM14._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar103._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM14._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar103._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM14._28_4_;
              auVar103._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM14._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar103._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM14._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar103._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM14._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar103._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM14._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar103._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM14._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar103._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM14._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar103._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM14._56_4_;
              auVar103._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM14._60_4_;
              auVar74 = vpermps_avx512f(auVar106,in_ZMM30);
              auVar104._0_4_ =
                   (uint)(bVar13 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM13._0_4_;
              bVar14 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar104._4_4_ = (uint)bVar14 * auVar74._4_4_ | (uint)!bVar14 * in_ZMM13._4_4_;
              bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar104._8_4_ = (uint)bVar14 * auVar74._8_4_ | (uint)!bVar14 * in_ZMM13._8_4_;
              bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar104._12_4_ = (uint)bVar14 * auVar74._12_4_ | (uint)!bVar14 * in_ZMM13._12_4_;
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar104._16_4_ = (uint)bVar14 * auVar74._16_4_ | (uint)!bVar14 * in_ZMM13._16_4_;
              bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar104._20_4_ = (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * in_ZMM13._20_4_;
              bVar14 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar104._24_4_ = (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * in_ZMM13._24_4_;
              bVar14 = (bool)((byte)(uVar65 >> 7) & 1);
              auVar104._28_4_ = (uint)bVar14 * auVar74._28_4_ | (uint)!bVar14 * in_ZMM13._28_4_;
              auVar104._32_4_ =
                   (uint)(bVar21 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM13._32_4_
              ;
              bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
              auVar104._36_4_ = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * in_ZMM13._36_4_;
              bVar14 = (bool)((byte)(uVar65 >> 10) & 1);
              auVar104._40_4_ = (uint)bVar14 * auVar74._40_4_ | (uint)!bVar14 * in_ZMM13._40_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xb) & 1);
              auVar104._44_4_ = (uint)bVar14 * auVar74._44_4_ | (uint)!bVar14 * in_ZMM13._44_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xc) & 1);
              auVar104._48_4_ = (uint)bVar14 * auVar74._48_4_ | (uint)!bVar14 * in_ZMM13._48_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xd) & 1);
              auVar104._52_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * in_ZMM13._52_4_;
              bVar14 = (bool)((byte)(uVar65 >> 0xe) & 1);
              auVar104._56_4_ = (uint)bVar14 * auVar74._56_4_ | (uint)!bVar14 * in_ZMM13._56_4_;
              auVar104._60_4_ =
                   (uVar65 >> 0xf) * auVar74._60_4_ |
                   (uint)!SUB41(uVar65 >> 0xf,0) * in_ZMM13._60_4_;
              auVar76 = auVar92;
              auVar74 = auVar91;
              auVar177 = auVar90;
              in_ZMM4 = auVar89;
              in_ZMM5 = auVar88;
              in_ZMM6 = auVar87;
              in_ZMM7 = auVar86;
              in_ZMM8 = auVar85;
              in_ZMM9 = auVar84;
              in_ZMM10 = auVar83;
              in_ZMM11 = auVar82;
              in_ZMM12 = auVar81;
              in_ZMM13 = auVar104;
              in_ZMM14 = auVar103;
              in_ZMM15 = auVar102;
              in_ZMM16 = auVar101;
              in_ZMM17 = auVar100;
              in_ZMM18 = auVar99;
              in_ZMM19 = auVar98;
              in_ZMM20 = auVar97;
              in_ZMM21 = auVar96;
              in_ZMM22 = auVar95;
              in_ZMM23 = auVar94;
              in_ZMM24 = auVar93;
              in_ZMM26 = local_400;
            } while ((short)(~uVar65 & uVar63) != 0);
          }
          auVar74 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar74 = vsubps_avx512f(auVar74,auVar75);
          auVar177 = vmulps_avx512f(auVar75,auVar93);
          auVar76 = vmulps_avx512f(auVar75,auVar94);
          auVar77 = vmulps_avx512f(auVar75,auVar95);
          auVar105 = vfmadd231ps_avx512f(auVar177,auVar74,auVar81);
          auVar177 = vfmadd231ps_avx512f(auVar76,auVar74,auVar82);
          auVar76 = vfmadd231ps_avx512f(auVar77,auVar74,auVar83);
          auVar77 = vmulps_avx512f(auVar75,auVar96);
          auVar78 = vmulps_avx512f(auVar75,auVar97);
          auVar106 = vmulps_avx512f(auVar75,auVar98);
          auVar77 = vfmadd231ps_avx512f(auVar77,auVar74,auVar84);
          auVar107 = vfmadd231ps_avx512f(auVar78,auVar74,auVar85);
          auVar78 = vfmadd231ps_avx512f(auVar106,auVar74,auVar86);
          auVar106 = vmulps_avx512f(auVar75,auVar99);
          auVar108 = vmulps_avx512f(auVar75,auVar100);
          auVar109 = vmulps_avx512f(auVar75,auVar101);
          auVar106 = vfmadd231ps_avx512f(auVar106,auVar74,auVar87);
          auVar108 = vfmadd231ps_avx512f(auVar108,auVar74,auVar88);
          auVar109 = vfmadd231ps_avx512f(auVar109,auVar74,auVar89);
          auVar110 = vmulps_avx512f(auVar75,auVar102);
          auVar111 = vmulps_avx512f(auVar75,auVar103);
          auVar75 = vmulps_avx512f(auVar75,auVar104);
          auVar110 = vfmadd231ps_avx512f(auVar110,auVar74,auVar90);
          auVar111 = vfmadd231ps_avx512f(auVar111,auVar74,auVar91);
          auVar112 = vfmadd231ps_avx512f(auVar75,auVar74,auVar92);
          auVar74 = vmulps_avx512f(auVar108,auVar78);
          auVar74 = vfmsub231ps_avx512f(auVar74,auVar107,auVar109);
          auVar75 = vmulps_avx512f(auVar109,auVar77);
          auVar113 = vfmsub231ps_avx512f(auVar75,auVar78,auVar106);
          auVar75 = vmulps_avx512f(auVar106,auVar107);
          auVar114 = vfmsub231ps_avx512f(auVar75,auVar77,auVar108);
          auVar75 = vmulps_avx512f(auVar177,auVar109);
          auVar75 = vfmsub231ps_avx512f(auVar75,auVar108,auVar76);
          auVar115 = vmulps_avx512f(auVar76,auVar106);
          auVar109 = vfmsub231ps_avx512f(auVar115,auVar105,auVar109);
          auVar108 = vmulps_avx512f(auVar105,auVar108);
          auVar108 = vfmsub231ps_avx512f(auVar108,auVar177,auVar106);
          auVar106 = vmulps_avx512f(auVar107,auVar76);
          auVar106 = vfmsub231ps_avx512f(auVar106,auVar177,auVar78);
          auVar78 = vmulps_avx512f(auVar78,auVar105);
          auVar78 = vfmsub231ps_avx512f(auVar78,auVar76,auVar77);
          auVar115 = vmulps_avx512f(auVar77,auVar177);
          auVar76 = vmulps_avx512f(auVar76,auVar114);
          auVar177 = vfmadd231ps_avx512f(auVar76,auVar113,auVar177);
          auVar116 = vfmadd231ps_avx512f(auVar177,auVar74,auVar105);
          auVar74 = vdivps_avx512f(auVar74,auVar116);
          auVar177 = vdivps_avx512f(auVar75,auVar116);
          auVar75 = vdivps_avx512f(auVar106,auVar116);
          auVar76 = vdivps_avx512f(auVar113,auVar116);
          auVar77 = vdivps_avx512f(auVar109,auVar116);
          auVar78 = vdivps_avx512f(auVar78,auVar116);
          auVar106 = vdivps_avx512f(auVar114,auVar116);
          auVar108 = vdivps_avx512f(auVar108,auVar116);
          auVar105 = vfmsub231ps_avx512f(auVar115,auVar105,auVar107);
          auVar105 = vdivps_avx512f(auVar105,auVar116);
          auVar107 = vmulps_avx512f(auVar112,auVar106);
          auVar109 = vmulps_avx512f(auVar112,auVar108);
          auVar112 = vmulps_avx512f(auVar112,auVar105);
          auVar107 = vfmadd231ps_avx512f(auVar107,auVar111,auVar76);
          auVar109 = vfmadd231ps_avx512f(auVar109,auVar111,auVar77);
          auVar111 = vfmadd231ps_avx512f(auVar112,auVar78,auVar111);
          auVar112 = vfmadd231ps_avx512f(auVar107,auVar110,auVar74);
          auVar109 = vfmadd231ps_avx512f(auVar109,auVar110,auVar177);
          auVar107 = vfmadd231ps_avx512f(auVar111,auVar75,auVar110);
          auVar110 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar111 = vxorps_avx512dq(auVar112,auVar110);
        }
        auVar115 = vxorps_avx512dq(auVar109,auVar110);
        auVar116 = vxorps_avx512dq(auVar107,auVar110);
        auVar107 = *(undefined1 (*) [64])ray;
        auVar109 = *(undefined1 (*) [64])(ray + 0x40);
        auVar110 = *(undefined1 (*) [64])(ray + 0x80);
        auVar112 = *(undefined1 (*) [64])(ray + 0x100);
        auVar113 = *(undefined1 (*) [64])(ray + 0x140);
        auVar114 = *(undefined1 (*) [64])(ray + 0x180);
        auVar111 = vfmadd231ps_avx512f(auVar111,auVar110,auVar106);
        auVar115 = vfmadd231ps_avx512f(auVar115,auVar110,auVar108);
        auVar116 = vfmadd231ps_avx512f(auVar116,auVar110,auVar105);
        auVar111 = vfmadd231ps_avx512f(auVar111,auVar109,auVar76);
        auVar115 = vfmadd231ps_avx512f(auVar115,auVar109,auVar77);
        auVar116 = vfmadd231ps_avx512f(auVar116,auVar109,auVar78);
        auVar111 = vfmadd231ps_avx512f(auVar111,auVar107,auVar74);
        auVar115 = vfmadd231ps_avx512f(auVar115,auVar107,auVar177);
        *(undefined1 (*) [64])ray = auVar111;
        auVar111 = vfmadd231ps_avx512f(auVar116,auVar107,auVar75);
        *(undefined1 (*) [64])(ray + 0x40) = auVar115;
        *(undefined1 (*) [64])(ray + 0x80) = auVar111;
        auVar106 = vmulps_avx512f(auVar106,auVar114);
        auVar108 = vmulps_avx512f(auVar108,auVar114);
        auVar105 = vmulps_avx512f(auVar105,auVar114);
        auVar76 = vfmadd231ps_avx512f(auVar106,auVar113,auVar76);
        auVar77 = vfmadd231ps_avx512f(auVar108,auVar113,auVar77);
        auVar78 = vfmadd231ps_avx512f(auVar105,auVar113,auVar78);
        auVar74 = vfmadd231ps_avx512f(auVar76,auVar112,auVar74);
        auVar177 = vfmadd231ps_avx512f(auVar77,auVar112,auVar177);
        auVar75 = vfmadd231ps_avx512f(auVar78,auVar112,auVar75);
        *(undefined1 (*) [64])(ray + 0x100) = auVar74;
        *(undefined1 (*) [64])(ray + 0x140) = auVar177;
        *(undefined1 (*) [64])(ray + 0x180) = auVar75;
        local_70 = context->args;
        auVar74 = vpmovm2d_avx512dq(uVar60);
        local_200 = vmovdqa64_avx512f(auVar74);
        local_78 = pRVar11;
        (**(code **)(local_80 + 0x130))(local_200,local_80 + 0x58,ray);
        local_480._0_8_ = auVar107._0_8_;
        local_480._8_8_ = auVar107._8_8_;
        local_480._16_8_ = auVar107._16_8_;
        local_480._24_8_ = auVar107._24_8_;
        local_480._32_8_ = auVar107._32_8_;
        local_480._40_8_ = auVar107._40_8_;
        local_480._48_8_ = auVar107._48_8_;
        local_480._56_8_ = auVar107._56_8_;
        *(undefined8 *)ray = local_480._0_8_;
        *(undefined8 *)(ray + 8) = local_480._8_8_;
        *(undefined8 *)(ray + 0x10) = local_480._16_8_;
        *(undefined8 *)(ray + 0x18) = local_480._24_8_;
        *(undefined8 *)(ray + 0x20) = local_480._32_8_;
        *(undefined8 *)(ray + 0x28) = local_480._40_8_;
        *(undefined8 *)(ray + 0x30) = local_480._48_8_;
        *(undefined8 *)(ray + 0x38) = local_480._56_8_;
        local_440._0_8_ = auVar109._0_8_;
        local_440._8_8_ = auVar109._8_8_;
        local_440._16_8_ = auVar109._16_8_;
        local_440._24_8_ = auVar109._24_8_;
        local_440._32_8_ = auVar109._32_8_;
        local_440._40_8_ = auVar109._40_8_;
        local_440._48_8_ = auVar109._48_8_;
        local_440._56_8_ = auVar109._56_8_;
        *(undefined8 *)(ray + 0x40) = local_440._0_8_;
        *(undefined8 *)(ray + 0x48) = local_440._8_8_;
        *(undefined8 *)(ray + 0x50) = local_440._16_8_;
        *(undefined8 *)(ray + 0x58) = local_440._24_8_;
        *(undefined8 *)(ray + 0x60) = local_440._32_8_;
        *(undefined8 *)(ray + 0x68) = local_440._40_8_;
        *(undefined8 *)(ray + 0x70) = local_440._48_8_;
        *(undefined8 *)(ray + 0x78) = local_440._56_8_;
        local_400._0_8_ = auVar110._0_8_;
        local_400._8_8_ = auVar110._8_8_;
        local_400._16_8_ = auVar110._16_8_;
        local_400._24_8_ = auVar110._24_8_;
        local_400._32_8_ = auVar110._32_8_;
        local_400._40_8_ = auVar110._40_8_;
        local_400._48_8_ = auVar110._48_8_;
        local_400._56_8_ = auVar110._56_8_;
        *(undefined8 *)(ray + 0x80) = local_400._0_8_;
        *(undefined8 *)(ray + 0x88) = local_400._8_8_;
        *(undefined8 *)(ray + 0x90) = local_400._16_8_;
        *(undefined8 *)(ray + 0x98) = local_400._24_8_;
        *(undefined8 *)(ray + 0xa0) = local_400._32_8_;
        *(undefined8 *)(ray + 0xa8) = local_400._40_8_;
        *(undefined8 *)(ray + 0xb0) = local_400._48_8_;
        *(undefined8 *)(ray + 0xb8) = local_400._56_8_;
        local_380._0_8_ = auVar112._0_8_;
        local_380._8_8_ = auVar112._8_8_;
        local_380._16_8_ = auVar112._16_8_;
        local_380._24_8_ = auVar112._24_8_;
        local_380._32_8_ = auVar112._32_8_;
        local_380._40_8_ = auVar112._40_8_;
        local_380._48_8_ = auVar112._48_8_;
        local_380._56_8_ = auVar112._56_8_;
        *(undefined8 *)(ray + 0x100) = local_380._0_8_;
        *(undefined8 *)(ray + 0x108) = local_380._8_8_;
        *(undefined8 *)(ray + 0x110) = local_380._16_8_;
        *(undefined8 *)(ray + 0x118) = local_380._24_8_;
        *(undefined8 *)(ray + 0x120) = local_380._32_8_;
        *(undefined8 *)(ray + 0x128) = local_380._40_8_;
        *(undefined8 *)(ray + 0x130) = local_380._48_8_;
        *(undefined8 *)(ray + 0x138) = local_380._56_8_;
        local_3c0._0_8_ = auVar113._0_8_;
        local_3c0._8_8_ = auVar113._8_8_;
        local_3c0._16_8_ = auVar113._16_8_;
        local_3c0._24_8_ = auVar113._24_8_;
        local_3c0._32_8_ = auVar113._32_8_;
        local_3c0._40_8_ = auVar113._40_8_;
        local_3c0._48_8_ = auVar113._48_8_;
        local_3c0._56_8_ = auVar113._56_8_;
        *(undefined8 *)(ray + 0x140) = local_3c0._0_8_;
        *(undefined8 *)(ray + 0x148) = local_3c0._8_8_;
        *(undefined8 *)(ray + 0x150) = local_3c0._16_8_;
        *(undefined8 *)(ray + 0x158) = local_3c0._24_8_;
        *(undefined8 *)(ray + 0x160) = local_3c0._32_8_;
        *(undefined8 *)(ray + 0x168) = local_3c0._40_8_;
        *(undefined8 *)(ray + 0x170) = local_3c0._48_8_;
        *(undefined8 *)(ray + 0x178) = local_3c0._56_8_;
        local_4c0._0_8_ = auVar114._0_8_;
        local_4c0._8_8_ = auVar114._8_8_;
        local_4c0._16_8_ = auVar114._16_8_;
        local_4c0._24_8_ = auVar114._24_8_;
        local_4c0._32_8_ = auVar114._32_8_;
        local_4c0._40_8_ = auVar114._40_8_;
        local_4c0._48_8_ = auVar114._48_8_;
        local_4c0._56_8_ = auVar114._56_8_;
        *(undefined8 *)(ray + 0x180) = local_4c0._0_8_;
        *(undefined8 *)(ray + 0x188) = local_4c0._8_8_;
        *(undefined8 *)(ray + 400) = local_4c0._16_8_;
        *(undefined8 *)(ray + 0x198) = local_4c0._24_8_;
        *(undefined8 *)(ray + 0x1a0) = local_4c0._32_8_;
        *(undefined8 *)(ray + 0x1a8) = local_4c0._40_8_;
        *(undefined8 *)(ray + 0x1b0) = local_4c0._48_8_;
        *(undefined8 *)(ray + 0x1b8) = local_4c0._56_8_;
        uVar29 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),*(undefined1 (*) [64])(ray + 0x200),0xe
                               );
        *(short *)this = (short)uVar29;
        pRVar11->instID[0] = 0xffffffff;
        pRVar11->instPrimID[0] = 0xffffffff;
      }
      goto LAB_008fb614;
    }
  }
  *(undefined2 *)this = 0;
LAB_008fb614:
  return (vbool<16>)(__mmask16)this;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }